

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  Geometry *pGVar32;
  __int_type_conflict _Var33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  bool bVar104;
  undefined1 auVar105 [12];
  bool bVar106;
  bool bVar107;
  bool bVar108;
  bool bVar109;
  bool bVar110;
  bool bVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar122;
  ulong uVar123;
  ulong uVar124;
  long lVar125;
  long lVar126;
  uint uVar127;
  ulong uVar128;
  bool bVar129;
  float fVar130;
  float fVar155;
  float fVar156;
  __m128 a;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar158 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar157;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar159;
  float fVar192;
  float fVar195;
  undefined1 auVar160 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar201;
  float fVar202;
  float fVar204;
  undefined1 auVar174 [32];
  undefined1 auVar161 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar197;
  undefined1 auVar162 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar193;
  float fVar194;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar203;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar205;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar229;
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar216 [32];
  float fVar236;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar230;
  float fVar232;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar237;
  float fVar255;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar245 [28];
  float fVar254;
  float fVar256;
  float fVar257;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar258;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar259;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar269 [28];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar280;
  float fVar298;
  float fVar299;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar304;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  undefined1 auVar297 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar313;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar314;
  undefined1 auVar312 [32];
  float fVar318;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar335;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [64];
  undefined1 auVar339 [16];
  float fVar337;
  float fVar338;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar336;
  float fVar352;
  float fVar355;
  float fVar361;
  float fVar364;
  float fVar367;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  undefined1 auVar371 [28];
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar376 [32];
  float s;
  undefined1 auVar385 [16];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  float fVar393;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [64];
  float t_2;
  undefined1 auVar394 [16];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar402;
  undefined1 auVar400 [32];
  undefined1 auVar401 [64];
  float fVar404;
  float fVar405;
  undefined1 auVar406 [16];
  float fVar403;
  float fVar414;
  float fVar417;
  float fVar421;
  float fVar423;
  float fVar425;
  float in_register_0000151c;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  float fVar415;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar422;
  float fVar424;
  float fVar426;
  float fVar427;
  undefined1 auVar411 [32];
  float fVar416;
  undefined1 auVar412 [32];
  undefined1 auVar413 [64];
  float fVar428;
  float fVar435;
  undefined1 auVar429 [16];
  float fVar433;
  float fVar434;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [64];
  float t;
  float in_register_0000159c;
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [16];
  float in_register_000015dc;
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  ulong local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [32];
  undefined8 local_890;
  float local_888;
  float local_884;
  undefined4 local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  uint local_870;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  Primitive *local_750;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0 [4];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar31 = prim[1];
  uVar128 = (ulong)(byte)PVar31;
  lVar125 = uVar128 * 0x25;
  fVar237 = *(float *)(prim + lVar125 + 0x12);
  auVar134 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar125 + 6));
  auVar281._0_4_ = fVar237 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar281._4_4_ = fVar237 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar281._8_4_ = fVar237 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar281._12_4_ = fVar237 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar160._0_4_ = fVar237 * auVar134._0_4_;
  auVar160._4_4_ = fVar237 * auVar134._4_4_;
  auVar160._8_4_ = fVar237 * auVar134._8_4_;
  auVar160._12_4_ = fVar237 * auVar134._12_4_;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 10)));
  auVar150._16_16_ = auVar134;
  auVar150._0_16_ = auVar166;
  auVar150 = vcvtdq2ps_avx(auVar150);
  lVar34 = uVar128 * 5;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar34 + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar34 + 10)));
  auVar216._16_16_ = auVar134;
  auVar216._0_16_ = auVar166;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 10)));
  auVar178 = vcvtdq2ps_avx(auVar216);
  auVar246._16_16_ = auVar134;
  auVar246._0_16_ = auVar166;
  auVar36 = vcvtdq2ps_avx(auVar246);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xf + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xf + 10)));
  auVar247._16_16_ = auVar134;
  auVar247._0_16_ = auVar166;
  auVar37 = vcvtdq2ps_avx(auVar247);
  lVar126 = (ulong)(byte)PVar31 * 0x10;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar126 + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar126 + 10)));
  auVar308._16_16_ = auVar134;
  auVar308._0_16_ = auVar166;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar126 + uVar128 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar308);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar126 + uVar128 + 10)));
  auVar319._16_16_ = auVar134;
  auVar319._0_16_ = auVar166;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1a + 6)));
  auVar253 = vcvtdq2ps_avx(auVar319);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1a + 10)));
  auVar320._16_16_ = auVar134;
  auVar320._0_16_ = auVar166;
  auVar39 = vcvtdq2ps_avx(auVar320);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1b + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1b + 10)));
  auVar372._16_16_ = auVar134;
  auVar372._0_16_ = auVar166;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1c + 6)));
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1c + 10)));
  auVar40 = vcvtdq2ps_avx(auVar372);
  auVar386._16_16_ = auVar134;
  auVar386._0_16_ = auVar166;
  auVar41 = vcvtdq2ps_avx(auVar386);
  auVar166 = vshufps_avx(auVar281,auVar281,0);
  auVar134 = vshufps_avx(auVar281,auVar281,0x55);
  auVar158 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar237 = auVar158._0_4_;
  fVar193 = auVar158._4_4_;
  fVar254 = auVar158._8_4_;
  fVar199 = auVar158._12_4_;
  fVar236 = auVar134._0_4_;
  fVar202 = auVar134._4_4_;
  fVar255 = auVar134._8_4_;
  fVar229 = auVar134._12_4_;
  fVar256 = auVar166._0_4_;
  fVar257 = auVar166._4_4_;
  fVar258 = auVar166._8_4_;
  fVar259 = auVar166._12_4_;
  auVar407._0_4_ = fVar256 * auVar150._0_4_ + fVar236 * auVar178._0_4_ + fVar237 * auVar36._0_4_;
  auVar407._4_4_ = fVar257 * auVar150._4_4_ + fVar202 * auVar178._4_4_ + fVar193 * auVar36._4_4_;
  auVar407._8_4_ = fVar258 * auVar150._8_4_ + fVar255 * auVar178._8_4_ + fVar254 * auVar36._8_4_;
  auVar407._12_4_ = fVar259 * auVar150._12_4_ + fVar229 * auVar178._12_4_ + fVar199 * auVar36._12_4_
  ;
  auVar407._16_4_ = fVar256 * auVar150._16_4_ + fVar236 * auVar178._16_4_ + fVar237 * auVar36._16_4_
  ;
  auVar407._20_4_ = fVar257 * auVar150._20_4_ + fVar202 * auVar178._20_4_ + fVar193 * auVar36._20_4_
  ;
  auVar407._24_4_ = fVar258 * auVar150._24_4_ + fVar255 * auVar178._24_4_ + fVar254 * auVar36._24_4_
  ;
  auVar407._28_4_ = fVar229 + in_register_000015dc + in_register_0000151c;
  auVar395._0_4_ = fVar256 * auVar37._0_4_ + fVar236 * auVar38._0_4_ + auVar253._0_4_ * fVar237;
  auVar395._4_4_ = fVar257 * auVar37._4_4_ + fVar202 * auVar38._4_4_ + auVar253._4_4_ * fVar193;
  auVar395._8_4_ = fVar258 * auVar37._8_4_ + fVar255 * auVar38._8_4_ + auVar253._8_4_ * fVar254;
  auVar395._12_4_ = fVar259 * auVar37._12_4_ + fVar229 * auVar38._12_4_ + auVar253._12_4_ * fVar199;
  auVar395._16_4_ = fVar256 * auVar37._16_4_ + fVar236 * auVar38._16_4_ + auVar253._16_4_ * fVar237;
  auVar395._20_4_ = fVar257 * auVar37._20_4_ + fVar202 * auVar38._20_4_ + auVar253._20_4_ * fVar193;
  auVar395._24_4_ = fVar258 * auVar37._24_4_ + fVar255 * auVar38._24_4_ + auVar253._24_4_ * fVar254;
  auVar395._28_4_ = fVar229 + in_register_000015dc + in_register_0000159c;
  auVar285._0_4_ = fVar256 * auVar39._0_4_ + fVar236 * auVar40._0_4_ + auVar41._0_4_ * fVar237;
  auVar285._4_4_ = fVar257 * auVar39._4_4_ + fVar202 * auVar40._4_4_ + auVar41._4_4_ * fVar193;
  auVar285._8_4_ = fVar258 * auVar39._8_4_ + fVar255 * auVar40._8_4_ + auVar41._8_4_ * fVar254;
  auVar285._12_4_ = fVar259 * auVar39._12_4_ + fVar229 * auVar40._12_4_ + auVar41._12_4_ * fVar199;
  auVar285._16_4_ = fVar256 * auVar39._16_4_ + fVar236 * auVar40._16_4_ + auVar41._16_4_ * fVar237;
  auVar285._20_4_ = fVar257 * auVar39._20_4_ + fVar202 * auVar40._20_4_ + auVar41._20_4_ * fVar193;
  auVar285._24_4_ = fVar258 * auVar39._24_4_ + fVar255 * auVar40._24_4_ + auVar41._24_4_ * fVar254;
  auVar285._28_4_ = fVar259 + fVar229 + fVar199;
  auVar166 = vshufps_avx(auVar160,auVar160,0);
  auVar134 = vshufps_avx(auVar160,auVar160,0x55);
  auVar158 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar237 = auVar158._0_4_;
  fVar193 = auVar158._4_4_;
  fVar254 = auVar158._8_4_;
  fVar199 = auVar158._12_4_;
  fVar257 = auVar134._0_4_;
  fVar258 = auVar134._4_4_;
  fVar259 = auVar134._8_4_;
  fVar274 = auVar134._12_4_;
  fVar236 = auVar178._28_4_ + auVar36._28_4_;
  fVar202 = auVar166._0_4_;
  fVar255 = auVar166._4_4_;
  fVar229 = auVar166._8_4_;
  fVar256 = auVar166._12_4_;
  auVar174._0_4_ = fVar202 * auVar150._0_4_ + fVar257 * auVar178._0_4_ + fVar237 * auVar36._0_4_;
  auVar174._4_4_ = fVar255 * auVar150._4_4_ + fVar258 * auVar178._4_4_ + fVar193 * auVar36._4_4_;
  auVar174._8_4_ = fVar229 * auVar150._8_4_ + fVar259 * auVar178._8_4_ + fVar254 * auVar36._8_4_;
  auVar174._12_4_ = fVar256 * auVar150._12_4_ + fVar274 * auVar178._12_4_ + fVar199 * auVar36._12_4_
  ;
  auVar174._16_4_ = fVar202 * auVar150._16_4_ + fVar257 * auVar178._16_4_ + fVar237 * auVar36._16_4_
  ;
  auVar174._20_4_ = fVar255 * auVar150._20_4_ + fVar258 * auVar178._20_4_ + fVar193 * auVar36._20_4_
  ;
  auVar174._24_4_ = fVar229 * auVar150._24_4_ + fVar259 * auVar178._24_4_ + fVar254 * auVar36._24_4_
  ;
  auVar174._28_4_ = auVar150._28_4_ + fVar236;
  auVar142._0_4_ = fVar202 * auVar37._0_4_ + auVar253._0_4_ * fVar237 + fVar257 * auVar38._0_4_;
  auVar142._4_4_ = fVar255 * auVar37._4_4_ + auVar253._4_4_ * fVar193 + fVar258 * auVar38._4_4_;
  auVar142._8_4_ = fVar229 * auVar37._8_4_ + auVar253._8_4_ * fVar254 + fVar259 * auVar38._8_4_;
  auVar142._12_4_ = fVar256 * auVar37._12_4_ + auVar253._12_4_ * fVar199 + fVar274 * auVar38._12_4_;
  auVar142._16_4_ = fVar202 * auVar37._16_4_ + auVar253._16_4_ * fVar237 + fVar257 * auVar38._16_4_;
  auVar142._20_4_ = fVar255 * auVar37._20_4_ + auVar253._20_4_ * fVar193 + fVar258 * auVar38._20_4_;
  auVar142._24_4_ = fVar229 * auVar37._24_4_ + auVar253._24_4_ * fVar254 + fVar259 * auVar38._24_4_;
  auVar142._28_4_ = auVar150._28_4_ + auVar253._28_4_ + auVar36._28_4_;
  auVar321._8_4_ = 0x7fffffff;
  auVar321._0_8_ = 0x7fffffff7fffffff;
  auVar321._12_4_ = 0x7fffffff;
  auVar321._16_4_ = 0x7fffffff;
  auVar321._20_4_ = 0x7fffffff;
  auVar321._24_4_ = 0x7fffffff;
  auVar321._28_4_ = 0x7fffffff;
  auVar342._8_4_ = 0x219392ef;
  auVar342._0_8_ = 0x219392ef219392ef;
  auVar342._12_4_ = 0x219392ef;
  auVar342._16_4_ = 0x219392ef;
  auVar342._20_4_ = 0x219392ef;
  auVar342._24_4_ = 0x219392ef;
  auVar342._28_4_ = 0x219392ef;
  auVar150 = vandps_avx(auVar407,auVar321);
  auVar150 = vcmpps_avx(auVar150,auVar342,1);
  auVar178 = vblendvps_avx(auVar407,auVar342,auVar150);
  auVar150 = vandps_avx(auVar395,auVar321);
  auVar150 = vcmpps_avx(auVar150,auVar342,1);
  auVar36 = vblendvps_avx(auVar395,auVar342,auVar150);
  auVar150 = vandps_avx(auVar285,auVar321);
  auVar150 = vcmpps_avx(auVar150,auVar342,1);
  auVar150 = vblendvps_avx(auVar285,auVar342,auVar150);
  auVar217._0_4_ = fVar202 * auVar39._0_4_ + fVar257 * auVar40._0_4_ + auVar41._0_4_ * fVar237;
  auVar217._4_4_ = fVar255 * auVar39._4_4_ + fVar258 * auVar40._4_4_ + auVar41._4_4_ * fVar193;
  auVar217._8_4_ = fVar229 * auVar39._8_4_ + fVar259 * auVar40._8_4_ + auVar41._8_4_ * fVar254;
  auVar217._12_4_ = fVar256 * auVar39._12_4_ + fVar274 * auVar40._12_4_ + auVar41._12_4_ * fVar199;
  auVar217._16_4_ = fVar202 * auVar39._16_4_ + fVar257 * auVar40._16_4_ + auVar41._16_4_ * fVar237;
  auVar217._20_4_ = fVar255 * auVar39._20_4_ + fVar258 * auVar40._20_4_ + auVar41._20_4_ * fVar193;
  auVar217._24_4_ = fVar229 * auVar39._24_4_ + fVar259 * auVar40._24_4_ + auVar41._24_4_ * fVar254;
  auVar217._28_4_ = fVar236 + auVar38._28_4_ + fVar199;
  auVar37 = vrcpps_avx(auVar178);
  fVar237 = auVar37._0_4_;
  fVar254 = auVar37._4_4_;
  auVar38._4_4_ = auVar178._4_4_ * fVar254;
  auVar38._0_4_ = auVar178._0_4_ * fVar237;
  fVar236 = auVar37._8_4_;
  auVar38._8_4_ = auVar178._8_4_ * fVar236;
  fVar255 = auVar37._12_4_;
  auVar38._12_4_ = auVar178._12_4_ * fVar255;
  fVar256 = auVar37._16_4_;
  auVar38._16_4_ = auVar178._16_4_ * fVar256;
  fVar257 = auVar37._20_4_;
  auVar38._20_4_ = auVar178._20_4_ * fVar257;
  fVar258 = auVar37._24_4_;
  auVar38._24_4_ = auVar178._24_4_ * fVar258;
  auVar38._28_4_ = auVar178._28_4_;
  auVar343._8_4_ = 0x3f800000;
  auVar343._0_8_ = &DAT_3f8000003f800000;
  auVar343._12_4_ = 0x3f800000;
  auVar343._16_4_ = 0x3f800000;
  auVar343._20_4_ = 0x3f800000;
  auVar343._24_4_ = 0x3f800000;
  auVar343._28_4_ = 0x3f800000;
  auVar253 = vsubps_avx(auVar343,auVar38);
  auVar38 = vrcpps_avx(auVar36);
  fVar237 = fVar237 + fVar237 * auVar253._0_4_;
  fVar254 = fVar254 + fVar254 * auVar253._4_4_;
  fVar236 = fVar236 + fVar236 * auVar253._8_4_;
  fVar255 = fVar255 + fVar255 * auVar253._12_4_;
  fVar256 = fVar256 + fVar256 * auVar253._16_4_;
  fVar257 = fVar257 + fVar257 * auVar253._20_4_;
  fVar258 = fVar258 + fVar258 * auVar253._24_4_;
  fVar259 = auVar38._0_4_;
  fVar274 = auVar38._4_4_;
  auVar178._4_4_ = fVar274 * auVar36._4_4_;
  auVar178._0_4_ = fVar259 * auVar36._0_4_;
  fVar275 = auVar38._8_4_;
  auVar178._8_4_ = fVar275 * auVar36._8_4_;
  fVar276 = auVar38._12_4_;
  auVar178._12_4_ = fVar276 * auVar36._12_4_;
  fVar277 = auVar38._16_4_;
  auVar178._16_4_ = fVar277 * auVar36._16_4_;
  fVar278 = auVar38._20_4_;
  auVar178._20_4_ = fVar278 * auVar36._20_4_;
  fVar279 = auVar38._24_4_;
  auVar178._24_4_ = fVar279 * auVar36._24_4_;
  auVar178._28_4_ = auVar36._28_4_;
  auVar36 = vsubps_avx(auVar343,auVar178);
  fVar259 = fVar259 + fVar259 * auVar36._0_4_;
  fVar274 = fVar274 + fVar274 * auVar36._4_4_;
  fVar275 = fVar275 + fVar275 * auVar36._8_4_;
  fVar276 = fVar276 + fVar276 * auVar36._12_4_;
  fVar277 = fVar277 + fVar277 * auVar36._16_4_;
  fVar278 = fVar278 + fVar278 * auVar36._20_4_;
  fVar279 = fVar279 + fVar279 * auVar36._24_4_;
  auVar178 = vrcpps_avx(auVar150);
  fVar280 = auVar178._0_4_;
  fVar298 = auVar178._4_4_;
  auVar39._4_4_ = fVar298 * auVar150._4_4_;
  auVar39._0_4_ = fVar280 * auVar150._0_4_;
  fVar299 = auVar178._8_4_;
  auVar39._8_4_ = fVar299 * auVar150._8_4_;
  fVar300 = auVar178._12_4_;
  auVar39._12_4_ = fVar300 * auVar150._12_4_;
  fVar301 = auVar178._16_4_;
  auVar39._16_4_ = fVar301 * auVar150._16_4_;
  fVar302 = auVar178._20_4_;
  auVar39._20_4_ = fVar302 * auVar150._20_4_;
  fVar303 = auVar178._24_4_;
  auVar39._24_4_ = fVar303 * auVar150._24_4_;
  auVar39._28_4_ = auVar150._28_4_;
  auVar150 = vsubps_avx(auVar343,auVar39);
  fVar280 = fVar280 + fVar280 * auVar150._0_4_;
  fVar298 = fVar298 + fVar298 * auVar150._4_4_;
  fVar299 = fVar299 + fVar299 * auVar150._8_4_;
  fVar300 = fVar300 + fVar300 * auVar150._12_4_;
  fVar301 = fVar301 + fVar301 * auVar150._16_4_;
  fVar302 = fVar302 + fVar302 * auVar150._20_4_;
  fVar303 = fVar303 + fVar303 * auVar150._24_4_;
  auVar166 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar125 + 0x16)) * *(float *)(prim + lVar125 + 0x1a)))
  ;
  auVar49 = vshufps_avx(auVar166,auVar166,0);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar166 = vpmovsxwd_avx(auVar166);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar128 * 7 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar134);
  auVar322._16_16_ = auVar134;
  auVar322._0_16_ = auVar166;
  auVar150 = vcvtdq2ps_avx(auVar322);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar128 * 0xb + 6);
  auVar166 = vpmovsxwd_avx(auVar158);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar128 * 0xb + 0xe);
  auVar134 = vpmovsxwd_avx(auVar163);
  auVar344._16_16_ = auVar134;
  auVar344._0_16_ = auVar166;
  auVar178 = vcvtdq2ps_avx(auVar344);
  auVar178 = vsubps_avx(auVar178,auVar150);
  fVar193 = auVar49._0_4_;
  fVar199 = auVar49._4_4_;
  fVar202 = auVar49._8_4_;
  fVar229 = auVar49._12_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar166 = vpmovsxwd_avx(auVar49);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar128 * 9 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar13);
  auVar323._0_4_ = auVar178._0_4_ * fVar193 + auVar150._0_4_;
  auVar323._4_4_ = auVar178._4_4_ * fVar199 + auVar150._4_4_;
  auVar323._8_4_ = auVar178._8_4_ * fVar202 + auVar150._8_4_;
  auVar323._12_4_ = auVar178._12_4_ * fVar229 + auVar150._12_4_;
  auVar323._16_4_ = auVar178._16_4_ * fVar193 + auVar150._16_4_;
  auVar323._20_4_ = auVar178._20_4_ * fVar199 + auVar150._20_4_;
  auVar323._24_4_ = auVar178._24_4_ * fVar202 + auVar150._24_4_;
  auVar323._28_4_ = auVar178._28_4_ + auVar150._28_4_;
  auVar345._16_16_ = auVar134;
  auVar345._0_16_ = auVar166;
  auVar150 = vcvtdq2ps_avx(auVar345);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar128 * 0xd + 6);
  auVar166 = vpmovsxwd_avx(auVar171);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar128 * 0xd + 0xe);
  auVar134 = vpmovsxwd_avx(auVar14);
  auVar373._16_16_ = auVar134;
  auVar373._0_16_ = auVar166;
  auVar178 = vcvtdq2ps_avx(auVar373);
  auVar178 = vsubps_avx(auVar178,auVar150);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar128 * 0x12 + 6);
  auVar166 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar128 * 0x12 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar16);
  auVar346._0_4_ = auVar150._0_4_ + auVar178._0_4_ * fVar193;
  auVar346._4_4_ = auVar150._4_4_ + auVar178._4_4_ * fVar199;
  auVar346._8_4_ = auVar150._8_4_ + auVar178._8_4_ * fVar202;
  auVar346._12_4_ = auVar150._12_4_ + auVar178._12_4_ * fVar229;
  auVar346._16_4_ = auVar150._16_4_ + auVar178._16_4_ * fVar193;
  auVar346._20_4_ = auVar150._20_4_ + auVar178._20_4_ * fVar199;
  auVar346._24_4_ = auVar150._24_4_ + auVar178._24_4_ * fVar202;
  auVar346._28_4_ = auVar150._28_4_ + auVar178._28_4_;
  auVar374._16_16_ = auVar134;
  auVar374._0_16_ = auVar166;
  auVar150 = vcvtdq2ps_avx(auVar374);
  uVar123 = (ulong)(uint)((int)lVar34 << 2);
  lVar125 = uVar128 * 2 + uVar123;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar166 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar18);
  auVar387._16_16_ = auVar134;
  auVar387._0_16_ = auVar166;
  auVar178 = vcvtdq2ps_avx(auVar387);
  auVar178 = vsubps_avx(auVar178,auVar150);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar123 + 6);
  auVar166 = vpmovsxwd_avx(auVar19);
  auVar375._0_4_ = auVar150._0_4_ + auVar178._0_4_ * fVar193;
  auVar375._4_4_ = auVar150._4_4_ + auVar178._4_4_ * fVar199;
  auVar375._8_4_ = auVar150._8_4_ + auVar178._8_4_ * fVar202;
  auVar375._12_4_ = auVar150._12_4_ + auVar178._12_4_ * fVar229;
  auVar375._16_4_ = auVar150._16_4_ + auVar178._16_4_ * fVar193;
  auVar375._20_4_ = auVar150._20_4_ + auVar178._20_4_ * fVar199;
  auVar375._24_4_ = auVar150._24_4_ + auVar178._24_4_ * fVar202;
  auVar375._28_4_ = auVar150._28_4_ + auVar178._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar123 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar20);
  auVar388._16_16_ = auVar134;
  auVar388._0_16_ = auVar166;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar128 * 0x18 + 6);
  auVar166 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar128 * 0x18 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar22);
  auVar150 = vcvtdq2ps_avx(auVar388);
  auVar396._16_16_ = auVar134;
  auVar396._0_16_ = auVar166;
  auVar178 = vcvtdq2ps_avx(auVar396);
  auVar178 = vsubps_avx(auVar178,auVar150);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar128 * 0x1d + 6);
  auVar166 = vpmovsxwd_avx(auVar23);
  auVar389._0_4_ = auVar150._0_4_ + auVar178._0_4_ * fVar193;
  auVar389._4_4_ = auVar150._4_4_ + auVar178._4_4_ * fVar199;
  auVar389._8_4_ = auVar150._8_4_ + auVar178._8_4_ * fVar202;
  auVar389._12_4_ = auVar150._12_4_ + auVar178._12_4_ * fVar229;
  auVar389._16_4_ = auVar150._16_4_ + auVar178._16_4_ * fVar193;
  auVar389._20_4_ = auVar150._20_4_ + auVar178._20_4_ * fVar199;
  auVar389._24_4_ = auVar150._24_4_ + auVar178._24_4_ * fVar202;
  auVar389._28_4_ = auVar150._28_4_ + auVar178._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar128 * 0x1d + 0xe);
  auVar134 = vpmovsxwd_avx(auVar24);
  lVar125 = uVar128 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar158 = vpmovsxwd_avx(auVar25);
  auVar397._16_16_ = auVar134;
  auVar397._0_16_ = auVar166;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar166 = vpmovsxwd_avx(auVar26);
  auVar408._16_16_ = auVar166;
  auVar408._0_16_ = auVar158;
  auVar150 = vcvtdq2ps_avx(auVar397);
  auVar178 = vcvtdq2ps_avx(auVar408);
  auVar178 = vsubps_avx(auVar178,auVar150);
  auVar398._0_4_ = auVar150._0_4_ + auVar178._0_4_ * fVar193;
  auVar398._4_4_ = auVar150._4_4_ + auVar178._4_4_ * fVar199;
  auVar398._8_4_ = auVar150._8_4_ + auVar178._8_4_ * fVar202;
  auVar398._12_4_ = auVar150._12_4_ + auVar178._12_4_ * fVar229;
  auVar398._16_4_ = auVar150._16_4_ + auVar178._16_4_ * fVar193;
  auVar398._20_4_ = auVar150._20_4_ + auVar178._20_4_ * fVar199;
  auVar398._24_4_ = auVar150._24_4_ + auVar178._24_4_ * fVar202;
  auVar398._28_4_ = auVar150._28_4_ + auVar178._28_4_;
  lVar125 = (ulong)(byte)PVar31 * 0x20 - uVar128;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar166 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar28);
  auVar409._16_16_ = auVar134;
  auVar409._0_16_ = auVar166;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar128 * 0x23 + 6);
  auVar166 = vpmovsxwd_avx(auVar29);
  local_750 = prim;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar128 * 0x23 + 0xe);
  auVar134 = vpmovsxwd_avx(auVar30);
  auVar430._16_16_ = auVar134;
  auVar430._0_16_ = auVar166;
  auVar150 = vcvtdq2ps_avx(auVar409);
  auVar178 = vcvtdq2ps_avx(auVar430);
  auVar178 = vsubps_avx(auVar178,auVar150);
  auVar410._0_4_ = auVar150._0_4_ + auVar178._0_4_ * fVar193;
  auVar410._4_4_ = auVar150._4_4_ + auVar178._4_4_ * fVar199;
  auVar410._8_4_ = auVar150._8_4_ + auVar178._8_4_ * fVar202;
  auVar410._12_4_ = auVar150._12_4_ + auVar178._12_4_ * fVar229;
  auVar410._16_4_ = auVar150._16_4_ + auVar178._16_4_ * fVar193;
  auVar410._20_4_ = auVar150._20_4_ + auVar178._20_4_ * fVar199;
  auVar410._24_4_ = auVar150._24_4_ + auVar178._24_4_ * fVar202;
  auVar410._28_4_ = auVar150._28_4_ + fVar229;
  auVar150 = vsubps_avx(auVar323,auVar174);
  auVar305._0_4_ = fVar237 * auVar150._0_4_;
  auVar305._4_4_ = fVar254 * auVar150._4_4_;
  auVar305._8_4_ = fVar236 * auVar150._8_4_;
  auVar305._12_4_ = fVar255 * auVar150._12_4_;
  auVar40._16_4_ = fVar256 * auVar150._16_4_;
  auVar40._0_16_ = auVar305;
  auVar40._20_4_ = fVar257 * auVar150._20_4_;
  auVar40._24_4_ = fVar258 * auVar150._24_4_;
  auVar40._28_4_ = auVar150._28_4_;
  auVar150 = vsubps_avx(auVar346,auVar174);
  auVar238._0_4_ = fVar237 * auVar150._0_4_;
  auVar238._4_4_ = fVar254 * auVar150._4_4_;
  auVar238._8_4_ = fVar236 * auVar150._8_4_;
  auVar238._12_4_ = fVar255 * auVar150._12_4_;
  auVar41._16_4_ = fVar256 * auVar150._16_4_;
  auVar41._0_16_ = auVar238;
  auVar41._20_4_ = fVar257 * auVar150._20_4_;
  auVar41._24_4_ = fVar258 * auVar150._24_4_;
  auVar41._28_4_ = auVar37._28_4_ + auVar253._28_4_;
  auVar150 = vsubps_avx(auVar375,auVar142);
  auVar161._0_4_ = fVar259 * auVar150._0_4_;
  auVar161._4_4_ = fVar274 * auVar150._4_4_;
  auVar161._8_4_ = fVar275 * auVar150._8_4_;
  auVar161._12_4_ = fVar276 * auVar150._12_4_;
  auVar37._16_4_ = fVar277 * auVar150._16_4_;
  auVar37._0_16_ = auVar161;
  auVar37._20_4_ = fVar278 * auVar150._20_4_;
  auVar37._24_4_ = fVar279 * auVar150._24_4_;
  auVar37._28_4_ = auVar150._28_4_;
  auVar150 = vsubps_avx(auVar389,auVar142);
  auVar260._0_4_ = fVar259 * auVar150._0_4_;
  auVar260._4_4_ = fVar274 * auVar150._4_4_;
  auVar260._8_4_ = fVar275 * auVar150._8_4_;
  auVar260._12_4_ = fVar276 * auVar150._12_4_;
  auVar253._16_4_ = fVar277 * auVar150._16_4_;
  auVar253._0_16_ = auVar260;
  auVar253._20_4_ = fVar278 * auVar150._20_4_;
  auVar253._24_4_ = fVar279 * auVar150._24_4_;
  auVar253._28_4_ = auVar38._28_4_ + auVar36._28_4_;
  auVar150 = vsubps_avx(auVar398,auVar217);
  auVar131._0_4_ = fVar280 * auVar150._0_4_;
  auVar131._4_4_ = fVar298 * auVar150._4_4_;
  auVar131._8_4_ = fVar299 * auVar150._8_4_;
  auVar131._12_4_ = fVar300 * auVar150._12_4_;
  auVar36._16_4_ = fVar301 * auVar150._16_4_;
  auVar36._0_16_ = auVar131;
  auVar36._20_4_ = fVar302 * auVar150._20_4_;
  auVar36._24_4_ = fVar303 * auVar150._24_4_;
  auVar36._28_4_ = auVar150._28_4_;
  auVar150 = vsubps_avx(auVar410,auVar217);
  auVar206._0_4_ = fVar280 * auVar150._0_4_;
  auVar206._4_4_ = fVar298 * auVar150._4_4_;
  auVar206._8_4_ = fVar299 * auVar150._8_4_;
  auVar206._12_4_ = fVar300 * auVar150._12_4_;
  auVar50._16_4_ = fVar301 * auVar150._16_4_;
  auVar50._0_16_ = auVar206;
  auVar50._20_4_ = fVar302 * auVar150._20_4_;
  auVar50._24_4_ = fVar303 * auVar150._24_4_;
  auVar50._28_4_ = auVar150._28_4_;
  auVar166 = vpminsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar134 = vpminsd_avx(auVar305,auVar238);
  auVar347._16_16_ = auVar166;
  auVar347._0_16_ = auVar134;
  auVar166 = vpminsd_avx(auVar37._16_16_,auVar253._16_16_);
  auVar134 = vpminsd_avx(auVar161,auVar260);
  auVar399._16_16_ = auVar166;
  auVar399._0_16_ = auVar134;
  auVar150 = vmaxps_avx(auVar347,auVar399);
  auVar163 = auVar50._16_16_;
  auVar401 = ZEXT1664(auVar163);
  auVar158 = auVar36._16_16_;
  auVar413 = ZEXT1664(auVar158);
  auVar166 = vpminsd_avx(auVar158,auVar163);
  auVar134 = vpminsd_avx(auVar131,auVar206);
  auVar431._16_16_ = auVar166;
  auVar431._0_16_ = auVar134;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar439._4_4_ = uVar8;
  auVar439._0_4_ = uVar8;
  auVar439._8_4_ = uVar8;
  auVar439._12_4_ = uVar8;
  auVar439._16_4_ = uVar8;
  auVar439._20_4_ = uVar8;
  auVar439._24_4_ = uVar8;
  auVar439._28_4_ = uVar8;
  auVar178 = vmaxps_avx(auVar431,auVar439);
  auVar150 = vmaxps_avx(auVar150,auVar178);
  auVar432 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  local_280._4_4_ = auVar150._4_4_ * 0.99999964;
  local_280._0_4_ = auVar150._0_4_ * 0.99999964;
  local_280._8_4_ = auVar150._8_4_ * 0.99999964;
  local_280._12_4_ = auVar150._12_4_ * 0.99999964;
  local_280._16_4_ = auVar150._16_4_ * 0.99999964;
  local_280._20_4_ = auVar150._20_4_ * 0.99999964;
  local_280._24_4_ = auVar150._24_4_ * 0.99999964;
  local_280._28_4_ = auVar150._28_4_;
  auVar166 = vpmaxsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar134 = vpmaxsd_avx(auVar305,auVar238);
  auVar248._16_16_ = auVar166;
  auVar248._0_16_ = auVar134;
  auVar166 = vpmaxsd_avx(auVar37._16_16_,auVar253._16_16_);
  auVar134 = vpmaxsd_avx(auVar161,auVar260);
  auVar175._16_16_ = auVar166;
  auVar175._0_16_ = auVar134;
  auVar150 = vminps_avx(auVar248,auVar175);
  auVar166 = vpmaxsd_avx(auVar158,auVar163);
  auVar134 = vpmaxsd_avx(auVar131,auVar206);
  fVar237 = (ray->super_RayK<1>).tfar;
  auVar218._4_4_ = fVar237;
  auVar218._0_4_ = fVar237;
  auVar218._8_4_ = fVar237;
  auVar218._12_4_ = fVar237;
  auVar218._16_4_ = fVar237;
  auVar218._20_4_ = fVar237;
  auVar218._24_4_ = fVar237;
  auVar218._28_4_ = fVar237;
  auVar143._16_16_ = auVar166;
  auVar143._0_16_ = auVar134;
  auVar178 = vminps_avx(auVar143,auVar218);
  auVar150 = vminps_avx(auVar150,auVar178);
  auVar51._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar51._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar51._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar51._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar51._16_4_ = auVar150._16_4_ * 1.0000004;
  auVar51._20_4_ = auVar150._20_4_ * 1.0000004;
  auVar51._24_4_ = auVar150._24_4_ * 1.0000004;
  auVar51._28_4_ = auVar150._28_4_;
  auVar150 = vcmpps_avx(local_280,auVar51,2);
  auVar166 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar176._16_16_ = auVar166;
  auVar176._0_16_ = auVar166;
  auVar178 = vcvtdq2ps_avx(auVar176);
  auVar178 = vcmpps_avx(_DAT_02020f40,auVar178,1);
  auVar150 = vandps_avx(auVar150,auVar178);
  uVar122 = vmovmskps_avx(auVar150);
  if (uVar122 == 0) {
    return;
  }
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  uVar122 = uVar122 & 0xff;
  local_260 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  auVar328 = ZEXT1664((undefined1  [16])0x0);
LAB_01276aa7:
  local_748 = (ulong)uVar122;
  lVar125 = 0;
  if ((ulong)uVar122 != 0) {
    for (; (uVar122 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
    }
  }
  local_ae8 = (ulong)*(uint *)(local_750 + 2);
  pGVar32 = (context->scene->geometries).items[*(uint *)(local_750 + 2)].ptr;
  local_a88 = (ulong)*(uint *)(local_750 + lVar125 * 4 + 6);
  uVar128 = (ulong)*(uint *)(*(long *)&pGVar32->field_0x58 +
                            (ulong)*(uint *)(local_750 + lVar125 * 4 + 6) *
                            pGVar32[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar237 = (pGVar32->time_range).lower;
  fVar237 = pGVar32->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar237) /
            ((pGVar32->time_range).upper - fVar237));
  auVar166 = vroundss_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),9);
  auVar166 = vminss_avx(auVar166,ZEXT416((uint)(pGVar32->fnumTimeSegments + -1.0)));
  auVar166 = vmaxss_avx(auVar328._0_16_,auVar166);
  fVar237 = fVar237 - auVar166._0_4_;
  _Var33 = pGVar32[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar126 = (long)(int)auVar166._0_4_ * 0x38;
  lVar125 = *(long *)(_Var33 + lVar126);
  lVar34 = *(long *)(_Var33 + 0x10 + lVar126);
  auVar166 = vshufps_avx(ZEXT416((uint)(1.0 - fVar237)),ZEXT416((uint)(1.0 - fVar237)),0);
  pfVar1 = (float *)(lVar125 + lVar34 * uVar128);
  fVar199 = auVar166._0_4_;
  fVar236 = auVar166._4_4_;
  fVar202 = auVar166._8_4_;
  fVar255 = auVar166._12_4_;
  pfVar2 = (float *)(lVar125 + lVar34 * (uVar128 + 1));
  pfVar3 = (float *)(lVar125 + lVar34 * (uVar128 + 2));
  pfVar4 = (float *)(lVar125 + lVar34 * (uVar128 + 3));
  lVar125 = *(long *)(_Var33 + 0x38 + lVar126);
  lVar34 = *(long *)(_Var33 + 0x48 + lVar126);
  auVar166 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
  pfVar5 = (float *)(lVar125 + uVar128 * lVar34);
  fVar229 = auVar166._0_4_;
  fVar256 = auVar166._4_4_;
  fVar257 = auVar166._8_4_;
  fVar258 = auVar166._12_4_;
  pfVar6 = (float *)(lVar125 + (uVar128 + 1) * lVar34);
  pfVar7 = (float *)(lVar125 + (uVar128 + 2) * lVar34);
  auVar339._0_4_ = fVar229 * *pfVar5 + fVar199 * *pfVar1;
  auVar339._4_4_ = fVar256 * pfVar5[1] + fVar236 * pfVar1[1];
  auVar339._8_4_ = fVar257 * pfVar5[2] + fVar202 * pfVar1[2];
  auVar339._12_4_ = fVar258 * pfVar5[3] + fVar255 * pfVar1[3];
  auVar207._0_4_ = fVar199 * *pfVar2 + fVar229 * *pfVar6;
  auVar207._4_4_ = fVar236 * pfVar2[1] + fVar256 * pfVar6[1];
  auVar207._8_4_ = fVar202 * pfVar2[2] + fVar257 * pfVar6[2];
  auVar207._12_4_ = fVar255 * pfVar2[3] + fVar258 * pfVar6[3];
  auVar239._0_4_ = fVar199 * *pfVar3 + fVar229 * *pfVar7;
  auVar239._4_4_ = fVar236 * pfVar3[1] + fVar256 * pfVar7[1];
  auVar239._8_4_ = fVar202 * pfVar3[2] + fVar257 * pfVar7[2];
  auVar239._12_4_ = fVar255 * pfVar3[3] + fVar258 * pfVar7[3];
  auVar132._0_4_ = (auVar339._0_4_ + auVar207._0_4_) * 0.5;
  auVar132._4_4_ = (auVar339._4_4_ + auVar207._4_4_) * 0.5;
  auVar132._8_4_ = (auVar339._8_4_ + auVar207._8_4_) * 0.5;
  auVar132._12_4_ = (auVar339._12_4_ + auVar207._12_4_) * 0.5;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar166 = vsubps_avx(auVar132,(undefined1  [16])aVar10);
  auVar166 = vdpps_avx(auVar166,(undefined1  [16])aVar11,0x7f);
  auVar134 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar158 = vrcpss_avx(auVar134,auVar134);
  auVar392 = ZEXT464(0x40000000);
  fVar237 = auVar166._0_4_ * auVar158._0_4_ * (2.0 - auVar158._0_4_ * auVar134._0_4_);
  local_760 = ZEXT416((uint)fVar237);
  auVar134 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
  fVar237 = aVar11.x;
  fVar193 = aVar11.y;
  fVar254 = aVar11.z;
  aVar197 = aVar11.field_3;
  auVar306._0_4_ = aVar10.x + fVar237 * auVar134._0_4_;
  auVar306._4_4_ = aVar10.y + fVar193 * auVar134._4_4_;
  auVar306._8_4_ = aVar10.z + fVar254 * auVar134._8_4_;
  auVar306._12_4_ = aVar10.field_3.w + aVar197.w * auVar134._12_4_;
  auVar166 = vblendps_avx(auVar306,_DAT_01feba10,8);
  _local_950 = vsubps_avx(auVar339,auVar166);
  pfVar1 = (float *)(lVar125 + lVar34 * (uVar128 + 3));
  _local_960 = vsubps_avx(auVar239,auVar166);
  auVar351 = ZEXT1664(_local_960);
  auVar240._0_4_ = fVar199 * *pfVar4 + fVar229 * *pfVar1;
  auVar240._4_4_ = fVar236 * pfVar4[1] + fVar256 * pfVar1[1];
  auVar240._8_4_ = fVar202 * pfVar4[2] + fVar257 * pfVar1[2];
  auVar240._12_4_ = fVar255 * pfVar4[3] + fVar258 * pfVar1[3];
  _local_970 = vsubps_avx(auVar207,auVar166);
  _local_980 = vsubps_avx(auVar240,auVar166);
  auVar166 = vshufps_avx(_local_950,_local_950,0);
  register0x00001290 = auVar166;
  _local_2a0 = auVar166;
  auVar166 = vshufps_avx(_local_950,_local_950,0x55);
  register0x00001290 = auVar166;
  _local_1a0 = auVar166;
  auVar166 = vshufps_avx(_local_950,_local_950,0xaa);
  register0x00001290 = auVar166;
  _local_1c0 = auVar166;
  auVar166 = vshufps_avx(_local_950,_local_950,0xff);
  register0x00001290 = auVar166;
  _local_1e0 = auVar166;
  auVar166 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar166;
  _local_2c0 = auVar166;
  auVar166 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar166;
  _local_2e0 = auVar166;
  auVar166 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar166;
  _local_300 = auVar166;
  auVar162._0_4_ = fVar237 * fVar237;
  auVar162._4_4_ = fVar193 * fVar193;
  auVar162._8_4_ = fVar254 * fVar254;
  auVar162._12_4_ = aVar197.w * aVar197.w;
  auVar166 = vshufps_avx(auVar162,auVar162,0xaa);
  auVar158 = vshufps_avx(auVar162,auVar162,0x55);
  auVar163 = vshufps_avx(_local_970,_local_970,0xff);
  register0x000012d0 = auVar163;
  _local_200 = auVar163;
  auVar163 = vshufps_avx(auVar162,auVar162,0);
  local_220._0_4_ = auVar163._0_4_ + auVar158._0_4_ + auVar166._0_4_;
  local_220._4_4_ = auVar163._4_4_ + auVar158._4_4_ + auVar166._4_4_;
  local_220._8_4_ = auVar163._8_4_ + auVar158._8_4_ + auVar166._8_4_;
  local_220._12_4_ = auVar163._12_4_ + auVar158._12_4_ + auVar166._12_4_;
  local_220._16_4_ = auVar163._0_4_ + auVar158._0_4_ + auVar166._0_4_;
  local_220._20_4_ = auVar163._4_4_ + auVar158._4_4_ + auVar166._4_4_;
  local_220._24_4_ = auVar163._8_4_ + auVar158._8_4_ + auVar166._8_4_;
  local_220._28_4_ = auVar163._12_4_ + auVar158._12_4_ + auVar166._12_4_;
  auVar166 = vshufps_avx(_local_960,_local_960,0);
  register0x00001250 = auVar166;
  _local_320 = auVar166;
  auVar166 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001250 = auVar166;
  _local_340 = auVar166;
  auVar166 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001250 = auVar166;
  _local_360 = auVar166;
  auVar166 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001250 = auVar166;
  _local_380 = auVar166;
  auVar166 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar166;
  _local_3a0 = auVar166;
  auVar166 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar166;
  _local_3c0 = auVar166;
  auVar166 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar166;
  _local_3e0 = auVar166;
  auVar166 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar166;
  _local_240 = auVar166;
  register0x00001390 = auVar134;
  _local_740 = auVar134;
  uVar128 = 1;
  uVar123 = 0;
  local_4e0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4dc = local_4e0;
  fStack_4d8 = local_4e0;
  fStack_4d4 = local_4e0;
  fStack_4d0 = local_4e0;
  fStack_4cc = local_4e0;
  fStack_4c8 = local_4e0;
  fStack_4c4 = local_4e0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  auVar145._8_4_ = 0x7fffffff;
  auVar145._0_8_ = 0x7fffffff7fffffff;
  auVar145._12_4_ = 0x7fffffff;
  auVar145._16_4_ = 0x7fffffff;
  auVar145._20_4_ = 0x7fffffff;
  auVar145._24_4_ = 0x7fffffff;
  auVar145._28_4_ = 0x7fffffff;
  local_400 = vandps_avx(local_220,auVar145);
  local_770 = 0x3f80000000000000;
  uStack_768 = 0;
  auVar297 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar118._8_8_ = uStack_768;
    auVar118._0_8_ = local_770;
    auVar166 = vmovshdup_avx(auVar118);
    fVar256 = auVar166._0_4_ - (float)local_770;
    auVar166 = vshufps_avx(auVar118,auVar118,0);
    local_860._16_16_ = auVar166;
    local_860._0_16_ = auVar166;
    auVar134 = vshufps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar256),0);
    local_8c0._16_16_ = auVar134;
    local_8c0._0_16_ = auVar134;
    fVar159 = auVar134._0_4_;
    fVar192 = auVar134._4_4_;
    fVar195 = auVar134._8_4_;
    fVar198 = auVar134._12_4_;
    fVar130 = auVar166._0_4_;
    auVar249._0_4_ = fVar130 + fVar159 * 0.0;
    fVar155 = auVar166._4_4_;
    auVar249._4_4_ = fVar155 + fVar192 * 0.14285715;
    fVar156 = auVar166._8_4_;
    auVar249._8_4_ = fVar156 + fVar195 * 0.2857143;
    fVar157 = auVar166._12_4_;
    auVar249._12_4_ = fVar157 + fVar198 * 0.42857146;
    auVar249._16_4_ = fVar130 + fVar159 * 0.5714286;
    auVar249._20_4_ = fVar155 + fVar192 * 0.71428573;
    auVar249._24_4_ = fVar156 + fVar195 * 0.8571429;
    auVar249._28_4_ = fVar157 + fVar198;
    auVar150 = vsubps_avx(auVar297._0_32_,auVar249);
    auVar219._0_4_ = auVar249._0_4_ * auVar249._0_4_;
    auVar219._4_4_ = auVar249._4_4_ * auVar249._4_4_;
    auVar219._8_4_ = auVar249._8_4_ * auVar249._8_4_;
    auVar219._12_4_ = auVar249._12_4_ * auVar249._12_4_;
    auVar219._16_4_ = auVar249._16_4_ * auVar249._16_4_;
    auVar219._20_4_ = auVar249._20_4_ * auVar249._20_4_;
    auVar219._24_4_ = auVar249._24_4_ * auVar249._24_4_;
    auVar219._28_4_ = 0;
    fVar257 = auVar249._0_4_ * 3.0;
    fVar259 = auVar249._4_4_ * 3.0;
    fVar274 = auVar249._8_4_ * 3.0;
    fVar275 = auVar249._12_4_ * 3.0;
    fVar276 = auVar249._16_4_ * 3.0;
    fVar277 = auVar249._20_4_ * 3.0;
    fVar278 = auVar249._24_4_ * 3.0;
    fVar193 = auVar150._0_4_;
    auVar328._0_4_ = fVar193 * fVar193;
    fVar254 = auVar150._4_4_;
    auVar328._4_4_ = fVar254 * fVar254;
    fVar199 = auVar150._8_4_;
    auVar328._8_4_ = fVar199 * fVar199;
    fVar236 = auVar150._12_4_;
    auVar328._12_4_ = fVar236 * fVar236;
    fVar202 = auVar150._16_4_;
    auVar328._16_4_ = fVar202 * fVar202;
    fVar255 = auVar150._20_4_;
    auVar328._20_4_ = fVar255 * fVar255;
    fVar229 = auVar150._24_4_;
    auVar328._28_36_ = auVar351._28_36_;
    auVar328._24_4_ = fVar229 * fVar229;
    fVar258 = auVar150._28_4_;
    fVar279 = (auVar328._0_4_ * (fVar193 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar280 = (auVar328._4_4_ * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar298 = (auVar328._8_4_ * (fVar199 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar299 = (auVar328._12_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar300 = (auVar328._16_4_ * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar301 = (auVar328._20_4_ * (fVar255 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar302 = (auVar328._24_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar303 = -fVar193 * auVar249._0_4_ * auVar249._0_4_ * 0.5;
    fVar377 = -fVar254 * auVar249._4_4_ * auVar249._4_4_ * 0.5;
    fVar378 = -fVar199 * auVar249._8_4_ * auVar249._8_4_ * 0.5;
    fVar379 = -fVar236 * auVar249._12_4_ * auVar249._12_4_ * 0.5;
    fVar380 = -fVar202 * auVar249._16_4_ * auVar249._16_4_ * 0.5;
    fVar381 = -fVar255 * auVar249._20_4_ * auVar249._20_4_ * 0.5;
    fVar382 = -fVar229 * auVar249._24_4_ * auVar249._24_4_ * 0.5;
    fVar237 = auVar432._28_4_;
    fVar393 = auVar392._28_4_ + fVar237;
    fVar402 = auVar401._28_4_ + fVar237;
    fVar428 = (auVar219._0_4_ * (fVar257 + -5.0) + 2.0) * 0.5;
    fVar433 = (auVar219._4_4_ * (fVar259 + -5.0) + 2.0) * 0.5;
    fVar434 = (auVar219._8_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar435 = (auVar219._12_4_ * (fVar275 + -5.0) + 2.0) * 0.5;
    fVar436 = (auVar219._16_4_ * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar437 = (auVar219._20_4_ * (fVar277 + -5.0) + 2.0) * 0.5;
    fVar438 = (auVar219._24_4_ * (fVar278 + -5.0) + 2.0) * 0.5;
    fVar384 = -fVar258 + fVar393;
    fVar403 = -auVar249._0_4_ * fVar193 * fVar193 * 0.5;
    fVar414 = -auVar249._4_4_ * fVar254 * fVar254 * 0.5;
    fVar417 = -auVar249._8_4_ * fVar199 * fVar199 * 0.5;
    fVar419 = -auVar249._12_4_ * fVar236 * fVar236 * 0.5;
    fVar421 = -auVar249._16_4_ * fVar202 * fVar202 * 0.5;
    fVar423 = -auVar249._20_4_ * fVar255 * fVar255 * 0.5;
    fVar425 = -auVar249._24_4_ * fVar229 * fVar229 * 0.5;
    local_a80 = fVar403 * (float)local_2a0._0_4_ +
                fVar428 * (float)local_2c0._0_4_ +
                fVar303 * (float)local_3a0._0_4_ + fVar279 * (float)local_320._0_4_;
    fStack_a7c = fVar414 * (float)local_2a0._4_4_ +
                 fVar433 * (float)local_2c0._4_4_ +
                 fVar377 * (float)local_3a0._4_4_ + fVar280 * (float)local_320._4_4_;
    fStack_a78 = fVar417 * fStack_298 +
                 fVar434 * fStack_2b8 + fVar378 * fStack_398 + fVar298 * fStack_318;
    fStack_a74 = fVar419 * fStack_294 +
                 fVar435 * fStack_2b4 + fVar379 * fStack_394 + fVar299 * fStack_314;
    fStack_a70 = fVar421 * fStack_290 +
                 fVar436 * fStack_2b0 + fVar380 * fStack_390 + fVar300 * fStack_310;
    fStack_a6c = fVar423 * fStack_28c +
                 fVar437 * fStack_2ac + fVar381 * fStack_38c + fVar301 * fStack_30c;
    fStack_a68 = fVar425 * fStack_288 +
                 fVar438 * fStack_2a8 + fVar382 * fStack_388 + fVar302 * fStack_308;
    fStack_a64 = fVar237 + 2.0 + fVar384;
    local_ae0 = (float)local_1a0._0_4_ * fVar403 +
                fVar428 * (float)local_2e0._0_4_ +
                fVar303 * (float)local_3c0._0_4_ + fVar279 * (float)local_340._0_4_;
    fStack_adc = (float)local_1a0._4_4_ * fVar414 +
                 fVar433 * (float)local_2e0._4_4_ +
                 fVar377 * (float)local_3c0._4_4_ + fVar280 * (float)local_340._4_4_;
    fStack_ad8 = fStack_198 * fVar417 +
                 fVar434 * fStack_2d8 + fVar378 * fStack_3b8 + fVar298 * fStack_338;
    fStack_ad4 = fStack_194 * fVar419 +
                 fVar435 * fStack_2d4 + fVar379 * fStack_3b4 + fVar299 * fStack_334;
    fStack_ad0 = fStack_190 * fVar421 +
                 fVar436 * fStack_2d0 + fVar380 * fStack_3b0 + fVar300 * fStack_330;
    fStack_acc = fStack_18c * fVar423 +
                 fVar437 * fStack_2cc + fVar381 * fStack_3ac + fVar301 * fStack_32c;
    fStack_ac8 = fStack_188 * fVar425 +
                 fVar438 * fStack_2c8 + fVar382 * fStack_3a8 + fVar302 * fStack_328;
    fStack_ac4 = fVar384 + fVar393 + fVar402;
    local_ac0 = fVar403 * (float)local_1c0._0_4_ +
                fVar428 * (float)local_300._0_4_ +
                fVar303 * (float)local_3e0._0_4_ + fVar279 * (float)local_360._0_4_;
    fStack_abc = fVar414 * (float)local_1c0._4_4_ +
                 fVar433 * (float)local_300._4_4_ +
                 fVar377 * (float)local_3e0._4_4_ + fVar280 * (float)local_360._4_4_;
    fStack_ab8 = fVar417 * fStack_1b8 +
                 fVar434 * fStack_2f8 + fVar378 * fStack_3d8 + fVar298 * fStack_358;
    fStack_ab4 = fVar419 * fStack_1b4 +
                 fVar435 * fStack_2f4 + fVar379 * fStack_3d4 + fVar299 * fStack_354;
    fStack_ab0 = fVar421 * fStack_1b0 +
                 fVar436 * fStack_2f0 + fVar380 * fStack_3d0 + fVar300 * fStack_350;
    fStack_aac = fVar423 * fStack_1ac +
                 fVar437 * fStack_2ec + fVar381 * fStack_3cc + fVar301 * fStack_34c;
    fStack_aa8 = fVar425 * fStack_1a8 +
                 fVar438 * fStack_2e8 + fVar382 * fStack_3c8 + fVar302 * fStack_348;
    fStack_aa4 = fVar384 + fVar402 + auVar413._28_4_ + fVar237;
    local_7c0._0_4_ =
         (float)local_1e0._0_4_ * fVar403 +
         (float)local_200._0_4_ * fVar428 +
         (float)local_240._0_4_ * fVar303 + fVar279 * (float)local_380._0_4_;
    local_7c0._4_4_ =
         (float)local_1e0._4_4_ * fVar414 +
         (float)local_200._4_4_ * fVar433 +
         (float)local_240._4_4_ * fVar377 + fVar280 * (float)local_380._4_4_;
    local_7c0._8_4_ =
         fStack_1d8 * fVar417 + fStack_1f8 * fVar434 + fStack_238 * fVar378 + fVar298 * fStack_378;
    local_7c0._12_4_ =
         fStack_1d4 * fVar419 + fStack_1f4 * fVar435 + fStack_234 * fVar379 + fVar299 * fStack_374;
    local_7c0._16_4_ =
         fStack_1d0 * fVar421 + fStack_1f0 * fVar436 + fStack_230 * fVar380 + fVar300 * fStack_370;
    local_7c0._20_4_ =
         fStack_1cc * fVar423 + fStack_1ec * fVar437 + fStack_22c * fVar381 + fVar301 * fStack_36c;
    local_7c0._24_4_ =
         fStack_1c8 * fVar425 + fStack_1e8 * fVar438 + fStack_228 * fVar382 + fVar302 * fStack_368;
    local_7c0._28_4_ = fVar384 + fVar237 + 2.0 + -fVar258 + auVar297._28_4_ + -5.0 + 2.0;
    auVar52._4_4_ = (fVar254 + fVar254) * auVar249._4_4_;
    auVar52._0_4_ = (fVar193 + fVar193) * auVar249._0_4_;
    auVar52._8_4_ = (fVar199 + fVar199) * auVar249._8_4_;
    auVar52._12_4_ = (fVar236 + fVar236) * auVar249._12_4_;
    auVar52._16_4_ = (fVar202 + fVar202) * auVar249._16_4_;
    auVar52._20_4_ = (fVar255 + fVar255) * auVar249._20_4_;
    auVar52._24_4_ = (fVar229 + fVar229) * auVar249._24_4_;
    auVar52._28_4_ = auVar249._28_4_ + auVar249._28_4_;
    auVar150 = vsubps_avx(auVar52,auVar328._0_32_);
    auVar53._4_4_ = (fVar254 + fVar254) * (fVar259 + 2.0);
    auVar53._0_4_ = (fVar193 + fVar193) * (fVar257 + 2.0);
    auVar53._8_4_ = (fVar199 + fVar199) * (fVar274 + 2.0);
    auVar53._12_4_ = (fVar236 + fVar236) * (fVar275 + 2.0);
    auVar53._16_4_ = (fVar202 + fVar202) * (fVar276 + 2.0);
    auVar53._20_4_ = (fVar255 + fVar255) * (fVar277 + 2.0);
    auVar53._24_4_ = (fVar229 + fVar229) * (fVar278 + 2.0);
    auVar53._28_4_ = 0x40000000;
    auVar54._4_4_ = fVar254 * fVar254 * 3.0;
    auVar54._0_4_ = fVar193 * fVar193 * 3.0;
    auVar54._8_4_ = fVar199 * fVar199 * 3.0;
    auVar54._12_4_ = fVar236 * fVar236 * 3.0;
    auVar54._16_4_ = fVar202 * fVar202 * 3.0;
    auVar54._20_4_ = fVar255 * fVar255 * 3.0;
    auVar54._24_4_ = fVar229 * fVar229 * 3.0;
    auVar54._28_4_ = fVar258;
    auVar178 = vsubps_avx(auVar53,auVar54);
    auVar36 = vsubps_avx(auVar219,auVar52);
    fVar380 = auVar150._0_4_ * 0.5;
    fVar381 = auVar150._4_4_ * 0.5;
    fVar382 = auVar150._8_4_ * 0.5;
    fVar384 = auVar150._12_4_ * 0.5;
    fVar393 = auVar150._16_4_ * 0.5;
    fVar402 = auVar150._20_4_ * 0.5;
    fVar403 = auVar150._24_4_ * 0.5;
    fVar298 = (auVar249._0_4_ * fVar257 + (auVar249._0_4_ + auVar249._0_4_) * (fVar257 + -5.0)) *
              0.5;
    fVar299 = (auVar249._4_4_ * fVar259 + (auVar249._4_4_ + auVar249._4_4_) * (fVar259 + -5.0)) *
              0.5;
    fVar300 = (auVar249._8_4_ * fVar274 + (auVar249._8_4_ + auVar249._8_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar303 = (auVar249._12_4_ * fVar275 + (auVar249._12_4_ + auVar249._12_4_) * (fVar275 + -5.0)) *
              0.5;
    fVar377 = (auVar249._16_4_ * fVar276 + (auVar249._16_4_ + auVar249._16_4_) * (fVar276 + -5.0)) *
              0.5;
    fVar378 = (auVar249._20_4_ * fVar277 + (auVar249._20_4_ + auVar249._20_4_) * (fVar277 + -5.0)) *
              0.5;
    fVar379 = (auVar249._24_4_ * fVar278 + (auVar249._24_4_ + auVar249._24_4_) * (fVar278 + -5.0)) *
              0.5;
    fVar237 = auVar178._0_4_ * 0.5;
    fVar193 = auVar178._4_4_ * 0.5;
    fVar254 = auVar178._8_4_ * 0.5;
    fVar199 = auVar178._12_4_ * 0.5;
    fVar236 = auVar178._16_4_ * 0.5;
    fVar202 = auVar178._20_4_ * 0.5;
    fVar257 = auVar178._24_4_ * 0.5;
    fVar255 = auVar36._0_4_ * 0.5;
    fVar229 = auVar36._4_4_ * 0.5;
    fVar259 = auVar36._8_4_ * 0.5;
    fVar274 = auVar36._12_4_ * 0.5;
    fVar275 = auVar36._16_4_ * 0.5;
    fVar279 = auVar36._20_4_ * 0.5;
    fVar280 = auVar36._24_4_ * 0.5;
    fVar370 = fVar258 + fVar258 + auVar150._28_4_;
    fVar335 = fVar370 + fVar258 + fVar258 + -5.0;
    fVar302 = auVar249._28_4_ + -5.0 + auVar178._28_4_ + auVar36._28_4_ + 2.0;
    auVar166 = vpermilps_avx(ZEXT416((uint)(fVar256 * 0.04761905)),0);
    fVar277 = auVar166._0_4_;
    fVar318 = fVar277 * (fVar380 * (float)local_2a0._0_4_ +
                        fVar298 * (float)local_2c0._0_4_ +
                        fVar237 * (float)local_320._0_4_ + fVar255 * (float)local_3a0._0_4_);
    fVar278 = auVar166._4_4_;
    fVar329 = fVar278 * (fVar381 * (float)local_2a0._4_4_ +
                        fVar299 * (float)local_2c0._4_4_ +
                        fVar193 * (float)local_320._4_4_ + fVar229 * (float)local_3a0._4_4_);
    local_900._4_4_ = fVar329;
    local_900._0_4_ = fVar318;
    fVar301 = auVar166._8_4_;
    fVar330 = fVar301 * (fVar382 * fStack_298 +
                        fVar300 * fStack_2b8 + fVar254 * fStack_318 + fVar259 * fStack_398);
    fStack_8f8 = fVar330;
    fVar276 = auVar166._12_4_;
    fVar331 = fVar276 * (fVar384 * fStack_294 +
                        fVar303 * fStack_2b4 + fVar199 * fStack_314 + fVar274 * fStack_394);
    fStack_8f4 = fVar331;
    fVar332 = fVar277 * (fVar393 * fStack_290 +
                        fVar377 * fStack_2b0 + fVar236 * fStack_310 + fVar275 * fStack_390);
    unique0x1000ce70 = fVar332;
    fVar333 = fVar278 * (fVar402 * fStack_28c +
                        fVar378 * fStack_2ac + fVar202 * fStack_30c + fVar279 * fStack_38c);
    unique0x1000ce74 = fVar333;
    fVar334 = fVar301 * (fVar403 * fStack_288 +
                        fVar379 * fStack_2a8 + fVar257 * fStack_308 + fVar280 * fStack_388);
    unique0x1000ce78 = fVar334;
    unique0x1000ce7c = fVar335;
    fVar336 = fVar277 * ((float)local_1a0._0_4_ * fVar380 +
                        fVar298 * (float)local_2e0._0_4_ +
                        fVar237 * (float)local_340._0_4_ + fVar255 * (float)local_3c0._0_4_);
    fVar352 = fVar278 * ((float)local_1a0._4_4_ * fVar381 +
                        fVar299 * (float)local_2e0._4_4_ +
                        fVar193 * (float)local_340._4_4_ + fVar229 * (float)local_3c0._4_4_);
    local_920._4_4_ = fVar352;
    local_920._0_4_ = fVar336;
    fVar355 = fVar301 * (fStack_198 * fVar382 +
                        fVar300 * fStack_2d8 + fVar254 * fStack_338 + fVar259 * fStack_3b8);
    local_920._8_4_ = fVar355;
    fVar358 = fVar276 * (fStack_194 * fVar384 +
                        fVar303 * fStack_2d4 + fVar199 * fStack_334 + fVar274 * fStack_3b4);
    local_920._12_4_ = fVar358;
    fVar361 = fVar277 * (fStack_190 * fVar393 +
                        fVar377 * fStack_2d0 + fVar236 * fStack_330 + fVar275 * fStack_3b0);
    local_920._16_4_ = fVar361;
    fVar364 = fVar278 * (fStack_18c * fVar402 +
                        fVar378 * fStack_2cc + fVar202 * fStack_32c + fVar279 * fStack_3ac);
    local_920._20_4_ = fVar364;
    fVar367 = fVar301 * (fStack_188 * fVar403 +
                        fVar379 * fStack_2c8 + fVar257 * fStack_328 + fVar280 * fStack_3a8);
    local_920._24_4_ = fVar367;
    local_920._28_4_ = fVar370;
    fVar404 = fVar277 * ((float)local_1c0._0_4_ * fVar380 +
                        fVar237 * (float)local_360._0_4_ + fVar255 * (float)local_3e0._0_4_ +
                        fVar298 * (float)local_300._0_4_);
    fVar415 = fVar278 * ((float)local_1c0._4_4_ * fVar381 +
                        fVar193 * (float)local_360._4_4_ + fVar229 * (float)local_3e0._4_4_ +
                        fVar299 * (float)local_300._4_4_);
    local_7a0._4_4_ = fVar415;
    local_7a0._0_4_ = fVar404;
    fVar418 = fVar301 * (fStack_1b8 * fVar382 +
                        fVar254 * fStack_358 + fVar259 * fStack_3d8 + fVar300 * fStack_2f8);
    local_7a0._8_4_ = fVar418;
    fVar420 = fVar276 * (fStack_1b4 * fVar384 +
                        fVar199 * fStack_354 + fVar274 * fStack_3d4 + fVar303 * fStack_2f4);
    local_7a0._12_4_ = fVar420;
    fVar422 = fVar277 * (fStack_1b0 * fVar393 +
                        fVar236 * fStack_350 + fVar275 * fStack_3d0 + fVar377 * fStack_2f0);
    local_7a0._16_4_ = fVar422;
    fVar424 = fVar278 * (fStack_1ac * fVar402 +
                        fVar202 * fStack_34c + fVar279 * fStack_3cc + fVar378 * fStack_2ec);
    local_7a0._20_4_ = fVar424;
    fVar426 = fVar301 * (fStack_1a8 * fVar403 +
                        fVar257 * fStack_348 + fVar280 * fStack_3c8 + fVar379 * fStack_2e8);
    local_7a0._24_4_ = fVar426;
    local_7a0._28_4_ = -auVar249._28_4_;
    fVar255 = fVar277 * ((float)local_1e0._0_4_ * fVar380 +
                        (float)local_200._0_4_ * fVar298 +
                        fVar237 * (float)local_380._0_4_ + (float)local_240._0_4_ * fVar255);
    fVar229 = fVar278 * ((float)local_1e0._4_4_ * fVar381 +
                        (float)local_200._4_4_ * fVar299 +
                        fVar193 * (float)local_380._4_4_ + (float)local_240._4_4_ * fVar229);
    auVar55._4_4_ = fVar229;
    auVar55._0_4_ = fVar255;
    fVar256 = fVar301 * (fStack_1d8 * fVar382 +
                        fStack_1f8 * fVar300 + fVar254 * fStack_378 + fStack_238 * fVar259);
    auVar55._8_4_ = fVar256;
    fVar276 = fVar276 * (fStack_1d4 * fVar384 +
                        fStack_1f4 * fVar303 + fVar199 * fStack_374 + fStack_234 * fVar274);
    auVar55._12_4_ = fVar276;
    fVar277 = fVar277 * (fStack_1d0 * fVar393 +
                        fStack_1f0 * fVar377 + fVar236 * fStack_370 + fStack_230 * fVar275);
    auVar55._16_4_ = fVar277;
    fVar278 = fVar278 * (fStack_1cc * fVar402 +
                        fStack_1ec * fVar378 + fVar202 * fStack_36c + fStack_22c * fVar279);
    auVar55._20_4_ = fVar278;
    fVar301 = fVar301 * (fStack_1c8 * fVar403 +
                        fStack_1e8 * fVar379 + fVar257 * fStack_368 + fStack_228 * fVar280);
    auVar55._24_4_ = fVar301;
    auVar55._28_4_ = fVar302;
    auVar112._4_4_ = fStack_adc;
    auVar112._0_4_ = local_ae0;
    auVar112._8_4_ = fStack_ad8;
    auVar112._12_4_ = fStack_ad4;
    auVar112._16_4_ = fStack_ad0;
    auVar112._20_4_ = fStack_acc;
    auVar112._24_4_ = fStack_ac8;
    auVar112._28_4_ = fStack_ac4;
    auVar150 = vperm2f128_avx(auVar112,auVar112,1);
    auVar150 = vshufps_avx(auVar150,auVar112,0x30);
    _local_8e0 = vshufps_avx(auVar112,auVar150,0x29);
    auVar114._4_4_ = fStack_abc;
    auVar114._0_4_ = local_ac0;
    auVar114._8_4_ = fStack_ab8;
    auVar114._12_4_ = fStack_ab4;
    auVar114._16_4_ = fStack_ab0;
    auVar114._20_4_ = fStack_aac;
    auVar114._24_4_ = fStack_aa8;
    auVar114._28_4_ = fStack_aa4;
    auVar150 = vperm2f128_avx(auVar114,auVar114,1);
    auVar150 = vshufps_avx(auVar150,auVar114,0x30);
    _local_a00 = vshufps_avx(auVar114,auVar150,0x29);
    auVar178 = vsubps_avx(local_7c0,auVar55);
    auVar150 = vperm2f128_avx(auVar178,auVar178,1);
    auVar150 = vshufps_avx(auVar150,auVar178,0x30);
    local_7e0 = vshufps_avx(auVar178,auVar150,0x29);
    local_540 = vsubps_avx(_local_8e0,auVar112);
    _local_680 = vsubps_avx(_local_a00,auVar114);
    fVar193 = local_540._0_4_;
    fVar257 = local_540._4_4_;
    auVar56._4_4_ = fVar415 * fVar257;
    auVar56._0_4_ = fVar404 * fVar193;
    fVar279 = local_540._8_4_;
    auVar56._8_4_ = fVar418 * fVar279;
    fVar377 = local_540._12_4_;
    auVar56._12_4_ = fVar420 * fVar377;
    fVar402 = local_540._16_4_;
    auVar56._16_4_ = fVar422 * fVar402;
    fVar428 = local_540._20_4_;
    auVar56._20_4_ = fVar424 * fVar428;
    fVar42 = local_540._24_4_;
    auVar56._24_4_ = fVar426 * fVar42;
    auVar56._28_4_ = auVar178._28_4_;
    fVar254 = local_680._0_4_;
    fVar258 = local_680._4_4_;
    auVar57._4_4_ = fVar352 * fVar258;
    auVar57._0_4_ = fVar336 * fVar254;
    fVar280 = local_680._8_4_;
    auVar57._8_4_ = fVar355 * fVar280;
    fVar378 = local_680._12_4_;
    auVar57._12_4_ = fVar358 * fVar378;
    fVar403 = local_680._16_4_;
    auVar57._16_4_ = fVar361 * fVar403;
    fVar433 = local_680._20_4_;
    auVar57._20_4_ = fVar364 * fVar433;
    fVar43 = local_680._24_4_;
    auVar57._24_4_ = fVar367 * fVar43;
    auVar57._28_4_ = auVar150._28_4_;
    auVar36 = vsubps_avx(auVar57,auVar56);
    auVar116._4_4_ = fStack_a7c;
    auVar116._0_4_ = local_a80;
    auVar116._8_4_ = fStack_a78;
    auVar116._12_4_ = fStack_a74;
    auVar116._16_4_ = fStack_a70;
    auVar116._20_4_ = fStack_a6c;
    auVar116._24_4_ = fStack_a68;
    auVar116._28_4_ = fStack_a64;
    auVar150 = vperm2f128_avx(auVar116,auVar116,1);
    auVar150 = vshufps_avx(auVar150,auVar116,0x30);
    local_9a0 = vshufps_avx(auVar116,auVar150,0x29);
    local_560 = vsubps_avx(local_9a0,auVar116);
    auVar58._4_4_ = fVar258 * fVar329;
    auVar58._0_4_ = fVar254 * fVar318;
    auVar58._8_4_ = fVar280 * fVar330;
    auVar58._12_4_ = fVar378 * fVar331;
    auVar58._16_4_ = fVar403 * fVar332;
    auVar58._20_4_ = fVar433 * fVar333;
    auVar58._24_4_ = fVar43 * fVar334;
    auVar58._28_4_ = auVar150._28_4_;
    fVar199 = local_560._0_4_;
    fVar259 = local_560._4_4_;
    auVar59._4_4_ = fVar415 * fVar259;
    auVar59._0_4_ = fVar404 * fVar199;
    fVar298 = local_560._8_4_;
    auVar59._8_4_ = fVar418 * fVar298;
    fVar379 = local_560._12_4_;
    auVar59._12_4_ = fVar420 * fVar379;
    fVar414 = local_560._16_4_;
    auVar59._16_4_ = fVar422 * fVar414;
    fVar434 = local_560._20_4_;
    auVar59._20_4_ = fVar424 * fVar434;
    fVar44 = local_560._24_4_;
    auVar59._24_4_ = fVar426 * fVar44;
    auVar59._28_4_ = fStack_a64;
    auVar37 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ = fVar352 * fVar259;
    auVar60._0_4_ = fVar336 * fVar199;
    auVar60._8_4_ = fVar355 * fVar298;
    auVar60._12_4_ = fVar358 * fVar379;
    auVar60._16_4_ = fVar361 * fVar414;
    auVar60._20_4_ = fVar364 * fVar434;
    auVar60._24_4_ = fVar367 * fVar44;
    auVar60._28_4_ = fStack_a64;
    auVar61._4_4_ = fVar257 * fVar329;
    auVar61._0_4_ = fVar193 * fVar318;
    auVar61._8_4_ = fVar279 * fVar330;
    auVar61._12_4_ = fVar377 * fVar331;
    auVar61._16_4_ = fVar402 * fVar332;
    auVar61._20_4_ = fVar428 * fVar333;
    auVar61._24_4_ = fVar42 * fVar334;
    auVar61._28_4_ = fStack_aa4;
    auVar38 = vsubps_avx(auVar61,auVar60);
    fVar237 = auVar38._28_4_;
    fVar303 = auVar37._28_4_ + fVar237;
    auVar250._0_4_ = fVar199 * fVar199 + fVar193 * fVar193 + fVar254 * fVar254;
    auVar250._4_4_ = fVar259 * fVar259 + fVar257 * fVar257 + fVar258 * fVar258;
    auVar250._8_4_ = fVar298 * fVar298 + fVar279 * fVar279 + fVar280 * fVar280;
    auVar250._12_4_ = fVar379 * fVar379 + fVar377 * fVar377 + fVar378 * fVar378;
    auVar250._16_4_ = fVar414 * fVar414 + fVar402 * fVar402 + fVar403 * fVar403;
    auVar250._20_4_ = fVar434 * fVar434 + fVar428 * fVar428 + fVar433 * fVar433;
    auVar250._24_4_ = fVar44 * fVar44 + fVar42 * fVar42 + fVar43 * fVar43;
    auVar250._28_4_ = fVar237 + fVar237 + fVar303;
    auVar150 = vrcpps_avx(auVar250);
    fVar382 = auVar150._0_4_;
    fVar384 = auVar150._4_4_;
    auVar62._4_4_ = fVar384 * auVar250._4_4_;
    auVar62._0_4_ = fVar382 * auVar250._0_4_;
    fVar393 = auVar150._8_4_;
    auVar62._8_4_ = fVar393 * auVar250._8_4_;
    fVar421 = auVar150._12_4_;
    auVar62._12_4_ = fVar421 * auVar250._12_4_;
    fVar423 = auVar150._16_4_;
    auVar62._16_4_ = fVar423 * auVar250._16_4_;
    fVar425 = auVar150._20_4_;
    auVar62._20_4_ = fVar425 * auVar250._20_4_;
    fVar437 = auVar150._24_4_;
    auVar62._24_4_ = fVar437 * auVar250._24_4_;
    auVar62._28_4_ = fStack_aa4;
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = &DAT_3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar146._16_4_ = 0x3f800000;
    auVar146._20_4_ = 0x3f800000;
    auVar146._24_4_ = 0x3f800000;
    auVar146._28_4_ = 0x3f800000;
    auVar253 = vsubps_avx(auVar146,auVar62);
    fVar382 = auVar253._0_4_ * fVar382 + fVar382;
    fVar384 = auVar253._4_4_ * fVar384 + fVar384;
    fVar393 = auVar253._8_4_ * fVar393 + fVar393;
    fVar421 = auVar253._12_4_ * fVar421 + fVar421;
    fVar423 = auVar253._16_4_ * fVar423 + fVar423;
    fVar425 = auVar253._20_4_ * fVar425 + fVar425;
    fVar437 = auVar253._24_4_ * fVar437 + fVar437;
    auVar178 = vperm2f128_avx(local_920,local_920,1);
    auVar178 = vshufps_avx(auVar178,local_920,0x30);
    local_9c0 = vshufps_avx(local_920,auVar178,0x29);
    auVar178 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar178 = vshufps_avx(auVar178,local_7a0,0x30);
    local_820 = vshufps_avx(local_7a0,auVar178,0x29);
    fVar337 = local_820._0_4_;
    fVar353 = local_820._4_4_;
    auVar63._4_4_ = fVar353 * fVar257;
    auVar63._0_4_ = fVar337 * fVar193;
    fVar356 = local_820._8_4_;
    auVar63._8_4_ = fVar356 * fVar279;
    fVar359 = local_820._12_4_;
    auVar63._12_4_ = fVar359 * fVar377;
    fVar362 = local_820._16_4_;
    auVar63._16_4_ = fVar362 * fVar402;
    fVar365 = local_820._20_4_;
    auVar63._20_4_ = fVar365 * fVar428;
    fVar368 = local_820._24_4_;
    auVar63._24_4_ = fVar368 * fVar42;
    auVar63._28_4_ = auVar178._28_4_;
    fVar236 = local_9c0._0_4_;
    fVar274 = local_9c0._4_4_;
    auVar64._4_4_ = fVar258 * fVar274;
    auVar64._0_4_ = fVar254 * fVar236;
    fVar299 = local_9c0._8_4_;
    auVar64._8_4_ = fVar280 * fVar299;
    fVar380 = local_9c0._12_4_;
    auVar64._12_4_ = fVar378 * fVar380;
    fVar417 = local_9c0._16_4_;
    auVar64._16_4_ = fVar403 * fVar417;
    fVar435 = local_9c0._20_4_;
    auVar64._20_4_ = fVar433 * fVar435;
    fVar45 = local_9c0._24_4_;
    auVar64._24_4_ = fVar43 * fVar45;
    auVar64._28_4_ = -auVar249._28_4_;
    auVar39 = vsubps_avx(auVar64,auVar63);
    auVar178 = vperm2f128_avx(_local_900,_local_900,1);
    auVar178 = vshufps_avx(auVar178,_local_900,0x30);
    local_9e0 = vshufps_avx(_local_900,auVar178,0x29);
    fVar202 = local_9e0._0_4_;
    fVar275 = local_9e0._4_4_;
    auVar65._4_4_ = fVar258 * fVar275;
    auVar65._0_4_ = fVar254 * fVar202;
    fVar300 = local_9e0._8_4_;
    auVar65._8_4_ = fVar280 * fVar300;
    fVar381 = local_9e0._12_4_;
    auVar65._12_4_ = fVar378 * fVar381;
    fVar419 = local_9e0._16_4_;
    auVar65._16_4_ = fVar403 * fVar419;
    fVar436 = local_9e0._20_4_;
    auVar65._20_4_ = fVar433 * fVar436;
    fVar46 = local_9e0._24_4_;
    auVar65._24_4_ = fVar43 * fVar46;
    auVar65._28_4_ = auVar178._28_4_;
    auVar50 = local_820;
    auVar66._4_4_ = fVar353 * fVar259;
    auVar66._0_4_ = fVar337 * fVar199;
    auVar66._8_4_ = fVar356 * fVar298;
    auVar66._12_4_ = fVar359 * fVar379;
    auVar66._16_4_ = fVar362 * fVar414;
    auVar66._20_4_ = fVar365 * fVar434;
    auVar66._24_4_ = fVar368 * fVar44;
    auVar66._28_4_ = uStack_184;
    auVar178 = vsubps_avx(auVar66,auVar65);
    auVar41 = local_9c0;
    auVar67._4_4_ = fVar259 * fVar274;
    auVar67._0_4_ = fVar199 * fVar236;
    auVar67._8_4_ = fVar298 * fVar299;
    auVar67._12_4_ = fVar379 * fVar380;
    auVar67._16_4_ = fVar414 * fVar417;
    auVar67._20_4_ = fVar434 * fVar435;
    auVar67._24_4_ = fVar44 * fVar45;
    auVar67._28_4_ = uStack_184;
    auVar68._4_4_ = fVar257 * fVar275;
    auVar68._0_4_ = fVar193 * fVar202;
    auVar68._8_4_ = fVar279 * fVar300;
    auVar68._12_4_ = fVar377 * fVar381;
    auVar68._16_4_ = fVar402 * fVar419;
    auVar68._20_4_ = fVar428 * fVar436;
    auVar68._24_4_ = fVar42 * fVar46;
    auVar68._28_4_ = uStack_224;
    auVar40 = vsubps_avx(auVar68,auVar67);
    fVar237 = auVar40._28_4_;
    fVar427 = auVar178._28_4_ + fVar237;
    auVar69._4_4_ =
         (auVar36._4_4_ * auVar36._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar384;
    auVar69._0_4_ =
         (auVar36._0_4_ * auVar36._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar382;
    auVar69._8_4_ =
         (auVar36._8_4_ * auVar36._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar393;
    auVar69._12_4_ =
         (auVar36._12_4_ * auVar36._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar421;
    auVar69._16_4_ =
         (auVar36._16_4_ * auVar36._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar423;
    auVar69._20_4_ =
         (auVar36._20_4_ * auVar36._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar425;
    auVar69._24_4_ =
         (auVar36._24_4_ * auVar36._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar437;
    auVar69._28_4_ = auVar36._28_4_ + fVar303;
    auVar70._4_4_ =
         (auVar39._4_4_ * auVar39._4_4_ +
         auVar178._4_4_ * auVar178._4_4_ + auVar40._4_4_ * auVar40._4_4_) * fVar384;
    auVar70._0_4_ =
         (auVar39._0_4_ * auVar39._0_4_ +
         auVar178._0_4_ * auVar178._0_4_ + auVar40._0_4_ * auVar40._0_4_) * fVar382;
    auVar70._8_4_ =
         (auVar39._8_4_ * auVar39._8_4_ +
         auVar178._8_4_ * auVar178._8_4_ + auVar40._8_4_ * auVar40._8_4_) * fVar393;
    auVar70._12_4_ =
         (auVar39._12_4_ * auVar39._12_4_ +
         auVar178._12_4_ * auVar178._12_4_ + auVar40._12_4_ * auVar40._12_4_) * fVar421;
    auVar70._16_4_ =
         (auVar39._16_4_ * auVar39._16_4_ +
         auVar178._16_4_ * auVar178._16_4_ + auVar40._16_4_ * auVar40._16_4_) * fVar423;
    auVar70._20_4_ =
         (auVar39._20_4_ * auVar39._20_4_ +
         auVar178._20_4_ * auVar178._20_4_ + auVar40._20_4_ * auVar40._20_4_) * fVar425;
    auVar70._24_4_ =
         (auVar39._24_4_ * auVar39._24_4_ +
         auVar178._24_4_ * auVar178._24_4_ + auVar40._24_4_ * auVar40._24_4_) * fVar437;
    auVar70._28_4_ = auVar253._28_4_ + auVar150._28_4_;
    auVar150 = vmaxps_avx(auVar69,auVar70);
    auVar178 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar178 = vshufps_avx(auVar178,local_7c0,0x30);
    _local_800 = vshufps_avx(local_7c0,auVar178,0x29);
    local_700._0_4_ = (float)local_7c0._0_4_ + fVar255;
    local_700._4_4_ = local_7c0._4_4_ + fVar229;
    local_700._8_4_ = local_7c0._8_4_ + fVar256;
    local_700._12_4_ = local_7c0._12_4_ + fVar276;
    local_700._16_4_ = local_7c0._16_4_ + fVar277;
    local_700._20_4_ = local_7c0._20_4_ + fVar278;
    local_700._24_4_ = local_7c0._24_4_ + fVar301;
    local_700._28_4_ = local_7c0._28_4_ + fVar302;
    auVar178 = vmaxps_avx(local_7c0,local_700);
    auVar36 = vmaxps_avx(local_7e0,_local_800);
    auVar178 = vmaxps_avx(auVar178,auVar36);
    auVar36 = vrsqrtps_avx(auVar250);
    fVar255 = auVar36._0_4_;
    fVar229 = auVar36._4_4_;
    fVar256 = auVar36._8_4_;
    fVar276 = auVar36._12_4_;
    fVar277 = auVar36._16_4_;
    fVar278 = auVar36._20_4_;
    fVar301 = auVar36._24_4_;
    auVar71._4_4_ = fVar229 * fVar229 * fVar229 * auVar250._4_4_ * 0.5;
    auVar71._0_4_ = fVar255 * fVar255 * fVar255 * auVar250._0_4_ * 0.5;
    auVar71._8_4_ = fVar256 * fVar256 * fVar256 * auVar250._8_4_ * 0.5;
    auVar71._12_4_ = fVar276 * fVar276 * fVar276 * auVar250._12_4_ * 0.5;
    auVar71._16_4_ = fVar277 * fVar277 * fVar277 * auVar250._16_4_ * 0.5;
    auVar71._20_4_ = fVar278 * fVar278 * fVar278 * auVar250._20_4_ * 0.5;
    auVar71._24_4_ = fVar301 * fVar301 * fVar301 * auVar250._24_4_ * 0.5;
    auVar71._28_4_ = auVar250._28_4_;
    auVar72._4_4_ = fVar229 * 1.5;
    auVar72._0_4_ = fVar255 * 1.5;
    auVar72._8_4_ = fVar256 * 1.5;
    auVar72._12_4_ = fVar276 * 1.5;
    auVar72._16_4_ = fVar277 * 1.5;
    auVar72._20_4_ = fVar278 * 1.5;
    auVar72._24_4_ = fVar301 * 1.5;
    auVar72._28_4_ = auVar36._28_4_;
    local_5a0 = vsubps_avx(auVar72,auVar71);
    auVar113._4_4_ = fStack_adc;
    auVar113._0_4_ = local_ae0;
    auVar113._8_4_ = fStack_ad8;
    auVar113._12_4_ = fStack_ad4;
    auVar113._16_4_ = fStack_ad0;
    auVar113._20_4_ = fStack_acc;
    auVar113._24_4_ = fStack_ac8;
    auVar113._28_4_ = fStack_ac4;
    local_840 = vsubps_avx(ZEXT832(0) << 0x20,auVar113);
    auVar115._4_4_ = fStack_abc;
    auVar115._0_4_ = local_ac0;
    auVar115._8_4_ = fStack_ab8;
    auVar115._12_4_ = fStack_ab4;
    auVar115._16_4_ = fStack_ab0;
    auVar115._20_4_ = fStack_aac;
    auVar115._24_4_ = fStack_aa8;
    auVar115._28_4_ = fStack_aa4;
    local_940 = vsubps_avx(ZEXT832(0) << 0x20,auVar115);
    fVar255 = local_940._0_4_;
    fVar276 = local_940._4_4_;
    fVar301 = local_940._8_4_;
    fVar382 = local_940._12_4_;
    fVar421 = local_940._16_4_;
    fVar437 = local_940._20_4_;
    fVar47 = local_940._24_4_;
    fVar229 = local_840._0_4_;
    fVar277 = local_840._4_4_;
    fVar302 = local_840._8_4_;
    fVar384 = local_840._12_4_;
    fVar423 = local_840._16_4_;
    fVar438 = local_840._20_4_;
    fVar48 = local_840._24_4_;
    auVar117._4_4_ = fStack_a7c;
    auVar117._0_4_ = local_a80;
    auVar117._8_4_ = fStack_a78;
    auVar117._12_4_ = fStack_a74;
    auVar117._16_4_ = fStack_a70;
    auVar117._20_4_ = fStack_a6c;
    auVar117._24_4_ = fStack_a68;
    auVar117._28_4_ = fStack_a64;
    auVar36 = vsubps_avx(ZEXT832(0) << 0x20,auVar117);
    fVar338 = auVar36._0_4_;
    fVar354 = auVar36._4_4_;
    fVar357 = auVar36._8_4_;
    fVar360 = auVar36._12_4_;
    fVar363 = auVar36._16_4_;
    fVar366 = auVar36._20_4_;
    fVar369 = auVar36._24_4_;
    auVar390._0_4_ = fVar338 * local_4e0 + local_500 * fVar229 + local_520 * fVar255;
    auVar390._4_4_ = fVar354 * fStack_4dc + fStack_4fc * fVar277 + fStack_51c * fVar276;
    auVar390._8_4_ = fVar357 * fStack_4d8 + fStack_4f8 * fVar302 + fStack_518 * fVar301;
    auVar390._12_4_ = fVar360 * fStack_4d4 + fStack_4f4 * fVar384 + fStack_514 * fVar382;
    auVar390._16_4_ = fVar363 * fStack_4d0 + fStack_4f0 * fVar423 + fStack_510 * fVar421;
    auVar390._20_4_ = fVar366 * fStack_4cc + fStack_4ec * fVar438 + fStack_50c * fVar437;
    auVar390._24_4_ = fVar369 * fStack_4c8 + fStack_4e8 * fVar48 + fStack_508 * fVar47;
    auVar390._28_4_ = fVar427 + fVar427 + auVar39._28_4_ + fVar427;
    auVar392 = ZEXT3264(auVar390);
    auVar411._0_4_ = fVar338 * fVar338 + fVar229 * fVar229 + fVar255 * fVar255;
    auVar411._4_4_ = fVar354 * fVar354 + fVar277 * fVar277 + fVar276 * fVar276;
    auVar411._8_4_ = fVar357 * fVar357 + fVar302 * fVar302 + fVar301 * fVar301;
    auVar411._12_4_ = fVar360 * fVar360 + fVar384 * fVar384 + fVar382 * fVar382;
    auVar411._16_4_ = fVar363 * fVar363 + fVar423 * fVar423 + fVar421 * fVar421;
    auVar411._20_4_ = fVar366 * fVar366 + fVar438 * fVar438 + fVar437 * fVar437;
    auVar411._24_4_ = fVar369 * fVar369 + fVar48 * fVar48 + fVar47 * fVar47;
    auVar411._28_4_ = fVar237 + fVar237 + fVar427;
    fVar256 = local_5a0._0_4_;
    fVar278 = local_5a0._4_4_;
    fVar303 = local_5a0._8_4_;
    fVar393 = local_5a0._12_4_;
    fVar425 = local_5a0._16_4_;
    fVar427 = local_5a0._20_4_;
    fVar304 = local_5a0._24_4_;
    local_6e0._0_4_ =
         local_4e0 * fVar199 * fVar256 +
         fVar193 * fVar256 * local_500 + fVar254 * fVar256 * local_520;
    local_6e0._4_4_ =
         fStack_4dc * fVar259 * fVar278 +
         fVar257 * fVar278 * fStack_4fc + fVar258 * fVar278 * fStack_51c;
    fStack_6d8 = fStack_4d8 * fVar298 * fVar303 +
                 fVar279 * fVar303 * fStack_4f8 + fVar280 * fVar303 * fStack_518;
    fStack_6d4 = fStack_4d4 * fVar379 * fVar393 +
                 fVar377 * fVar393 * fStack_4f4 + fVar378 * fVar393 * fStack_514;
    fStack_6d0 = fStack_4d0 * fVar414 * fVar425 +
                 fVar402 * fVar425 * fStack_4f0 + fVar403 * fVar425 * fStack_510;
    fStack_6cc = fStack_4cc * fVar434 * fVar427 +
                 fVar428 * fVar427 * fStack_4ec + fVar433 * fVar427 * fStack_50c;
    fStack_6c8 = fStack_4c8 * fVar44 * fVar304 +
                 fVar42 * fVar304 * fStack_4e8 + fVar43 * fVar304 * fStack_508;
    fVar237 = fStack_4c4 + fStack_4e4 + fStack_504;
    local_a20._0_4_ =
         fVar338 * fVar199 * fVar256 + fVar193 * fVar256 * fVar229 + fVar254 * fVar256 * fVar255;
    local_a20._4_4_ =
         fVar354 * fVar259 * fVar278 + fVar257 * fVar278 * fVar277 + fVar258 * fVar278 * fVar276;
    fStack_a18 = fVar357 * fVar298 * fVar303 +
                 fVar279 * fVar303 * fVar302 + fVar280 * fVar303 * fVar301;
    fStack_a14 = fVar360 * fVar379 * fVar393 +
                 fVar377 * fVar393 * fVar384 + fVar378 * fVar393 * fVar382;
    fStack_a10 = fVar363 * fVar414 * fVar425 +
                 fVar402 * fVar425 * fVar423 + fVar403 * fVar425 * fVar421;
    fStack_a0c = fVar366 * fVar434 * fVar427 +
                 fVar428 * fVar427 * fVar438 + fVar433 * fVar427 * fVar437;
    fStack_a08 = fVar369 * fVar44 * fVar304 + fVar42 * fVar304 * fVar48 + fVar43 * fVar304 * fVar47;
    fStack_a04 = fStack_4e4 + fVar237;
    auVar73._4_4_ = (float)local_6e0._4_4_ * (float)local_a20._4_4_;
    auVar73._0_4_ = (float)local_6e0._0_4_ * (float)local_a20._0_4_;
    auVar73._8_4_ = fStack_6d8 * fStack_a18;
    auVar73._12_4_ = fStack_6d4 * fStack_a14;
    auVar73._16_4_ = fStack_6d0 * fStack_a10;
    auVar73._20_4_ = fStack_6cc * fStack_a0c;
    auVar73._24_4_ = fStack_6c8 * fStack_a08;
    auVar73._28_4_ = fVar237;
    auVar37 = vsubps_avx(auVar390,auVar73);
    auVar74._4_4_ = (float)local_a20._4_4_ * (float)local_a20._4_4_;
    auVar74._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar74._8_4_ = fStack_a18 * fStack_a18;
    auVar74._12_4_ = fStack_a14 * fStack_a14;
    auVar74._16_4_ = fStack_a10 * fStack_a10;
    auVar74._20_4_ = fStack_a0c * fStack_a0c;
    auVar74._24_4_ = fStack_a08 * fStack_a08;
    auVar74._28_4_ = fStack_4e4;
    local_620 = vsubps_avx(auVar411,auVar74);
    _local_660 = vsqrtps_avx(auVar150);
    fVar237 = (local_660._0_4_ + auVar178._0_4_) * 1.0000002;
    fVar194 = (local_660._4_4_ + auVar178._4_4_) * 1.0000002;
    fVar196 = (local_660._8_4_ + auVar178._8_4_) * 1.0000002;
    fVar200 = (local_660._12_4_ + auVar178._12_4_) * 1.0000002;
    fVar201 = (local_660._16_4_ + auVar178._16_4_) * 1.0000002;
    fVar203 = (local_660._20_4_ + auVar178._20_4_) * 1.0000002;
    fVar204 = (local_660._24_4_ + auVar178._24_4_) * 1.0000002;
    auVar75._4_4_ = fVar194 * fVar194;
    auVar75._0_4_ = fVar237 * fVar237;
    auVar75._8_4_ = fVar196 * fVar196;
    auVar75._12_4_ = fVar200 * fVar200;
    auVar75._16_4_ = fVar201 * fVar201;
    auVar75._20_4_ = fVar203 * fVar203;
    auVar75._24_4_ = fVar204 * fVar204;
    auVar75._28_4_ = local_660._28_4_ + auVar178._28_4_;
    fVar405 = auVar37._0_4_ + auVar37._0_4_;
    fVar416 = auVar37._4_4_ + auVar37._4_4_;
    local_580 = CONCAT44(fVar416,fVar405);
    fStack_578 = auVar37._8_4_ + auVar37._8_4_;
    fStack_574 = auVar37._12_4_ + auVar37._12_4_;
    fStack_570 = auVar37._16_4_ + auVar37._16_4_;
    fStack_56c = auVar37._20_4_ + auVar37._20_4_;
    fStack_568 = auVar37._24_4_ + auVar37._24_4_;
    fStack_564 = auVar37._28_4_ + auVar37._28_4_;
    auVar178 = vsubps_avx(local_620,auVar75);
    local_5c0._4_4_ = (float)local_6e0._4_4_ * (float)local_6e0._4_4_;
    local_5c0._0_4_ = (float)local_6e0._0_4_ * (float)local_6e0._0_4_;
    local_5c0._8_4_ = fStack_6d8 * fStack_6d8;
    local_5c0._12_4_ = fStack_6d4 * fStack_6d4;
    local_5c0._16_4_ = fStack_6d0 * fStack_6d0;
    local_5c0._20_4_ = fStack_6cc * fStack_6cc;
    local_5c0._24_4_ = fStack_6c8 * fStack_6c8;
    local_5c0._28_4_ = local_560._28_4_;
    auVar401 = ZEXT3264(local_5c0);
    local_6c0 = vsubps_avx(local_220,local_5c0);
    local_720._4_4_ = fVar416 * fVar416;
    local_720._0_4_ = fVar405 * fVar405;
    fStack_718 = fStack_578 * fStack_578;
    fStack_714 = fStack_574 * fStack_574;
    fStack_710 = fStack_570 * fStack_570;
    fStack_70c = fStack_56c * fStack_56c;
    fStack_708 = fStack_568 * fStack_568;
    fStack_704 = 1.0000002;
    fVar194 = local_6c0._0_4_;
    local_640._0_4_ = fVar194 * 4.0;
    fVar196 = local_6c0._4_4_;
    local_640._4_4_ = fVar196 * 4.0;
    fVar200 = local_6c0._8_4_;
    fStack_638 = fVar200 * 4.0;
    fVar201 = local_6c0._12_4_;
    fStack_634 = fVar201 * 4.0;
    fVar203 = local_6c0._16_4_;
    fStack_630 = fVar203 * 4.0;
    fVar204 = local_6c0._20_4_;
    fStack_62c = fVar204 * 4.0;
    fVar383 = local_6c0._24_4_;
    fStack_628 = fVar383 * 4.0;
    uStack_624 = 0x40800000;
    auVar76._4_4_ = auVar178._4_4_ * (float)local_640._4_4_;
    auVar76._0_4_ = auVar178._0_4_ * (float)local_640._0_4_;
    auVar76._8_4_ = auVar178._8_4_ * fStack_638;
    auVar76._12_4_ = auVar178._12_4_ * fStack_634;
    auVar76._16_4_ = auVar178._16_4_ * fStack_630;
    auVar76._20_4_ = auVar178._20_4_ * fStack_62c;
    auVar76._24_4_ = auVar178._24_4_ * fStack_628;
    auVar76._28_4_ = 0x40800000;
    auVar37 = vsubps_avx(_local_720,auVar76);
    auVar150 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
    fVar237 = local_6c0._28_4_;
    if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar150 >> 0x7f,0) == '\0') &&
          (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar150 >> 0xbf,0) == '\0') &&
        (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar150[0x1f])
    {
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar412._8_4_ = 0xff800000;
      auVar412._0_8_ = 0xff800000ff800000;
      auVar412._12_4_ = 0xff800000;
      auVar412._16_4_ = 0xff800000;
      auVar412._20_4_ = 0xff800000;
      auVar412._24_4_ = 0xff800000;
      auVar412._28_4_ = 0xff800000;
      auVar348 = auVar36;
    }
    else {
      auVar39 = vsqrtps_avx(auVar37);
      auVar309._0_4_ = fVar194 + fVar194;
      auVar309._4_4_ = fVar196 + fVar196;
      auVar309._8_4_ = fVar200 + fVar200;
      auVar309._12_4_ = fVar201 + fVar201;
      auVar309._16_4_ = fVar203 + fVar203;
      auVar309._20_4_ = fVar204 + fVar204;
      auVar309._24_4_ = fVar383 + fVar383;
      auVar309._28_4_ = fVar237 + fVar237;
      auVar253 = vrcpps_avx(auVar309);
      auVar38 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
      fVar205 = auVar253._0_4_;
      fVar230 = auVar253._4_4_;
      auVar77._4_4_ = auVar309._4_4_ * fVar230;
      auVar77._0_4_ = auVar309._0_4_ * fVar205;
      fVar231 = auVar253._8_4_;
      auVar77._8_4_ = auVar309._8_4_ * fVar231;
      fVar232 = auVar253._12_4_;
      auVar77._12_4_ = auVar309._12_4_ * fVar232;
      fVar233 = auVar253._16_4_;
      auVar77._16_4_ = auVar309._16_4_ * fVar233;
      fVar234 = auVar253._20_4_;
      auVar77._20_4_ = auVar309._20_4_ * fVar234;
      fVar235 = auVar253._24_4_;
      auVar77._24_4_ = auVar309._24_4_ * fVar235;
      auVar77._28_4_ = auVar37._28_4_;
      auVar310._8_4_ = 0x3f800000;
      auVar310._0_8_ = &DAT_3f8000003f800000;
      auVar310._12_4_ = 0x3f800000;
      auVar310._16_4_ = 0x3f800000;
      auVar310._20_4_ = 0x3f800000;
      auVar310._24_4_ = 0x3f800000;
      auVar310._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar310,auVar77);
      fVar205 = fVar205 + fVar205 * auVar37._0_4_;
      fVar230 = fVar230 + fVar230 * auVar37._4_4_;
      fVar231 = fVar231 + fVar231 * auVar37._8_4_;
      fVar232 = fVar232 + fVar232 * auVar37._12_4_;
      fVar233 = fVar233 + fVar233 * auVar37._16_4_;
      fVar234 = fVar234 + fVar234 * auVar37._20_4_;
      fVar235 = fVar235 + fVar235 * auVar37._24_4_;
      auVar311._0_8_ = CONCAT44(fVar416,fVar405) ^ 0x8000000080000000;
      auVar311._8_4_ = -fStack_578;
      auVar311._12_4_ = -fStack_574;
      auVar311._16_4_ = -fStack_570;
      auVar311._20_4_ = -fStack_56c;
      auVar311._24_4_ = -fStack_568;
      auVar311._28_4_ = -fStack_564;
      auVar40 = vsubps_avx(auVar311,auVar39);
      fVar405 = auVar40._0_4_ * fVar205;
      fVar416 = auVar40._4_4_ * fVar230;
      auVar78._4_4_ = fVar416;
      auVar78._0_4_ = fVar405;
      fVar313 = auVar40._8_4_ * fVar231;
      auVar78._8_4_ = fVar313;
      fVar314 = auVar40._12_4_ * fVar232;
      auVar78._12_4_ = fVar314;
      fVar315 = auVar40._16_4_ * fVar233;
      auVar78._16_4_ = fVar315;
      fVar316 = auVar40._20_4_ * fVar234;
      auVar78._20_4_ = fVar316;
      fVar317 = auVar40._24_4_ * fVar235;
      auVar78._24_4_ = fVar317;
      auVar78._28_4_ = auVar40._28_4_;
      auVar39 = vsubps_avx(auVar39,_local_580);
      fVar205 = auVar39._0_4_ * fVar205;
      fVar230 = auVar39._4_4_ * fVar230;
      auVar79._4_4_ = fVar230;
      auVar79._0_4_ = fVar205;
      fVar231 = auVar39._8_4_ * fVar231;
      auVar79._8_4_ = fVar231;
      fVar232 = auVar39._12_4_ * fVar232;
      auVar79._12_4_ = fVar232;
      fVar233 = auVar39._16_4_ * fVar233;
      auVar79._16_4_ = fVar233;
      fVar234 = auVar39._20_4_ * fVar234;
      auVar79._20_4_ = fVar234;
      fVar235 = auVar39._24_4_ * fVar235;
      auVar79._24_4_ = fVar235;
      auVar79._28_4_ = auVar39._28_4_;
      fStack_484 = fStack_a04 + auVar253._28_4_ + auVar37._28_4_;
      local_4a0[0] = fVar256 * ((float)local_a20._0_4_ + (float)local_6e0._0_4_ * fVar405);
      local_4a0[1] = fVar278 * ((float)local_a20._4_4_ + (float)local_6e0._4_4_ * fVar416);
      local_4a0[2] = fVar303 * (fStack_a18 + fStack_6d8 * fVar313);
      local_4a0[3] = fVar393 * (fStack_a14 + fStack_6d4 * fVar314);
      fStack_490 = fVar425 * (fStack_a10 + fStack_6d0 * fVar315);
      fStack_48c = fVar427 * (fStack_a0c + fStack_6cc * fVar316);
      fStack_488 = fVar304 * (fStack_a08 + fStack_6c8 * fVar317);
      local_4c0[0] = fVar256 * ((float)local_a20._0_4_ + (float)local_6e0._0_4_ * fVar205);
      local_4c0[1] = fVar278 * ((float)local_a20._4_4_ + (float)local_6e0._4_4_ * fVar230);
      local_4c0[2] = fVar303 * (fStack_a18 + fStack_6d8 * fVar231);
      local_4c0[3] = fVar393 * (fStack_a14 + fStack_6d4 * fVar232);
      fStack_4b0 = fVar425 * (fStack_a10 + fStack_6d0 * fVar233);
      fStack_4ac = fVar427 * (fStack_a0c + fStack_6cc * fVar234);
      fStack_4a8 = fVar304 * (fStack_a08 + fStack_6c8 * fVar235);
      fStack_4a4 = fStack_a04 + fStack_484;
      auVar221._8_4_ = 0x7f800000;
      auVar221._0_8_ = 0x7f8000007f800000;
      auVar221._12_4_ = 0x7f800000;
      auVar221._16_4_ = 0x7f800000;
      auVar221._20_4_ = 0x7f800000;
      auVar221._24_4_ = 0x7f800000;
      auVar221._28_4_ = 0x7f800000;
      auVar220 = vblendvps_avx(auVar221,auVar78,auVar38);
      auVar324._8_4_ = 0x7fffffff;
      auVar324._0_8_ = 0x7fffffff7fffffff;
      auVar324._12_4_ = 0x7fffffff;
      auVar324._16_4_ = 0x7fffffff;
      auVar324._20_4_ = 0x7fffffff;
      auVar324._24_4_ = 0x7fffffff;
      auVar324._28_4_ = 0x7fffffff;
      auVar37 = vandps_avx(local_5c0,auVar324);
      auVar37 = vmaxps_avx(local_400,auVar37);
      auVar348._8_4_ = 0x36000000;
      auVar348._0_8_ = 0x3600000036000000;
      auVar348._12_4_ = 0x36000000;
      auVar348._16_4_ = 0x36000000;
      auVar348._20_4_ = 0x36000000;
      auVar348._24_4_ = 0x36000000;
      auVar348._28_4_ = 0x36000000;
      auVar80._4_4_ = auVar37._4_4_ * 1.9073486e-06;
      auVar80._0_4_ = auVar37._0_4_ * 1.9073486e-06;
      auVar80._8_4_ = auVar37._8_4_ * 1.9073486e-06;
      auVar80._12_4_ = auVar37._12_4_ * 1.9073486e-06;
      auVar80._16_4_ = auVar37._16_4_ * 1.9073486e-06;
      auVar80._20_4_ = auVar37._20_4_ * 1.9073486e-06;
      auVar80._24_4_ = auVar37._24_4_ * 1.9073486e-06;
      auVar80._28_4_ = auVar37._28_4_;
      auVar37 = vandps_avx(local_6c0,auVar324);
      auVar37 = vcmpps_avx(auVar37,auVar80,1);
      auVar392 = ZEXT3264(auVar37);
      auVar312._8_4_ = 0xff800000;
      auVar312._0_8_ = 0xff800000ff800000;
      auVar312._12_4_ = 0xff800000;
      auVar312._16_4_ = 0xff800000;
      auVar312._20_4_ = 0xff800000;
      auVar312._24_4_ = 0xff800000;
      auVar312._28_4_ = 0xff800000;
      auVar412 = vblendvps_avx(auVar312,auVar79,auVar38);
      auVar253 = auVar38 & auVar37;
      if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar253 >> 0x7f,0) != '\0') ||
            (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar253 >> 0xbf,0) != '\0') ||
          (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar253[0x1f] < '\0') {
        auVar150 = vandps_avx(auVar37,auVar38);
        auVar166 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
        auVar253 = ZEXT832(0) << 0x20;
        auVar37 = vcmpps_avx(auVar178,auVar253,2);
        auVar441._8_4_ = 0xff800000;
        auVar441._0_8_ = 0xff800000ff800000;
        auVar441._12_4_ = 0xff800000;
        auVar441._16_4_ = 0xff800000;
        auVar441._20_4_ = 0xff800000;
        auVar441._24_4_ = 0xff800000;
        auVar441._28_4_ = 0xff800000;
        auVar348._8_4_ = 0x7f800000;
        auVar348._0_8_ = 0x7f8000007f800000;
        auVar348._12_4_ = 0x7f800000;
        auVar348._16_4_ = 0x7f800000;
        auVar348._20_4_ = 0x7f800000;
        auVar348._24_4_ = 0x7f800000;
        auVar348._28_4_ = 0x7f800000;
        auVar178 = vblendvps_avx(auVar348,auVar441,auVar37);
        auVar134 = vpmovsxwd_avx(auVar166);
        auVar392 = ZEXT1664(auVar134);
        auVar166 = vpunpckhwd_avx(auVar166,auVar166);
        auVar296._16_16_ = auVar166;
        auVar296._0_16_ = auVar134;
        auVar220 = vblendvps_avx(auVar220,auVar178,auVar296);
        auVar178 = vblendvps_avx(auVar441,auVar348,auVar37);
        auVar412 = vblendvps_avx(auVar412,auVar178,auVar296);
        auVar178 = vcmpps_avx(auVar253,auVar253,0xf);
        auVar190._0_4_ = auVar150._0_4_ ^ auVar178._0_4_;
        auVar190._4_4_ = auVar150._4_4_ ^ auVar178._4_4_;
        auVar190._8_4_ = auVar150._8_4_ ^ auVar178._8_4_;
        auVar190._12_4_ = auVar150._12_4_ ^ auVar178._12_4_;
        auVar190._16_4_ = auVar150._16_4_ ^ auVar178._16_4_;
        auVar190._20_4_ = auVar150._20_4_ ^ auVar178._20_4_;
        auVar190._24_4_ = auVar150._24_4_ ^ auVar178._24_4_;
        auVar190._28_4_ = auVar150._28_4_ ^ auVar178._28_4_;
        auVar150 = vorps_avx(auVar37,auVar190);
        auVar150 = vandps_avx(auVar38,auVar150);
      }
    }
    auVar413 = ZEXT3264(auVar412);
    auVar351 = ZEXT3264(auVar348);
    auVar432 = ZEXT3264(local_260);
    auVar178 = local_260 & auVar150;
    auVar286._8_4_ = 0x3f800000;
    auVar286._0_8_ = &DAT_3f8000003f800000;
    auVar286._12_4_ = 0x3f800000;
    auVar286._16_4_ = 0x3f800000;
    auVar286._20_4_ = 0x3f800000;
    auVar286._24_4_ = 0x3f800000;
    auVar286._28_4_ = 0x3f800000;
    auVar297 = ZEXT3264(auVar286);
    fVar405 = (float)local_740._0_4_;
    fVar416 = (float)local_740._4_4_;
    fVar205 = fStack_738;
    fVar230 = fStack_734;
    fVar231 = fStack_730;
    fVar232 = fStack_72c;
    fVar233 = fStack_728;
    fVar234 = fStack_724;
    if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar178 >> 0x7f,0) == '\0') &&
          (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar178 >> 0xbf,0) == '\0') &&
        (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar178[0x1f])
    {
      auVar328 = ZEXT864(0) << 0x20;
    }
    else {
      fStack_6c4 = fStack_4c4 + fStack_4e4 + fStack_504;
      auVar166 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_760._0_4_));
      auVar166 = vshufps_avx(auVar166,auVar166,0);
      auVar287._16_16_ = auVar166;
      auVar287._0_16_ = auVar166;
      local_6a0 = vmaxps_avx(auVar287,auVar220);
      auVar166 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_760._0_4_));
      auVar166 = vshufps_avx(auVar166,auVar166,0);
      auVar288._16_16_ = auVar166;
      auVar288._0_16_ = auVar166;
      auVar38 = vminps_avx(auVar288,auVar412);
      auVar147._0_4_ = local_4e0 * fVar318 + local_500 * fVar336 + local_520 * fVar404;
      auVar147._4_4_ = fStack_4dc * fVar329 + fStack_4fc * fVar352 + fStack_51c * fVar415;
      auVar147._8_4_ = fStack_4d8 * fVar330 + fStack_4f8 * fVar355 + fStack_518 * fVar418;
      auVar147._12_4_ = fStack_4d4 * fVar331 + fStack_4f4 * fVar358 + fStack_514 * fVar420;
      auVar147._16_4_ = fStack_4d0 * fVar332 + fStack_4f0 * fVar361 + fStack_510 * fVar422;
      auVar147._20_4_ = fStack_4cc * fVar333 + fStack_4ec * fVar364 + fStack_50c * fVar424;
      auVar147._24_4_ = fStack_4c8 * fVar334 + fStack_4e8 * fVar367 + fStack_508 * fVar426;
      auVar147._28_4_ = fVar335 + fVar370 + auVar36._28_4_;
      auVar178 = vrcpps_avx(auVar147);
      fVar335 = auVar178._0_4_;
      fVar235 = auVar178._4_4_;
      auVar81._4_4_ = auVar147._4_4_ * fVar235;
      auVar81._0_4_ = auVar147._0_4_ * fVar335;
      fVar313 = auVar178._8_4_;
      auVar81._8_4_ = auVar147._8_4_ * fVar313;
      fVar314 = auVar178._12_4_;
      auVar81._12_4_ = auVar147._12_4_ * fVar314;
      fVar315 = auVar178._16_4_;
      auVar81._16_4_ = auVar147._16_4_ * fVar315;
      fVar316 = auVar178._20_4_;
      auVar81._20_4_ = auVar147._20_4_ * fVar316;
      fVar317 = auVar178._24_4_;
      auVar81._24_4_ = auVar147._24_4_ * fVar317;
      auVar81._28_4_ = fVar370;
      auVar37 = vsubps_avx(auVar286,auVar81);
      auVar325._8_4_ = 0x7fffffff;
      auVar325._0_8_ = 0x7fffffff7fffffff;
      auVar325._12_4_ = 0x7fffffff;
      auVar325._16_4_ = 0x7fffffff;
      auVar325._20_4_ = 0x7fffffff;
      auVar325._24_4_ = 0x7fffffff;
      auVar325._28_4_ = 0x7fffffff;
      auVar178 = vandps_avx(auVar147,auVar325);
      auVar376._8_4_ = 0x219392ef;
      auVar376._0_8_ = 0x219392ef219392ef;
      auVar376._12_4_ = 0x219392ef;
      auVar376._16_4_ = 0x219392ef;
      auVar376._20_4_ = 0x219392ef;
      auVar376._24_4_ = 0x219392ef;
      auVar376._28_4_ = 0x219392ef;
      auVar178 = vcmpps_avx(auVar178,auVar376,1);
      auVar401 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar82._4_4_ =
           (fVar235 + fVar235 * auVar37._4_4_) *
           -(fVar329 * fVar354 + fVar352 * fVar277 + fVar415 * fVar276);
      auVar82._0_4_ =
           (fVar335 + fVar335 * auVar37._0_4_) *
           -(fVar318 * fVar338 + fVar336 * fVar229 + fVar404 * fVar255);
      auVar82._8_4_ =
           (fVar313 + fVar313 * auVar37._8_4_) *
           -(fVar330 * fVar357 + fVar355 * fVar302 + fVar418 * fVar301);
      auVar82._12_4_ =
           (fVar314 + fVar314 * auVar37._12_4_) *
           -(fVar331 * fVar360 + fVar358 * fVar384 + fVar420 * fVar382);
      auVar82._16_4_ =
           (fVar315 + fVar315 * auVar37._16_4_) *
           -(fVar332 * fVar363 + fVar361 * fVar423 + fVar422 * fVar421);
      auVar82._20_4_ =
           (fVar316 + fVar316 * auVar37._20_4_) *
           -(fVar333 * fVar366 + fVar364 * fVar438 + fVar424 * fVar437);
      auVar82._24_4_ =
           (fVar317 + fVar317 * auVar37._24_4_) *
           -(fVar334 * fVar369 + fVar367 * fVar48 + fVar426 * fVar47);
      auVar82._28_4_ = -(auVar36._28_4_ + local_6a0._28_4_ + 0.0);
      auVar253 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar36 = vcmpps_avx(auVar147,auVar253,1);
      auVar37 = vorps_avx(auVar178,auVar36);
      auVar36 = vcmpps_avx(auVar147,auVar253,6);
      auVar36 = vorps_avx(auVar178,auVar36);
      fStack_478 = -INFINITY;
      local_480 = (undefined1  [8])0xff800000ff800000;
      fStack_474 = -INFINITY;
      fStack_470 = -INFINITY;
      fStack_46c = -INFINITY;
      fStack_468 = -INFINITY;
      fStack_464 = -INFINITY;
      auVar178 = vblendvps_avx(auVar82,_local_480,auVar37);
      auVar440._8_4_ = 0x7f800000;
      auVar440._0_8_ = 0x7f8000007f800000;
      auVar440._12_4_ = 0x7f800000;
      auVar440._16_4_ = 0x7f800000;
      auVar440._20_4_ = 0x7f800000;
      auVar440._24_4_ = 0x7f800000;
      auVar440._28_4_ = 0x7f800000;
      auVar36 = vblendvps_avx(auVar82,auVar440,auVar36);
      auVar37 = vmaxps_avx(local_6a0,auVar178);
      auVar38 = vminps_avx(auVar38,auVar36);
      auVar253 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar178 = vsubps_avx(auVar253,_local_8e0);
      auVar36 = vsubps_avx(auVar253,_local_a00);
      auVar83._4_4_ = auVar36._4_4_ * -fVar353;
      auVar83._0_4_ = auVar36._0_4_ * -fVar337;
      auVar83._8_4_ = auVar36._8_4_ * -fVar356;
      auVar83._12_4_ = auVar36._12_4_ * -fVar359;
      auVar83._16_4_ = auVar36._16_4_ * -fVar362;
      auVar83._20_4_ = auVar36._20_4_ * -fVar365;
      auVar83._24_4_ = auVar36._24_4_ * -fVar368;
      auVar83._28_4_ = auVar36._28_4_;
      auVar84._4_4_ = fVar274 * auVar178._4_4_;
      auVar84._0_4_ = fVar236 * auVar178._0_4_;
      auVar84._8_4_ = fVar299 * auVar178._8_4_;
      auVar84._12_4_ = fVar380 * auVar178._12_4_;
      auVar84._16_4_ = fVar417 * auVar178._16_4_;
      auVar84._20_4_ = fVar435 * auVar178._20_4_;
      auVar84._24_4_ = fVar45 * auVar178._24_4_;
      auVar84._28_4_ = auVar178._28_4_;
      auVar178 = vsubps_avx(auVar83,auVar84);
      auVar36 = vsubps_avx(auVar253,local_9a0);
      auVar85._4_4_ = fVar275 * auVar36._4_4_;
      auVar85._0_4_ = fVar202 * auVar36._0_4_;
      auVar85._8_4_ = fVar300 * auVar36._8_4_;
      auVar85._12_4_ = fVar381 * auVar36._12_4_;
      auVar85._16_4_ = fVar419 * auVar36._16_4_;
      auVar85._20_4_ = fVar436 * auVar36._20_4_;
      uVar8 = auVar36._28_4_;
      auVar85._24_4_ = fVar46 * auVar36._24_4_;
      auVar85._28_4_ = uVar8;
      auVar253 = vsubps_avx(auVar178,auVar85);
      auVar86._4_4_ = fStack_51c * -fVar353;
      auVar86._0_4_ = local_520 * -fVar337;
      auVar86._8_4_ = fStack_518 * -fVar356;
      auVar86._12_4_ = fStack_514 * -fVar359;
      auVar86._16_4_ = fStack_510 * -fVar362;
      auVar86._20_4_ = fStack_50c * -fVar365;
      auVar86._24_4_ = fStack_508 * -fVar368;
      auVar86._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar87._4_4_ = fStack_4fc * fVar274;
      auVar87._0_4_ = local_500 * fVar236;
      auVar87._8_4_ = fStack_4f8 * fVar299;
      auVar87._12_4_ = fStack_4f4 * fVar380;
      auVar87._16_4_ = fStack_4f0 * fVar417;
      auVar87._20_4_ = fStack_4ec * fVar435;
      auVar87._24_4_ = fStack_4e8 * fVar45;
      auVar87._28_4_ = uVar8;
      auVar294._8_4_ = 0x3f800000;
      auVar294._0_8_ = &DAT_3f8000003f800000;
      auVar294._12_4_ = 0x3f800000;
      auVar294._16_4_ = 0x3f800000;
      auVar294._20_4_ = 0x3f800000;
      auVar294._24_4_ = 0x3f800000;
      auVar294._28_4_ = 0x3f800000;
      auVar392 = ZEXT3264(auVar294);
      auVar178 = vsubps_avx(auVar86,auVar87);
      auVar88._4_4_ = fStack_4dc * fVar275;
      auVar88._0_4_ = local_4e0 * fVar202;
      auVar88._8_4_ = fStack_4d8 * fVar300;
      auVar88._12_4_ = fStack_4d4 * fVar381;
      auVar88._16_4_ = fStack_4d0 * fVar419;
      auVar88._20_4_ = fStack_4cc * fVar436;
      auVar88._24_4_ = fStack_4c8 * fVar46;
      auVar88._28_4_ = uVar8;
      auVar39 = vsubps_avx(auVar178,auVar88);
      auVar178 = vrcpps_avx(auVar39);
      fVar236 = auVar178._0_4_;
      fVar202 = auVar178._4_4_;
      auVar89._4_4_ = auVar39._4_4_ * fVar202;
      auVar89._0_4_ = auVar39._0_4_ * fVar236;
      fVar255 = auVar178._8_4_;
      auVar89._8_4_ = auVar39._8_4_ * fVar255;
      fVar229 = auVar178._12_4_;
      auVar89._12_4_ = auVar39._12_4_ * fVar229;
      fVar274 = auVar178._16_4_;
      auVar89._16_4_ = auVar39._16_4_ * fVar274;
      fVar275 = auVar178._20_4_;
      auVar89._20_4_ = auVar39._20_4_ * fVar275;
      fVar276 = auVar178._24_4_;
      auVar89._24_4_ = auVar39._24_4_ * fVar276;
      auVar89._28_4_ = local_9c0._28_4_;
      auVar40 = vsubps_avx(auVar294,auVar89);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar222._16_4_ = 0x7fffffff;
      auVar222._20_4_ = 0x7fffffff;
      auVar222._24_4_ = 0x7fffffff;
      auVar222._28_4_ = 0x7fffffff;
      auVar178 = vandps_avx(auVar39,auVar222);
      auVar36 = vcmpps_avx(auVar178,auVar376,1);
      auVar351 = ZEXT864(0) << 0x20;
      auVar90._4_4_ = (fVar202 + fVar202 * auVar40._4_4_) * -auVar253._4_4_;
      auVar90._0_4_ = (fVar236 + fVar236 * auVar40._0_4_) * -auVar253._0_4_;
      auVar90._8_4_ = (fVar255 + fVar255 * auVar40._8_4_) * -auVar253._8_4_;
      auVar90._12_4_ = (fVar229 + fVar229 * auVar40._12_4_) * -auVar253._12_4_;
      auVar90._16_4_ = (fVar274 + fVar274 * auVar40._16_4_) * -auVar253._16_4_;
      auVar90._20_4_ = (fVar275 + fVar275 * auVar40._20_4_) * -auVar253._20_4_;
      auVar90._24_4_ = (fVar276 + fVar276 * auVar40._24_4_) * -auVar253._24_4_;
      auVar90._28_4_ = auVar253._28_4_ ^ 0x80000000;
      auVar178 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,1);
      auVar178 = vorps_avx(auVar36,auVar178);
      auVar178 = vblendvps_avx(auVar90,_local_480,auVar178);
      local_6a0 = vmaxps_avx(auVar37,auVar178);
      auVar178 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,6);
      auVar178 = vorps_avx(auVar36,auVar178);
      auVar178 = vblendvps_avx(auVar90,auVar440,auVar178);
      auVar150 = vandps_avx(local_260,auVar150);
      local_460 = vminps_avx(auVar38,auVar178);
      auVar178 = vcmpps_avx(local_6a0,local_460,2);
      auVar36 = auVar150 & auVar178;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      {
        auVar328 = ZEXT864(0) << 0x20;
      }
      else {
        auVar36 = vminps_avx(local_7c0,local_700);
        auVar37 = vminps_avx(local_7e0,_local_800);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar36 = vsubps_avx(auVar36,_local_660);
        auVar150 = vandps_avx(auVar178,auVar150);
        auVar121._4_4_ = local_4a0[1];
        auVar121._0_4_ = local_4a0[0];
        auVar121._8_4_ = local_4a0[2];
        auVar121._12_4_ = local_4a0[3];
        auVar121._16_4_ = fStack_490;
        auVar121._20_4_ = fStack_48c;
        auVar121._24_4_ = fStack_488;
        auVar121._28_4_ = fStack_484;
        auVar178 = vminps_avx(auVar121,auVar294);
        auVar178 = vmaxps_avx(auVar178,ZEXT832(0) << 0x20);
        local_4a0[0] = fVar130 + fVar159 * (auVar178._0_4_ + 0.0) * 0.125;
        local_4a0[1] = fVar155 + fVar192 * (auVar178._4_4_ + 1.0) * 0.125;
        local_4a0[2] = fVar156 + fVar195 * (auVar178._8_4_ + 2.0) * 0.125;
        local_4a0[3] = fVar157 + fVar198 * (auVar178._12_4_ + 3.0) * 0.125;
        fStack_490 = fVar130 + fVar159 * (auVar178._16_4_ + 4.0) * 0.125;
        fStack_48c = fVar155 + fVar192 * (auVar178._20_4_ + 5.0) * 0.125;
        fStack_488 = fVar156 + fVar195 * (auVar178._24_4_ + 6.0) * 0.125;
        fStack_484 = fVar157 + auVar178._28_4_ + 7.0;
        auVar120._4_4_ = local_4c0[1];
        auVar120._0_4_ = local_4c0[0];
        auVar120._8_4_ = local_4c0[2];
        auVar120._12_4_ = local_4c0[3];
        auVar120._16_4_ = fStack_4b0;
        auVar120._20_4_ = fStack_4ac;
        auVar120._24_4_ = fStack_4a8;
        auVar120._28_4_ = fStack_4a4;
        auVar178 = vminps_avx(auVar120,auVar294);
        auVar178 = vmaxps_avx(auVar178,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar130 + fVar159 * (auVar178._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar155 + fVar192 * (auVar178._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar156 + fVar195 * (auVar178._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fVar157 + fVar198 * (auVar178._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar130 + fVar159 * (auVar178._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar155 + fVar192 * (auVar178._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar156 + fVar195 * (auVar178._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fVar157 + auVar178._28_4_ + 7.0;
        auVar91._4_4_ = auVar36._4_4_ * 0.99999976;
        auVar91._0_4_ = auVar36._0_4_ * 0.99999976;
        auVar91._8_4_ = auVar36._8_4_ * 0.99999976;
        auVar91._12_4_ = auVar36._12_4_ * 0.99999976;
        auVar91._16_4_ = auVar36._16_4_ * 0.99999976;
        auVar91._20_4_ = auVar36._20_4_ * 0.99999976;
        auVar91._24_4_ = auVar36._24_4_ * 0.99999976;
        auVar91._28_4_ = 0x3f7ffffc;
        auVar178 = vmaxps_avx(ZEXT832(0) << 0x20,auVar91);
        auVar92._4_4_ = auVar178._4_4_ * auVar178._4_4_;
        auVar92._0_4_ = auVar178._0_4_ * auVar178._0_4_;
        auVar92._8_4_ = auVar178._8_4_ * auVar178._8_4_;
        auVar92._12_4_ = auVar178._12_4_ * auVar178._12_4_;
        auVar92._16_4_ = auVar178._16_4_ * auVar178._16_4_;
        auVar92._20_4_ = auVar178._20_4_ * auVar178._20_4_;
        auVar92._24_4_ = auVar178._24_4_ * auVar178._24_4_;
        auVar92._28_4_ = auVar178._28_4_;
        auVar36 = vsubps_avx(local_620,auVar92);
        auVar93._4_4_ = auVar36._4_4_ * (float)local_640._4_4_;
        auVar93._0_4_ = auVar36._0_4_ * (float)local_640._0_4_;
        auVar93._8_4_ = auVar36._8_4_ * fStack_638;
        auVar93._12_4_ = auVar36._12_4_ * fStack_634;
        auVar93._16_4_ = auVar36._16_4_ * fStack_630;
        auVar93._20_4_ = auVar36._20_4_ * fStack_62c;
        auVar93._24_4_ = auVar36._24_4_ * fStack_628;
        auVar93._28_4_ = auVar178._28_4_;
        auVar37 = vsubps_avx(_local_720,auVar93);
        auVar178 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
        if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar178 >> 0x7f,0) == '\0') &&
              (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar178 >> 0xbf,0) == '\0') &&
            (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar178[0x1f]) {
          _local_640 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar245 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar269 = ZEXT828(0) << 0x20;
          auVar371 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar223._8_4_ = 0x7f800000;
          auVar223._0_8_ = 0x7f8000007f800000;
          auVar223._12_4_ = 0x7f800000;
          auVar223._16_4_ = 0x7f800000;
          auVar223._20_4_ = 0x7f800000;
          auVar223._24_4_ = 0x7f800000;
          auVar223._28_4_ = 0x7f800000;
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
        }
        else {
          local_9a0 = auVar36;
          local_7a0 = auVar178;
          _local_8e0 = auVar150;
          auVar253 = vsqrtps_avx(auVar37);
          auVar270._0_4_ = fVar194 + fVar194;
          auVar270._4_4_ = fVar196 + fVar196;
          auVar270._8_4_ = fVar200 + fVar200;
          auVar270._12_4_ = fVar201 + fVar201;
          auVar270._16_4_ = fVar203 + fVar203;
          auVar270._20_4_ = fVar204 + fVar204;
          auVar270._24_4_ = fVar383 + fVar383;
          auVar270._28_4_ = fVar237 + fVar237;
          auVar38 = vrcpps_avx(auVar270);
          fVar237 = auVar38._0_4_;
          fVar236 = auVar38._4_4_;
          auVar94._4_4_ = auVar270._4_4_ * fVar236;
          auVar94._0_4_ = auVar270._0_4_ * fVar237;
          fVar202 = auVar38._8_4_;
          auVar94._8_4_ = auVar270._8_4_ * fVar202;
          fVar255 = auVar38._12_4_;
          auVar94._12_4_ = auVar270._12_4_ * fVar255;
          fVar229 = auVar38._16_4_;
          auVar94._16_4_ = auVar270._16_4_ * fVar229;
          fVar274 = auVar38._20_4_;
          auVar94._20_4_ = auVar270._20_4_ * fVar274;
          fVar275 = auVar38._24_4_;
          auVar94._24_4_ = auVar270._24_4_ * fVar275;
          auVar94._28_4_ = auVar270._28_4_;
          auVar39 = vsubps_avx(auVar294,auVar94);
          fVar237 = fVar237 + fVar237 * auVar39._0_4_;
          fVar236 = fVar236 + fVar236 * auVar39._4_4_;
          fVar202 = fVar202 + fVar202 * auVar39._8_4_;
          fVar255 = fVar255 + fVar255 * auVar39._12_4_;
          fVar229 = fVar229 + fVar229 * auVar39._16_4_;
          fVar274 = fVar274 + fVar274 * auVar39._20_4_;
          fVar275 = fVar275 + fVar275 * auVar39._24_4_;
          fVar276 = auVar38._28_4_ + auVar39._28_4_;
          auVar290._0_8_ = local_580 ^ 0x8000000080000000;
          auVar290._8_4_ = -fStack_578;
          auVar290._12_4_ = -fStack_574;
          auVar290._16_4_ = -fStack_570;
          auVar290._20_4_ = -fStack_56c;
          auVar290._24_4_ = -fStack_568;
          auVar290._28_4_ = -fStack_564;
          auVar38 = vsubps_avx(auVar290,auVar253);
          fVar382 = auVar38._0_4_ * fVar237;
          fVar384 = auVar38._4_4_ * fVar236;
          auVar95._4_4_ = fVar384;
          auVar95._0_4_ = fVar382;
          fVar417 = auVar38._8_4_ * fVar202;
          auVar95._8_4_ = fVar417;
          fVar419 = auVar38._12_4_ * fVar255;
          auVar95._12_4_ = fVar419;
          fVar421 = auVar38._16_4_ * fVar229;
          auVar95._16_4_ = fVar421;
          fVar423 = auVar38._20_4_ * fVar274;
          auVar95._20_4_ = fVar423;
          fVar435 = auVar38._24_4_ * fVar275;
          auVar95._24_4_ = fVar435;
          auVar95._28_4_ = local_260._28_4_;
          auVar432 = ZEXT3264(auVar95);
          auVar253 = vsubps_avx(auVar253,_local_580);
          fVar237 = auVar253._0_4_ * fVar237;
          fVar236 = auVar253._4_4_ * fVar236;
          auVar96._4_4_ = fVar236;
          auVar96._0_4_ = fVar237;
          fVar202 = auVar253._8_4_ * fVar202;
          auVar96._8_4_ = fVar202;
          fVar255 = auVar253._12_4_ * fVar255;
          auVar96._12_4_ = fVar255;
          fVar229 = auVar253._16_4_ * fVar229;
          auVar96._16_4_ = fVar229;
          fVar274 = auVar253._20_4_ * fVar274;
          auVar96._20_4_ = fVar274;
          fVar275 = auVar253._24_4_ * fVar275;
          auVar96._24_4_ = fVar275;
          auVar96._28_4_ = 0xff800000;
          fVar277 = fVar256 * (fVar382 * (float)local_6e0._0_4_ + (float)local_a20._0_4_);
          fVar299 = fVar278 * (fVar384 * (float)local_6e0._4_4_ + (float)local_a20._4_4_);
          fVar300 = fVar303 * (fVar417 * fStack_6d8 + fStack_a18);
          fVar301 = fVar393 * (fVar419 * fStack_6d4 + fStack_a14);
          fVar302 = fVar425 * (fVar421 * fStack_6d0 + fStack_a10);
          fVar380 = fVar427 * (fVar423 * fStack_6cc + fStack_a0c);
          fVar381 = fVar304 * (fVar435 * fStack_6c8 + fStack_a08);
          auVar251._0_4_ = local_a80 + fVar199 * fVar277;
          auVar251._4_4_ = fStack_a7c + fVar259 * fVar299;
          auVar251._8_4_ = fStack_a78 + fVar298 * fVar300;
          auVar251._12_4_ = fStack_a74 + fVar379 * fVar301;
          auVar251._16_4_ = fStack_a70 + fVar414 * fVar302;
          auVar251._20_4_ = fStack_a6c + fVar434 * fVar380;
          auVar251._24_4_ = fStack_a68 + fVar44 * fVar381;
          auVar251._28_4_ = fStack_a64 + auVar253._28_4_ + fStack_a04;
          auVar97._4_4_ = fStack_4dc * fVar384;
          auVar97._0_4_ = local_4e0 * fVar382;
          auVar97._8_4_ = fStack_4d8 * fVar417;
          auVar97._12_4_ = fStack_4d4 * fVar419;
          auVar97._16_4_ = fStack_4d0 * fVar421;
          auVar97._20_4_ = fStack_4cc * fVar423;
          auVar97._24_4_ = fStack_4c8 * fVar435;
          auVar97._28_4_ = fVar276;
          _local_a00 = vsubps_avx(auVar97,auVar251);
          auVar271._0_4_ = local_ae0 + fVar193 * fVar277;
          auVar271._4_4_ = fStack_adc + fVar257 * fVar299;
          auVar271._8_4_ = fStack_ad8 + fVar279 * fVar300;
          auVar271._12_4_ = fStack_ad4 + fVar377 * fVar301;
          auVar271._16_4_ = fStack_ad0 + fVar402 * fVar302;
          auVar271._20_4_ = fStack_acc + fVar428 * fVar380;
          auVar271._24_4_ = fStack_ac8 + fVar42 * fVar381;
          auVar271._28_4_ = fStack_ac4 + fVar276;
          auVar98._4_4_ = fStack_4fc * fVar384;
          auVar98._0_4_ = local_500 * fVar382;
          auVar98._8_4_ = fStack_4f8 * fVar417;
          auVar98._12_4_ = fStack_4f4 * fVar419;
          auVar98._16_4_ = fStack_4f0 * fVar421;
          auVar98._20_4_ = fStack_4ec * fVar423;
          auVar98._24_4_ = fStack_4e8 * fVar435;
          auVar98._28_4_ = fVar157;
          _local_900 = vsubps_avx(auVar98,auVar271);
          auVar291._0_4_ = local_ac0 + fVar254 * fVar277;
          auVar291._4_4_ = fStack_abc + fVar258 * fVar299;
          auVar291._8_4_ = fStack_ab8 + fVar280 * fVar300;
          auVar291._12_4_ = fStack_ab4 + fVar378 * fVar301;
          auVar291._16_4_ = fStack_ab0 + fVar403 * fVar302;
          auVar291._20_4_ = fStack_aac + fVar433 * fVar380;
          auVar291._24_4_ = fStack_aa8 + fVar43 * fVar381;
          auVar291._28_4_ = fStack_aa4 + auVar38._28_4_;
          auVar99._4_4_ = fStack_51c * fVar384;
          auVar99._0_4_ = local_520 * fVar382;
          auVar99._8_4_ = fStack_518 * fVar417;
          auVar99._12_4_ = fStack_514 * fVar419;
          auVar99._16_4_ = fStack_510 * fVar421;
          auVar99._20_4_ = fStack_50c * fVar423;
          auVar99._24_4_ = fStack_508 * fVar435;
          auVar99._28_4_ = fVar157;
          local_920 = vsubps_avx(auVar99,auVar291);
          fVar256 = fVar256 * (fVar237 * (float)local_6e0._0_4_ + (float)local_a20._0_4_);
          fVar278 = fVar278 * (fVar236 * (float)local_6e0._4_4_ + (float)local_a20._4_4_);
          fVar303 = fVar303 * (fVar202 * fStack_6d8 + fStack_a18);
          fVar393 = fVar393 * (fVar255 * fStack_6d4 + fStack_a14);
          fVar425 = fVar425 * (fVar229 * fStack_6d0 + fStack_a10);
          fVar427 = fVar427 * (fVar274 * fStack_6cc + fStack_a0c);
          fVar304 = fVar304 * (fVar275 * fStack_6c8 + fStack_a08);
          auVar326._0_4_ = local_a80 + fVar199 * fVar256;
          auVar326._4_4_ = fStack_a7c + fVar259 * fVar278;
          auVar326._8_4_ = fStack_a78 + fVar298 * fVar303;
          auVar326._12_4_ = fStack_a74 + fVar379 * fVar393;
          auVar326._16_4_ = fStack_a70 + fVar414 * fVar425;
          auVar326._20_4_ = fStack_a6c + fVar434 * fVar427;
          auVar326._24_4_ = fStack_a68 + fVar44 * fVar304;
          auVar326._28_4_ = fStack_a64 + fVar157;
          auVar100._4_4_ = fStack_4dc * fVar236;
          auVar100._0_4_ = local_4e0 * fVar237;
          auVar100._8_4_ = fStack_4d8 * fVar202;
          auVar100._12_4_ = fStack_4d4 * fVar255;
          auVar100._16_4_ = fStack_4d0 * fVar229;
          auVar100._20_4_ = fStack_4cc * fVar274;
          auVar100._24_4_ = fStack_4c8 * fVar275;
          auVar100._28_4_ = fStack_4c4;
          _local_640 = vsubps_avx(auVar100,auVar326);
          auVar327._0_4_ = local_ae0 + fVar193 * fVar256;
          auVar327._4_4_ = fStack_adc + fVar257 * fVar278;
          auVar327._8_4_ = fStack_ad8 + fVar279 * fVar303;
          auVar327._12_4_ = fStack_ad4 + fVar377 * fVar393;
          auVar327._16_4_ = fStack_ad0 + fVar402 * fVar425;
          auVar327._20_4_ = fStack_acc + fVar428 * fVar427;
          auVar327._24_4_ = fStack_ac8 + fVar42 * fVar304;
          auVar327._28_4_ = fStack_ac4 + local_640._28_4_;
          auVar101._4_4_ = fStack_4fc * fVar236;
          auVar101._0_4_ = local_500 * fVar237;
          auVar101._8_4_ = fStack_4f8 * fVar202;
          auVar101._12_4_ = fStack_4f4 * fVar255;
          auVar101._16_4_ = fStack_4f0 * fVar229;
          auVar101._20_4_ = fStack_4ec * fVar274;
          auVar101._24_4_ = fStack_4e8 * fVar275;
          auVar101._28_4_ = fStack_4c4;
          _local_660 = vsubps_avx(auVar101,auVar327);
          auVar292._0_4_ = local_ac0 + fVar254 * fVar256;
          auVar292._4_4_ = fStack_abc + fVar258 * fVar278;
          auVar292._8_4_ = fStack_ab8 + fVar280 * fVar303;
          auVar292._12_4_ = fStack_ab4 + fVar378 * fVar393;
          auVar292._16_4_ = fStack_ab0 + fVar403 * fVar425;
          auVar292._20_4_ = fStack_aac + fVar433 * fVar427;
          auVar292._24_4_ = fStack_aa8 + fVar43 * fVar304;
          auVar292._28_4_ = fStack_aa4 + local_920._28_4_ + fStack_a04;
          auVar102._4_4_ = fStack_51c * fVar236;
          auVar102._0_4_ = local_520 * fVar237;
          auVar102._8_4_ = fStack_518 * fVar202;
          auVar102._12_4_ = fStack_514 * fVar255;
          auVar102._16_4_ = fStack_510 * fVar229;
          auVar102._20_4_ = fStack_50c * fVar274;
          auVar102._24_4_ = fStack_508 * fVar275;
          auVar102._28_4_ = local_660._28_4_;
          _local_680 = vsubps_avx(auVar102,auVar292);
          auVar38 = vcmpps_avx(auVar37,_DAT_02020f00,5);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar223 = vblendvps_avx(auVar224,auVar95,auVar38);
          auVar349._8_4_ = 0x7fffffff;
          auVar349._0_8_ = 0x7fffffff7fffffff;
          auVar349._12_4_ = 0x7fffffff;
          auVar349._16_4_ = 0x7fffffff;
          auVar349._20_4_ = 0x7fffffff;
          auVar349._24_4_ = 0x7fffffff;
          auVar349._28_4_ = 0x7fffffff;
          auVar37 = vandps_avx(auVar349,local_5c0);
          auVar37 = vmaxps_avx(local_400,auVar37);
          auVar103._4_4_ = auVar37._4_4_ * 1.9073486e-06;
          auVar103._0_4_ = auVar37._0_4_ * 1.9073486e-06;
          auVar103._8_4_ = auVar37._8_4_ * 1.9073486e-06;
          auVar103._12_4_ = auVar37._12_4_ * 1.9073486e-06;
          auVar103._16_4_ = auVar37._16_4_ * 1.9073486e-06;
          auVar103._20_4_ = auVar37._20_4_ * 1.9073486e-06;
          auVar103._24_4_ = auVar37._24_4_ * 1.9073486e-06;
          auVar103._28_4_ = auVar37._28_4_;
          auVar37 = vandps_avx(auVar349,local_6c0);
          auVar37 = vcmpps_avx(auVar37,auVar103,1);
          auVar293._8_4_ = 0xff800000;
          auVar293._0_8_ = 0xff800000ff800000;
          auVar293._12_4_ = 0xff800000;
          auVar293._16_4_ = 0xff800000;
          auVar293._20_4_ = 0xff800000;
          auVar293._24_4_ = 0xff800000;
          auVar293._28_4_ = 0xff800000;
          auVar289 = vblendvps_avx(auVar293,auVar96,auVar38);
          auVar253 = auVar38 & auVar37;
          if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar253 >> 0x7f,0) != '\0') ||
                (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar253 >> 0xbf,0) != '\0') ||
              (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar253[0x1f] < '\0') {
            auVar178 = vandps_avx(auVar37,auVar38);
            auVar166 = vpackssdw_avx(auVar178._0_16_,auVar178._16_16_);
            auVar105 = ZEXT412(0);
            auVar432 = ZEXT1264(auVar105) << 0x20;
            auVar37 = vcmpps_avx(auVar36,ZEXT1232(auVar105) << 0x20,2);
            auVar442._8_4_ = 0xff800000;
            auVar442._0_8_ = 0xff800000ff800000;
            auVar442._12_4_ = 0xff800000;
            auVar442._16_4_ = 0xff800000;
            auVar442._20_4_ = 0xff800000;
            auVar442._24_4_ = 0xff800000;
            auVar442._28_4_ = 0xff800000;
            auVar445._8_4_ = 0x7f800000;
            auVar445._0_8_ = 0x7f8000007f800000;
            auVar445._12_4_ = 0x7f800000;
            auVar445._16_4_ = 0x7f800000;
            auVar445._20_4_ = 0x7f800000;
            auVar445._24_4_ = 0x7f800000;
            auVar445._28_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar445,auVar442,auVar37);
            auVar134 = vpmovsxwd_avx(auVar166);
            auVar166 = vpunpckhwd_avx(auVar166,auVar166);
            auVar350._16_16_ = auVar166;
            auVar350._0_16_ = auVar134;
            auVar223 = vblendvps_avx(auVar223,auVar36,auVar350);
            auVar36 = vblendvps_avx(auVar442,auVar445,auVar37);
            auVar289 = vblendvps_avx(auVar289,auVar36,auVar350);
            auVar36 = vcmpps_avx(ZEXT1232(auVar105) << 0x20,ZEXT1232(auVar105) << 0x20,0xf);
            auVar191._0_4_ = auVar36._0_4_ ^ auVar178._0_4_;
            auVar191._4_4_ = auVar36._4_4_ ^ auVar178._4_4_;
            auVar191._8_4_ = auVar36._8_4_ ^ auVar178._8_4_;
            auVar191._12_4_ = auVar36._12_4_ ^ auVar178._12_4_;
            auVar191._16_4_ = auVar36._16_4_ ^ auVar178._16_4_;
            auVar191._20_4_ = auVar36._20_4_ ^ auVar178._20_4_;
            auVar191._24_4_ = auVar36._24_4_ ^ auVar178._24_4_;
            auVar191._28_4_ = auVar36._28_4_ ^ auVar178._28_4_;
            auVar178 = vorps_avx(auVar37,auVar191);
            auVar178 = vandps_avx(auVar38,auVar178);
          }
          auVar245 = local_a00._0_28_;
          auVar269 = local_900._0_28_;
          auVar371 = local_920._0_28_;
        }
        auVar328 = ZEXT1664(ZEXT816(0) << 0x20);
        fVar237 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar391._4_4_ = fVar237;
        auVar391._0_4_ = fVar237;
        auVar391._8_4_ = fVar237;
        auVar391._12_4_ = fVar237;
        auVar391._16_4_ = fVar237;
        auVar391._20_4_ = fVar237;
        auVar391._24_4_ = fVar237;
        auVar391._28_4_ = fVar237;
        auVar392 = ZEXT3264(auVar391);
        fVar193 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar444._4_4_ = fVar193;
        auVar444._0_4_ = fVar193;
        auVar444._8_4_ = fVar193;
        auVar444._12_4_ = fVar193;
        auVar444._16_4_ = fVar193;
        auVar444._20_4_ = fVar193;
        auVar444._24_4_ = fVar193;
        auVar444._28_4_ = fVar193;
        fVar254 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar400._4_4_ = fVar254;
        auVar400._0_4_ = fVar254;
        auVar400._8_4_ = fVar254;
        auVar400._12_4_ = fVar254;
        auVar400._16_4_ = fVar254;
        auVar400._20_4_ = fVar254;
        auVar400._24_4_ = fVar254;
        auVar400._28_4_ = fVar254;
        auVar401 = ZEXT3264(auVar400);
        auVar351 = ZEXT3264(local_6a0);
        local_440 = local_6a0;
        local_420 = vminps_avx(local_460,auVar223);
        _local_480 = vmaxps_avx(local_6a0,auVar289);
        auVar36 = vcmpps_avx(local_6a0,local_420,2);
        local_540 = vandps_avx(auVar36,auVar150);
        local_5e0 = local_540;
        auVar36 = vcmpps_avx(_local_480,local_460,2);
        local_600 = vandps_avx(auVar36,auVar150);
        auVar150 = vorps_avx(local_600,local_540);
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0x7f,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar150 >> 0xbf,0) != '\0') ||
            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar150[0x1f] < '\0') {
          _local_580 = _local_480;
          local_6c0 = local_600;
          auVar150 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5a0._0_4_ = auVar178._0_4_ ^ auVar150._0_4_;
          local_5a0._4_4_ = auVar178._4_4_ ^ auVar150._4_4_;
          local_5a0._8_4_ = auVar178._8_4_ ^ auVar150._8_4_;
          local_5a0._12_4_ = auVar178._12_4_ ^ auVar150._12_4_;
          local_5a0._16_4_ = auVar178._16_4_ ^ auVar150._16_4_;
          local_5a0._20_4_ = auVar178._20_4_ ^ auVar150._20_4_;
          local_5a0._24_4_ = auVar178._24_4_ ^ auVar150._24_4_;
          local_5a0._28_4_ = (uint)auVar178._28_4_ ^ (uint)auVar150._28_4_;
          auVar413 = ZEXT3264(auVar391);
          auVar432 = ZEXT3264(auVar444);
          auVar149._0_4_ =
               fVar237 * auVar245._0_4_ + fVar193 * auVar269._0_4_ + auVar371._0_4_ * fVar254;
          auVar149._4_4_ =
               fVar237 * auVar245._4_4_ + fVar193 * auVar269._4_4_ + auVar371._4_4_ * fVar254;
          auVar149._8_4_ =
               fVar237 * auVar245._8_4_ + fVar193 * auVar269._8_4_ + auVar371._8_4_ * fVar254;
          auVar149._12_4_ =
               fVar237 * auVar245._12_4_ + fVar193 * auVar269._12_4_ + auVar371._12_4_ * fVar254;
          auVar149._16_4_ =
               fVar237 * auVar245._16_4_ + fVar193 * auVar269._16_4_ + auVar371._16_4_ * fVar254;
          auVar149._20_4_ =
               fVar237 * auVar245._20_4_ + fVar193 * auVar269._20_4_ + auVar371._20_4_ * fVar254;
          auVar149._24_4_ =
               fVar237 * auVar245._24_4_ + fVar193 * auVar269._24_4_ + auVar371._24_4_ * fVar254;
          auVar149._28_4_ = auVar150._28_4_ + auVar178._28_4_ + local_540._28_4_;
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar179._16_4_ = 0x7fffffff;
          auVar179._20_4_ = 0x7fffffff;
          auVar179._24_4_ = 0x7fffffff;
          auVar179._28_4_ = 0x7fffffff;
          auVar150 = vandps_avx(auVar149,auVar179);
          auVar180._8_4_ = 0x3e99999a;
          auVar180._0_8_ = 0x3e99999a3e99999a;
          auVar180._12_4_ = 0x3e99999a;
          auVar180._16_4_ = 0x3e99999a;
          auVar180._20_4_ = 0x3e99999a;
          auVar180._24_4_ = 0x3e99999a;
          auVar180._28_4_ = 0x3e99999a;
          auVar150 = vcmpps_avx(auVar150,auVar180,1);
          auVar150 = vorps_avx(auVar150,local_5a0);
          auVar181._8_4_ = 3;
          auVar181._0_8_ = 0x300000003;
          auVar181._12_4_ = 3;
          auVar181._16_4_ = 3;
          auVar181._20_4_ = 3;
          auVar181._24_4_ = 3;
          auVar181._28_4_ = 3;
          auVar225._8_4_ = 2;
          auVar225._0_8_ = 0x200000002;
          auVar225._12_4_ = 2;
          auVar225._16_4_ = 2;
          auVar225._20_4_ = 2;
          auVar225._24_4_ = 2;
          auVar225._28_4_ = 2;
          auVar150 = vblendvps_avx(auVar225,auVar181,auVar150);
          _local_6e0 = ZEXT432((uint)uVar128);
          auVar134 = vpshufd_avx(ZEXT416((uint)uVar128),0);
          auVar166 = vpcmpgtd_avx(auVar150._16_16_,auVar134);
          local_5c0._0_16_ = auVar134;
          auVar134 = vpcmpgtd_avx(auVar150._0_16_,auVar134);
          auVar182._16_16_ = auVar166;
          auVar182._0_16_ = auVar134;
          auVar150 = vblendps_avx(ZEXT1632(auVar134),auVar182,0xf0);
          local_5e0 = vandnps_avx(auVar150,local_540);
          auVar297 = ZEXT3264(local_5e0);
          local_560 = auVar150;
          auVar178 = local_540 & ~auVar150;
          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar128;
          local_9c0 = auVar41;
          local_820 = auVar50;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            local_720._4_4_ = local_6a0._4_4_ + (float)local_740._4_4_;
            local_720._0_4_ = local_6a0._0_4_ + (float)local_740._0_4_;
            fStack_718 = local_6a0._8_4_ + fStack_738;
            fStack_714 = local_6a0._12_4_ + fStack_734;
            fStack_710 = local_6a0._16_4_ + fStack_730;
            fStack_70c = local_6a0._20_4_ + fStack_72c;
            fStack_708 = local_6a0._24_4_ + fStack_728;
            fStack_704 = local_6a0._28_4_ + fStack_724;
            local_940 = auVar391;
            _local_a20 = auVar444;
            local_860 = auVar400;
            do {
              auVar261 = auVar273._0_16_;
              auVar183._8_4_ = 0x7f800000;
              auVar183._0_8_ = 0x7f8000007f800000;
              auVar183._12_4_ = 0x7f800000;
              auVar183._16_4_ = 0x7f800000;
              auVar183._20_4_ = 0x7f800000;
              auVar183._24_4_ = 0x7f800000;
              auVar183._28_4_ = 0x7f800000;
              auVar150 = auVar297._0_32_;
              auVar178 = vblendvps_avx(auVar183,local_6a0,auVar150);
              auVar36 = vshufps_avx(auVar178,auVar178,0xb1);
              auVar36 = vminps_avx(auVar178,auVar36);
              auVar37 = vshufpd_avx(auVar36,auVar36,5);
              auVar36 = vminps_avx(auVar36,auVar37);
              auVar37 = vperm2f128_avx(auVar36,auVar36,1);
              auVar36 = vminps_avx(auVar36,auVar37);
              auVar178 = vcmpps_avx(auVar178,auVar36,0);
              auVar36 = auVar150 & auVar178;
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') ||
                    (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0xbf,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar36[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar178,auVar150);
              }
              uVar127 = vmovmskps_avx(auVar150);
              uVar122 = 0;
              if (uVar127 != 0) {
                for (; (uVar127 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                }
              }
              uVar128 = (ulong)uVar122;
              *(undefined4 *)(local_5e0 + uVar128 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_900 = (undefined1  [16])aVar12;
              auVar166 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_ac0 = local_4a0[uVar128];
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              local_ae0 = *(float *)(local_440 + uVar128 * 4);
              auVar297 = ZEXT464((uint)local_ae0);
              if (auVar166._0_4_ < 0.0) {
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fStack_adc = 0.0;
                fStack_ad8 = 0.0;
                fStack_ad4 = 0.0;
                fVar237 = sqrtf(auVar166._0_4_);
                auVar297 = ZEXT1664(CONCAT412(fStack_ad4,
                                              CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
                auVar261._8_4_ = 0x7fffffff;
                auVar261._0_8_ = 0x7fffffff7fffffff;
                auVar261._12_4_ = 0x7fffffff;
                auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar166 = vsqrtss_avx(auVar166,auVar166);
                fVar237 = auVar166._0_4_;
              }
              auVar134 = vminps_avx(_local_950,_local_970);
              auVar166 = vmaxps_avx(_local_950,_local_970);
              auVar158 = vminps_avx(_local_960,_local_980);
              auVar163 = vminps_avx(auVar134,auVar158);
              auVar134 = vmaxps_avx(_local_960,_local_980);
              auVar158 = vmaxps_avx(auVar166,auVar134);
              auVar166 = vandps_avx(auVar163,auVar261);
              auVar134 = vandps_avx(auVar158,auVar261);
              auVar166 = vmaxps_avx(auVar166,auVar134);
              auVar134 = vmovshdup_avx(auVar166);
              auVar134 = vmaxss_avx(auVar134,auVar166);
              auVar166 = vshufpd_avx(auVar166,auVar166,1);
              auVar166 = vmaxss_avx(auVar166,auVar134);
              local_920._0_4_ = auVar166._0_4_ * 1.9073486e-06;
              local_840._0_4_ = fVar237 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar158,auVar158,0xff);
              lVar125 = 4;
              do {
                auVar443 = auVar297._0_16_;
                auVar166 = vshufps_avx(auVar443,auVar443,0);
                auVar133._0_4_ = auVar166._0_4_ * (float)local_900._0_4_ + 0.0;
                auVar133._4_4_ = auVar166._4_4_ * (float)local_900._4_4_ + 0.0;
                auVar133._8_4_ = auVar166._8_4_ * fStack_8f8 + 0.0;
                auVar133._12_4_ = auVar166._12_4_ * fStack_8f4 + 0.0;
                fVar254 = 1.0 - local_ac0;
                fVar237 = local_ac0 * local_ac0;
                fVar193 = local_ac0 * 3.0;
                local_a00._0_4_ = fVar193 + -5.0;
                local_9e0._0_4_ = fVar254 * fVar254;
                auVar166 = ZEXT416((uint)(local_ac0 * local_ac0 * -fVar254 * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar134 = ZEXT416((uint)((fVar254 * fVar254 * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar158 = ZEXT416((uint)((fVar237 * (fVar193 + -5.0) + 2.0) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar163 = ZEXT416((uint)(fVar254 * fVar254 * -local_ac0 * 0.5));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar208._0_4_ =
                     auVar163._0_4_ * (float)local_950._0_4_ +
                     auVar158._0_4_ * (float)local_970._0_4_ +
                     auVar134._0_4_ * (float)local_960._0_4_ +
                     auVar166._0_4_ * (float)local_980._0_4_;
                auVar208._4_4_ =
                     auVar163._4_4_ * (float)local_950._4_4_ +
                     auVar158._4_4_ * (float)local_970._4_4_ +
                     auVar134._4_4_ * (float)local_960._4_4_ +
                     auVar166._4_4_ * (float)local_980._4_4_;
                auVar208._8_4_ =
                     auVar163._8_4_ * fStack_948 +
                     auVar158._8_4_ * fStack_968 +
                     auVar134._8_4_ * fStack_958 + auVar166._8_4_ * fStack_978;
                auVar208._12_4_ =
                     auVar163._12_4_ * fStack_944 +
                     auVar158._12_4_ * fStack_964 +
                     auVar134._12_4_ * fStack_954 + auVar166._12_4_ * fStack_974;
                local_7a0._0_16_ = auVar208;
                auVar166 = vsubps_avx(auVar133,auVar208);
                _local_8e0 = auVar166;
                auVar166 = vdpps_avx(auVar166,auVar166,0x7f);
                local_9a0._0_16_ = ZEXT416((uint)(local_ac0 * -9.0 + 4.0));
                local_9c0._0_16_ = ZEXT416((uint)(fVar193 + -1.0));
                local_a80 = auVar166._0_4_;
                local_ae0 = auVar297._0_4_;
                fStack_adc = auVar297._4_4_;
                fStack_ad8 = auVar297._8_4_;
                fStack_ad4 = auVar297._12_4_;
                fStack_a7c = auVar166._4_4_;
                fStack_a78 = auVar166._8_4_;
                fStack_a74 = auVar166._12_4_;
                if (local_a80 < 0.0) {
                  local_820._0_4_ = fVar237;
                  local_8c0._0_16_ = ZEXT416((uint)fVar254);
                  local_7c0._0_4_ = fVar193;
                  local_7e0._0_4_ = local_ac0 * 9.0;
                  local_800._0_4_ = fVar254 * -2.0;
                  fVar199 = sqrtf(local_a80);
                  auVar443._4_4_ = fStack_adc;
                  auVar443._0_4_ = local_ae0;
                  auVar443._8_4_ = fStack_ad8;
                  auVar443._12_4_ = fStack_ad4;
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar202 = (float)local_7e0._0_4_;
                  fVar236 = (float)local_800._0_4_;
                  fVar193 = (float)local_7c0._0_4_;
                  fVar254 = (float)local_8c0._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar166,auVar166);
                  fVar199 = auVar166._0_4_;
                  fVar202 = local_ac0 * 9.0;
                  fVar236 = fVar254 * -2.0;
                  local_820._0_4_ = fVar237;
                }
                auVar166 = ZEXT416((uint)(((float)local_820._0_4_ + fVar236 * local_ac0) * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar134 = ZEXT416((uint)(((fVar254 + fVar254) * (fVar193 + 2.0) +
                                          fVar254 * fVar254 * -3.0) * 0.5));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar158 = ZEXT416((uint)(((local_ac0 + local_ac0) * (float)local_a00._0_4_ +
                                          local_ac0 * fVar193) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar163 = ZEXT416((uint)((local_ac0 * (fVar254 + fVar254) - (float)local_9e0._0_4_)
                                         * 0.5));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar394._0_4_ =
                     (float)local_950._0_4_ * auVar163._0_4_ +
                     (float)local_970._0_4_ * auVar158._0_4_ +
                     (float)local_980._0_4_ * auVar166._0_4_ +
                     (float)local_960._0_4_ * auVar134._0_4_;
                auVar394._4_4_ =
                     (float)local_950._4_4_ * auVar163._4_4_ +
                     (float)local_970._4_4_ * auVar158._4_4_ +
                     (float)local_980._4_4_ * auVar166._4_4_ +
                     (float)local_960._4_4_ * auVar134._4_4_;
                auVar394._8_4_ =
                     fStack_948 * auVar163._8_4_ +
                     fStack_968 * auVar158._8_4_ +
                     fStack_978 * auVar166._8_4_ + fStack_958 * auVar134._8_4_;
                auVar394._12_4_ =
                     fStack_944 * auVar163._12_4_ +
                     fStack_964 * auVar158._12_4_ +
                     fStack_974 * auVar166._12_4_ + fStack_954 * auVar134._12_4_;
                auVar163 = vpermilps_avx(local_9c0._0_16_,0);
                auVar49 = vpermilps_avx(local_9a0._0_16_,0);
                auVar166 = vshufps_avx(ZEXT416((uint)(fVar202 + -5.0)),
                                       ZEXT416((uint)(fVar202 + -5.0)),0);
                auVar134 = ZEXT416((uint)(local_ac0 * -3.0 + 2.0));
                auVar158 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = vdpps_avx(auVar394,auVar394,0x7f);
                auVar164._0_4_ =
                     (float)local_950._0_4_ * auVar158._0_4_ +
                     (float)local_970._0_4_ * auVar166._0_4_ +
                     (float)local_960._0_4_ * auVar49._0_4_ +
                     (float)local_980._0_4_ * auVar163._0_4_;
                auVar164._4_4_ =
                     (float)local_950._4_4_ * auVar158._4_4_ +
                     (float)local_970._4_4_ * auVar166._4_4_ +
                     (float)local_960._4_4_ * auVar49._4_4_ +
                     (float)local_980._4_4_ * auVar163._4_4_;
                auVar164._8_4_ =
                     fStack_948 * auVar158._8_4_ +
                     fStack_968 * auVar166._8_4_ +
                     fStack_958 * auVar49._8_4_ + fStack_978 * auVar163._8_4_;
                auVar164._12_4_ =
                     fStack_944 * auVar158._12_4_ +
                     fStack_964 * auVar166._12_4_ +
                     fStack_954 * auVar49._12_4_ + fStack_974 * auVar163._12_4_;
                auVar166 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar158 = vrsqrtss_avx(auVar166,auVar166);
                fVar193 = auVar158._0_4_;
                fVar237 = auVar134._0_4_;
                auVar158 = vdpps_avx(auVar394,auVar164,0x7f);
                auVar163 = vshufps_avx(auVar134,auVar134,0);
                auVar165._0_4_ = auVar164._0_4_ * auVar163._0_4_;
                auVar165._4_4_ = auVar164._4_4_ * auVar163._4_4_;
                auVar165._8_4_ = auVar164._8_4_ * auVar163._8_4_;
                auVar165._12_4_ = auVar164._12_4_ * auVar163._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar262._0_4_ = auVar394._0_4_ * auVar158._0_4_;
                auVar262._4_4_ = auVar394._4_4_ * auVar158._4_4_;
                auVar262._8_4_ = auVar394._8_4_ * auVar158._8_4_;
                auVar262._12_4_ = auVar394._12_4_ * auVar158._12_4_;
                auVar49 = vsubps_avx(auVar165,auVar262);
                auVar158 = vrcpss_avx(auVar166,auVar166);
                auVar166 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                      ZEXT416((uint)(auVar443._0_4_ * (float)local_840._0_4_)));
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar237 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar128 = CONCAT44(auVar394._4_4_,auVar394._0_4_);
                auVar385._0_8_ = uVar128 ^ 0x8000000080000000;
                auVar385._8_4_ = -auVar394._8_4_;
                auVar385._12_4_ = -auVar394._12_4_;
                auVar163 = ZEXT416((uint)(fVar193 * 1.5 +
                                         fVar237 * -0.5 * fVar193 * fVar193 * fVar193));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar241._0_4_ = auVar163._0_4_ * auVar49._0_4_ * auVar158._0_4_;
                auVar241._4_4_ = auVar163._4_4_ * auVar49._4_4_ * auVar158._4_4_;
                auVar241._8_4_ = auVar163._8_4_ * auVar49._8_4_ * auVar158._8_4_;
                auVar241._12_4_ = auVar163._12_4_ * auVar49._12_4_ * auVar158._12_4_;
                _local_a00 = auVar394;
                local_820._0_4_ = auVar394._0_4_ * auVar163._0_4_;
                local_820._4_4_ = auVar394._4_4_ * auVar163._4_4_;
                local_820._8_4_ = auVar394._8_4_ * auVar163._8_4_;
                local_820._12_4_ = auVar394._12_4_ * auVar163._12_4_;
                local_9a0._0_4_ = auVar166._0_4_;
                if (fVar237 < 0.0) {
                  local_9c0._0_4_ = fVar199;
                  local_9e0._0_16_ = auVar385;
                  local_8c0._0_16_ = auVar241;
                  fVar193 = sqrtf(fVar237);
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar241 = local_8c0._0_16_;
                  auVar385 = local_9e0._0_16_;
                  fVar237 = (float)local_9a0._0_4_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar193 = auVar134._0_4_;
                  local_9c0._0_4_ = fVar199;
                  fVar237 = auVar166._0_4_;
                }
                auVar340._4_4_ = fStack_a7c;
                auVar340._0_4_ = local_a80;
                auVar340._8_4_ = fStack_a78;
                auVar340._12_4_ = fStack_a74;
                auVar166 = vdpps_avx(_local_8e0,local_820._0_16_,0x7f);
                local_9e0._0_4_ =
                     ((float)local_920._0_4_ / fVar193) * ((float)local_9c0._0_4_ + 1.0) +
                     fVar237 + (float)local_9c0._0_4_ * (float)local_920._0_4_;
                auVar134 = vdpps_avx(auVar385,local_820._0_16_,0x7f);
                auVar158 = vdpps_avx(_local_8e0,auVar241,0x7f);
                auVar163 = vdpps_avx(_local_900,local_820._0_16_,0x7f);
                auVar49 = vdpps_avx(_local_8e0,auVar385,0x7f);
                fVar193 = auVar134._0_4_ + auVar158._0_4_;
                fVar254 = auVar166._0_4_;
                auVar135._0_4_ = fVar254 * fVar254;
                auVar135._4_4_ = auVar166._4_4_ * auVar166._4_4_;
                auVar135._8_4_ = auVar166._8_4_ * auVar166._8_4_;
                auVar135._12_4_ = auVar166._12_4_ * auVar166._12_4_;
                auVar158 = vsubps_avx(auVar340,auVar135);
                local_820._0_16_ = ZEXT416((uint)fVar193);
                auVar134 = vdpps_avx(_local_8e0,_local_900,0x7f);
                fVar199 = auVar49._0_4_ - fVar254 * fVar193;
                local_9c0._0_16_ = auVar166;
                fVar254 = auVar134._0_4_ - fVar254 * auVar163._0_4_;
                auVar166 = vrsqrtss_avx(auVar158,auVar158);
                fVar236 = auVar158._0_4_;
                fVar193 = auVar166._0_4_;
                fVar193 = fVar193 * 1.5 + fVar236 * -0.5 * fVar193 * fVar193 * fVar193;
                if (fVar236 < 0.0) {
                  local_8c0._0_16_ = auVar163;
                  local_7c0._0_4_ = fVar199;
                  local_7e0._0_4_ = fVar254;
                  local_800._0_4_ = fVar193;
                  fVar236 = sqrtf(fVar236);
                  auVar340._4_4_ = fStack_a7c;
                  auVar340._0_4_ = local_a80;
                  auVar340._8_4_ = fStack_a78;
                  auVar340._12_4_ = fStack_a74;
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar193 = (float)local_800._0_4_;
                  fVar199 = (float)local_7c0._0_4_;
                  fVar254 = (float)local_7e0._0_4_;
                  auVar163 = local_8c0._0_16_;
                  fVar237 = (float)local_9a0._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar158,auVar158);
                  fVar236 = auVar166._0_4_;
                }
                auVar351 = ZEXT1664(auVar340);
                auVar413 = ZEXT3264(local_940);
                auVar432 = ZEXT3264(_local_a20);
                auVar401 = ZEXT3264(local_860);
                auVar134 = vpermilps_avx(local_7a0._0_16_,0xff);
                auVar49 = vpermilps_avx(_local_a00,0xff);
                fVar199 = fVar199 * fVar193 - auVar49._0_4_;
                auVar263._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
                auVar263._8_4_ = auVar163._8_4_ ^ 0x80000000;
                auVar263._12_4_ = auVar163._12_4_ ^ 0x80000000;
                auVar282._0_4_ = -fVar199;
                auVar282._4_4_ = 0x80000000;
                auVar282._8_4_ = 0x80000000;
                auVar282._12_4_ = 0x80000000;
                auVar392 = ZEXT1664(local_820._0_16_);
                auVar166 = vinsertps_avx(ZEXT416((uint)(fVar254 * fVar193)),auVar263,0x10);
                auVar158 = vmovsldup_avx(ZEXT416((uint)(local_820._0_4_ * fVar254 * fVar193 -
                                                       auVar163._0_4_ * fVar199)));
                auVar166 = vdivps_avx(auVar166,auVar158);
                auVar163 = ZEXT416((uint)(fVar236 - auVar134._0_4_));
                auVar134 = vinsertps_avx(local_9c0._0_16_,auVar163,0x10);
                auVar242._0_4_ = auVar134._0_4_ * auVar166._0_4_;
                auVar242._4_4_ = auVar134._4_4_ * auVar166._4_4_;
                auVar242._8_4_ = auVar134._8_4_ * auVar166._8_4_;
                auVar242._12_4_ = auVar134._12_4_ * auVar166._12_4_;
                auVar166 = vinsertps_avx(auVar282,local_820._0_16_,0x1c);
                auVar166 = vdivps_avx(auVar166,auVar158);
                auVar209._0_4_ = auVar134._0_4_ * auVar166._0_4_;
                auVar209._4_4_ = auVar134._4_4_ * auVar166._4_4_;
                auVar209._8_4_ = auVar134._8_4_ * auVar166._8_4_;
                auVar209._12_4_ = auVar134._12_4_ * auVar166._12_4_;
                auVar166 = vhaddps_avx(auVar242,auVar242);
                auVar134 = vhaddps_avx(auVar209,auVar209);
                local_ac0 = local_ac0 - auVar166._0_4_;
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                local_ae0 = local_ae0 - auVar134._0_4_;
                auVar297 = ZEXT464((uint)local_ae0);
                auVar264._8_4_ = 0x7fffffff;
                auVar264._0_8_ = 0x7fffffff7fffffff;
                auVar264._12_4_ = 0x7fffffff;
                auVar273 = ZEXT1664(auVar264);
                auVar166 = vandps_avx(local_9c0._0_16_,auVar264);
                if ((float)local_9e0._0_4_ <= auVar166._0_4_) {
LAB_01278755:
                  bVar104 = false;
                }
                else {
                  auVar166 = vandps_avx(auVar163,auVar264);
                  if ((float)local_700._0_4_ * 1.9073486e-06 + fVar237 + (float)local_9e0._0_4_ <=
                      auVar166._0_4_) goto LAB_01278755;
                  local_ae0 = local_ae0 + (float)local_760._0_4_;
                  auVar297 = ZEXT464((uint)local_ae0);
                  bVar104 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                       (fVar237 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar237)) &&
                      (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                    auVar166 = vrsqrtss_avx(auVar340,auVar340);
                    fVar193 = auVar166._0_4_;
                    pGVar32 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar32->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar166 = ZEXT416((uint)(fVar193 * 1.5 +
                                               auVar340._0_4_ * -0.5 * fVar193 * fVar193 * fVar193))
                      ;
                      auVar166 = vshufps_avx(auVar166,auVar166,0);
                      auVar167._0_4_ = auVar166._0_4_ * (float)local_8e0._0_4_;
                      auVar167._4_4_ = auVar166._4_4_ * (float)local_8e0._4_4_;
                      auVar167._8_4_ = auVar166._8_4_ * fStack_8d8;
                      auVar167._12_4_ = auVar166._12_4_ * fStack_8d4;
                      auVar136._0_4_ = local_a00._0_4_ + auVar49._0_4_ * auVar167._0_4_;
                      auVar136._4_4_ = local_a00._4_4_ + auVar49._4_4_ * auVar167._4_4_;
                      auVar136._8_4_ = local_a00._8_4_ + auVar49._8_4_ * auVar167._8_4_;
                      auVar136._12_4_ = local_a00._12_4_ + auVar49._12_4_ * auVar167._12_4_;
                      auVar166 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar134 = vshufps_avx(_local_a00,_local_a00,0xc9);
                      auVar168._0_4_ = auVar134._0_4_ * auVar167._0_4_;
                      auVar168._4_4_ = auVar134._4_4_ * auVar167._4_4_;
                      auVar168._8_4_ = auVar134._8_4_ * auVar167._8_4_;
                      auVar168._12_4_ = auVar134._12_4_ * auVar167._12_4_;
                      auVar210._0_4_ = local_a00._0_4_ * auVar166._0_4_;
                      auVar210._4_4_ = local_a00._4_4_ * auVar166._4_4_;
                      auVar210._8_4_ = local_a00._8_4_ * auVar166._8_4_;
                      auVar210._12_4_ = local_a00._12_4_ * auVar166._12_4_;
                      auVar158 = vsubps_avx(auVar210,auVar168);
                      auVar166 = vshufps_avx(auVar158,auVar158,0xc9);
                      auVar134 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar211._0_4_ = auVar134._0_4_ * auVar166._0_4_;
                      auVar211._4_4_ = auVar134._4_4_ * auVar166._4_4_;
                      auVar211._8_4_ = auVar134._8_4_ * auVar166._8_4_;
                      auVar211._12_4_ = auVar134._12_4_ * auVar166._12_4_;
                      auVar166 = vshufps_avx(auVar158,auVar158,0xd2);
                      auVar137._0_4_ = auVar136._0_4_ * auVar166._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar166._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar166._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar166._12_4_;
                      auVar166 = vsubps_avx(auVar211,auVar137);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ae0;
                        auVar134 = vshufps_avx(auVar166,auVar166,0xe9);
                        uVar9 = vmovlps_avx(auVar134);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar166._0_4_;
                        ray->u = local_ac0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a88;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar134 = vshufps_avx(auVar166,auVar166,0xe9);
                        local_890 = vmovlps_avx(auVar134);
                        local_888 = auVar166._0_4_;
                        local_884 = local_ac0;
                        local_880 = 0;
                        local_87c = (uint)local_a88;
                        local_878 = (uint)local_ae8;
                        local_874 = context->user->instID[0];
                        local_870 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ae0;
                        local_aec = -1;
                        local_a50.valid = &local_aec;
                        local_a50.geometryUserPtr = pGVar32->userPtr;
                        local_a50.context = context->user;
                        local_a50.ray = (RTCRayN *)ray;
                        local_a50.hit = (RTCHitN *)&local_890;
                        local_a50.N = 1;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        fStack_adc = 0.0;
                        fStack_ad8 = 0.0;
                        fStack_ad4 = 0.0;
                        local_a80 = fVar237;
                        if (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012788a8:
                          p_Var35 = context->args->filter;
                          if (p_Var35 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar32->field_8).field_0x2 & 0x40) != 0)) {
                              auVar351 = ZEXT1664(auVar351._0_16_);
                              auVar392 = ZEXT1664(auVar392._0_16_);
                              (*p_Var35)(&local_a50);
                              auVar297 = ZEXT1664(CONCAT412(fStack_ad4,
                                                            CONCAT48(fStack_ad8,
                                                                     CONCAT44(fStack_adc,local_ae0))
                                                           ));
                              auVar401 = ZEXT3264(local_860);
                              auVar432 = ZEXT3264(_local_a20);
                              auVar413 = ZEXT3264(local_940);
                              auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            if (*local_a50.valid == 0) goto LAB_01278978;
                          }
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a50.hit;
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a50.hit + 4);
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a50.hit + 8);
                          *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                          *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                          *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                          *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                          *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                          *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                        }
                        else {
                          auVar351 = ZEXT1664(auVar340);
                          auVar392 = ZEXT1664(local_820._0_16_);
                          (*pGVar32->intersectionFilterN)(&local_a50);
                          auVar297 = ZEXT1664(CONCAT412(fStack_ad4,
                                                        CONCAT48(fStack_ad8,
                                                                 CONCAT44(fStack_adc,local_ae0))));
                          auVar401 = ZEXT3264(local_860);
                          auVar432 = ZEXT3264(_local_a20);
                          auVar413 = ZEXT3264(local_940);
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                          if (*local_a50.valid != 0) goto LAB_012788a8;
LAB_01278978:
                          (ray->super_RayK<1>).tfar = local_a80;
                        }
                      }
                    }
                  }
                }
                auVar178 = local_5e0;
                bVar129 = lVar125 != 0;
                lVar125 = lVar125 + -1;
              } while ((!bVar104) && (bVar129));
              fVar237 = (ray->super_RayK<1>).tfar;
              auVar151._4_4_ = fVar237;
              auVar151._0_4_ = fVar237;
              auVar151._8_4_ = fVar237;
              auVar151._12_4_ = fVar237;
              auVar151._16_4_ = fVar237;
              auVar151._20_4_ = fVar237;
              auVar151._24_4_ = fVar237;
              auVar151._28_4_ = fVar237;
              auVar150 = vcmpps_avx(_local_720,auVar151,2);
              local_5e0 = vandps_avx(auVar150,local_5e0);
              auVar297 = ZEXT3264(local_5e0);
              auVar178 = auVar178 & auVar150;
              uVar128 = local_620._0_8_;
            } while ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar178 >> 0x7f,0) != '\0') ||
                       (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar178 >> 0xbf,0) != '\0') ||
                     (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar178[0x1f] < '\0');
          }
          auVar152._0_4_ =
               auVar413._0_4_ * (float)local_640._0_4_ +
               auVar432._0_4_ * (float)local_660._0_4_ + auVar401._0_4_ * (float)local_680._0_4_;
          auVar152._4_4_ =
               auVar413._4_4_ * (float)local_640._4_4_ +
               auVar432._4_4_ * (float)local_660._4_4_ + auVar401._4_4_ * (float)local_680._4_4_;
          auVar152._8_4_ =
               auVar413._8_4_ * fStack_638 +
               auVar432._8_4_ * fStack_658 + auVar401._8_4_ * fStack_678;
          auVar152._12_4_ =
               auVar413._12_4_ * fStack_634 +
               auVar432._12_4_ * fStack_654 + auVar401._12_4_ * fStack_674;
          auVar152._16_4_ =
               auVar413._16_4_ * fStack_630 +
               auVar432._16_4_ * fStack_650 + auVar401._16_4_ * fStack_670;
          auVar152._20_4_ =
               auVar413._20_4_ * fStack_62c +
               auVar432._20_4_ * fStack_64c + auVar401._20_4_ * fStack_66c;
          auVar152._24_4_ =
               auVar413._24_4_ * fStack_628 +
               auVar432._24_4_ * fStack_648 + auVar401._24_4_ * fStack_668;
          auVar152._28_4_ = auVar150._28_4_ + auVar150._28_4_ + auVar297._28_4_;
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar150 = vandps_avx(auVar152,auVar184);
          auVar185._8_4_ = 0x3e99999a;
          auVar185._0_8_ = 0x3e99999a3e99999a;
          auVar185._12_4_ = 0x3e99999a;
          auVar185._16_4_ = 0x3e99999a;
          auVar185._20_4_ = 0x3e99999a;
          auVar185._24_4_ = 0x3e99999a;
          auVar185._28_4_ = 0x3e99999a;
          auVar150 = vcmpps_avx(auVar150,auVar185,1);
          auVar178 = vorps_avx(auVar150,local_5a0);
          auVar186._0_4_ = (float)local_740._0_4_ + (float)local_580._0_4_;
          auVar186._4_4_ = (float)local_740._4_4_ + (float)local_580._4_4_;
          auVar186._8_4_ = fStack_738 + fStack_578;
          auVar186._12_4_ = fStack_734 + fStack_574;
          auVar186._16_4_ = fStack_730 + fStack_570;
          auVar186._20_4_ = fStack_72c + fStack_56c;
          auVar186._24_4_ = fStack_728 + fStack_568;
          auVar186._28_4_ = fStack_724 + fStack_564;
          fVar237 = (ray->super_RayK<1>).tfar;
          auVar226._4_4_ = fVar237;
          auVar226._0_4_ = fVar237;
          auVar226._8_4_ = fVar237;
          auVar226._12_4_ = fVar237;
          auVar226._16_4_ = fVar237;
          auVar226._20_4_ = fVar237;
          auVar226._24_4_ = fVar237;
          auVar226._28_4_ = fVar237;
          auVar150 = vcmpps_avx(auVar186,auVar226,2);
          local_700 = vandps_avx(auVar150,local_6c0);
          auVar187._8_4_ = 3;
          auVar187._0_8_ = 0x300000003;
          auVar187._12_4_ = 3;
          auVar187._16_4_ = 3;
          auVar187._20_4_ = 3;
          auVar187._24_4_ = 3;
          auVar187._28_4_ = 3;
          auVar227._8_4_ = 2;
          auVar227._0_8_ = 0x200000002;
          auVar227._12_4_ = 2;
          auVar227._16_4_ = 2;
          auVar227._20_4_ = 2;
          auVar227._24_4_ = 2;
          auVar227._28_4_ = 2;
          auVar150 = vblendvps_avx(auVar227,auVar187,auVar178);
          auVar166 = vpcmpgtd_avx(auVar150._16_16_,local_5c0._0_16_);
          auVar134 = vpshufd_avx(_local_6e0,0);
          auVar134 = vpcmpgtd_avx(auVar150._0_16_,auVar134);
          auVar188._16_16_ = auVar166;
          auVar188._0_16_ = auVar134;
          _local_720 = vblendps_avx(ZEXT1632(auVar134),auVar188,0xf0);
          local_600 = vandnps_avx(_local_720,local_700);
          auVar150 = local_700 & ~_local_720;
          fVar405 = (float)local_740._0_4_;
          fVar416 = (float)local_740._4_4_;
          fVar205 = fStack_738;
          fVar230 = fStack_734;
          fVar231 = fStack_730;
          fVar232 = fStack_72c;
          fVar233 = fStack_728;
          fVar234 = fStack_724;
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0x7f,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0xbf,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar150[0x1f] < '\0') {
            local_7e0 = _local_480;
            local_800._4_4_ = (float)local_740._4_4_ + (float)local_480._4_4_;
            local_800._0_4_ = (float)local_740._0_4_ + (float)local_480._0_4_;
            fStack_7f8 = fStack_738 + fStack_478;
            fStack_7f4 = fStack_734 + fStack_474;
            fStack_7f0 = fStack_730 + fStack_470;
            fStack_7ec = fStack_72c + fStack_46c;
            fStack_7e8 = fStack_728 + fStack_468;
            fStack_7e4 = fStack_724 + fStack_464;
            do {
              auVar265 = auVar273._0_16_;
              auVar189._8_4_ = 0x7f800000;
              auVar189._0_8_ = 0x7f8000007f800000;
              auVar189._12_4_ = 0x7f800000;
              auVar189._16_4_ = 0x7f800000;
              auVar189._20_4_ = 0x7f800000;
              auVar189._24_4_ = 0x7f800000;
              auVar189._28_4_ = 0x7f800000;
              auVar150 = vblendvps_avx(auVar189,local_7e0,local_600);
              auVar178 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar178 = vminps_avx(auVar150,auVar178);
              auVar36 = vshufpd_avx(auVar178,auVar178,5);
              auVar178 = vminps_avx(auVar178,auVar36);
              auVar36 = vperm2f128_avx(auVar178,auVar178,1);
              auVar178 = vminps_avx(auVar178,auVar36);
              auVar178 = vcmpps_avx(auVar150,auVar178,0);
              auVar36 = local_600 & auVar178;
              auVar150 = local_600;
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') ||
                    (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0xbf,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar36[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar178,local_600);
              }
              uVar127 = vmovmskps_avx(auVar150);
              uVar122 = 0;
              if (uVar127 != 0) {
                for (; (uVar127 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                }
              }
              uVar128 = (ulong)uVar122;
              *(undefined4 *)(local_600 + uVar128 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_a00 = (undefined1  [16])aVar12;
              auVar166 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_ac0 = local_4c0[uVar128];
              auVar401 = ZEXT464((uint)local_ac0);
              local_ae0 = *(float *)(local_460 + uVar128 * 4);
              auVar413 = ZEXT464((uint)local_ae0);
              if (auVar166._0_4_ < 0.0) {
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fStack_adc = 0.0;
                fStack_ad8 = 0.0;
                fStack_ad4 = 0.0;
                fVar237 = sqrtf(auVar166._0_4_);
                auVar413 = ZEXT1664(CONCAT412(fStack_ad4,
                                              CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
                auVar401 = ZEXT1664(CONCAT412(fStack_ab4,
                                              CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
                auVar265._8_4_ = 0x7fffffff;
                auVar265._0_8_ = 0x7fffffff7fffffff;
                auVar265._12_4_ = 0x7fffffff;
                auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar166 = vsqrtss_avx(auVar166,auVar166);
                fVar237 = auVar166._0_4_;
              }
              auVar134 = vminps_avx(_local_950,_local_970);
              auVar166 = vmaxps_avx(_local_950,_local_970);
              auVar158 = vminps_avx(_local_960,_local_980);
              auVar163 = vminps_avx(auVar134,auVar158);
              auVar134 = vmaxps_avx(_local_960,_local_980);
              auVar158 = vmaxps_avx(auVar166,auVar134);
              auVar166 = vandps_avx(auVar163,auVar265);
              auVar134 = vandps_avx(auVar158,auVar265);
              auVar166 = vmaxps_avx(auVar166,auVar134);
              auVar134 = vmovshdup_avx(auVar166);
              auVar134 = vmaxss_avx(auVar134,auVar166);
              auVar166 = vshufpd_avx(auVar166,auVar166,1);
              auVar166 = vmaxss_avx(auVar166,auVar134);
              local_900._0_4_ = auVar166._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar237 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar158,auVar158,0xff);
              lVar125 = 4;
              do {
                auVar406 = auVar413._0_16_;
                auVar166 = vshufps_avx(auVar406,auVar406,0);
                auVar138._0_4_ = auVar166._0_4_ * (float)local_a00._0_4_ + 0.0;
                auVar138._4_4_ = auVar166._4_4_ * (float)local_a00._4_4_ + 0.0;
                auVar138._8_4_ = auVar166._8_4_ * fStack_9f8 + 0.0;
                auVar138._12_4_ = auVar166._12_4_ * fStack_9f4 + 0.0;
                local_ac0 = auVar401._0_4_;
                fVar254 = 1.0 - local_ac0;
                fVar237 = local_ac0 * local_ac0;
                fVar193 = local_ac0 * 3.0;
                local_920._0_4_ = fVar193 + -5.0;
                local_9e0._0_4_ = fVar254 * fVar254;
                auVar166 = ZEXT416((uint)(local_ac0 * local_ac0 * -fVar254 * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar134 = ZEXT416((uint)((fVar254 * fVar254 * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar158 = ZEXT416((uint)((fVar237 * (fVar193 + -5.0) + 2.0) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar163 = ZEXT416((uint)(fVar254 * fVar254 * -local_ac0 * 0.5));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar212._0_4_ =
                     auVar163._0_4_ * (float)local_950._0_4_ +
                     auVar158._0_4_ * (float)local_970._0_4_ +
                     auVar134._0_4_ * (float)local_960._0_4_ +
                     auVar166._0_4_ * (float)local_980._0_4_;
                auVar212._4_4_ =
                     auVar163._4_4_ * (float)local_950._4_4_ +
                     auVar158._4_4_ * (float)local_970._4_4_ +
                     auVar134._4_4_ * (float)local_960._4_4_ +
                     auVar166._4_4_ * (float)local_980._4_4_;
                auVar212._8_4_ =
                     auVar163._8_4_ * fStack_948 +
                     auVar158._8_4_ * fStack_968 +
                     auVar134._8_4_ * fStack_958 + auVar166._8_4_ * fStack_978;
                auVar212._12_4_ =
                     auVar163._12_4_ * fStack_944 +
                     auVar158._12_4_ * fStack_964 +
                     auVar134._12_4_ * fStack_954 + auVar166._12_4_ * fStack_974;
                local_7a0._0_16_ = auVar212;
                auVar166 = vsubps_avx(auVar138,auVar212);
                _local_8e0 = auVar166;
                auVar166 = vdpps_avx(auVar166,auVar166,0x7f);
                local_9a0._0_16_ = ZEXT416((uint)(local_ac0 * -9.0 + 4.0));
                local_9c0._0_16_ = ZEXT416((uint)(fVar193 + -1.0));
                local_a80 = auVar166._0_4_;
                fStack_abc = auVar401._4_4_;
                fStack_ab8 = auVar401._8_4_;
                fStack_ab4 = auVar401._12_4_;
                local_ae0 = auVar413._0_4_;
                fStack_adc = auVar413._4_4_;
                fStack_ad8 = auVar413._8_4_;
                fStack_ad4 = auVar413._12_4_;
                fStack_a7c = auVar166._4_4_;
                fStack_a78 = auVar166._8_4_;
                fStack_a74 = auVar166._12_4_;
                if (local_a80 < 0.0) {
                  local_840._0_4_ = fVar237;
                  local_940._0_16_ = ZEXT416((uint)fVar254);
                  local_a20._0_4_ = fVar193;
                  local_860._0_4_ = local_ac0 * 9.0;
                  local_8c0._0_4_ = fVar254 * -2.0;
                  fVar199 = sqrtf(local_a80);
                  auVar406._4_4_ = fStack_adc;
                  auVar406._0_4_ = local_ae0;
                  auVar406._8_4_ = fStack_ad8;
                  auVar406._12_4_ = fStack_ad4;
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar202 = (float)local_860._0_4_;
                  fVar236 = (float)local_8c0._0_4_;
                  fVar237 = (float)local_840._0_4_;
                  fVar193 = (float)local_a20._0_4_;
                  fVar254 = (float)local_940._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar166,auVar166);
                  fVar199 = auVar166._0_4_;
                  fVar202 = local_ac0 * 9.0;
                  fVar236 = fVar254 * -2.0;
                }
                auVar166 = ZEXT416((uint)((fVar237 + fVar236 * local_ac0) * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar134 = ZEXT416((uint)(((fVar254 + fVar254) * (fVar193 + 2.0) +
                                          fVar254 * fVar254 * -3.0) * 0.5));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar158 = ZEXT416((uint)(((local_ac0 + local_ac0) * (float)local_920._0_4_ +
                                          local_ac0 * fVar193) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar163 = ZEXT416((uint)((local_ac0 * (fVar254 + fVar254) - (float)local_9e0._0_4_)
                                         * 0.5));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar429._0_4_ =
                     (float)local_950._0_4_ * auVar163._0_4_ +
                     (float)local_970._0_4_ * auVar158._0_4_ +
                     (float)local_980._0_4_ * auVar166._0_4_ +
                     (float)local_960._0_4_ * auVar134._0_4_;
                auVar429._4_4_ =
                     (float)local_950._4_4_ * auVar163._4_4_ +
                     (float)local_970._4_4_ * auVar158._4_4_ +
                     (float)local_980._4_4_ * auVar166._4_4_ +
                     (float)local_960._4_4_ * auVar134._4_4_;
                auVar429._8_4_ =
                     fStack_948 * auVar163._8_4_ +
                     fStack_968 * auVar158._8_4_ +
                     fStack_978 * auVar166._8_4_ + fStack_958 * auVar134._8_4_;
                auVar429._12_4_ =
                     fStack_944 * auVar163._12_4_ +
                     fStack_964 * auVar158._12_4_ +
                     fStack_974 * auVar166._12_4_ + fStack_954 * auVar134._12_4_;
                auVar163 = vpermilps_avx(local_9c0._0_16_,0);
                auVar49 = vpermilps_avx(local_9a0._0_16_,0);
                auVar166 = vshufps_avx(ZEXT416((uint)(fVar202 + -5.0)),
                                       ZEXT416((uint)(fVar202 + -5.0)),0);
                auVar134 = ZEXT416((uint)(local_ac0 * -3.0 + 2.0));
                auVar158 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = vdpps_avx(auVar429,auVar429,0x7f);
                auVar169._0_4_ =
                     (float)local_950._0_4_ * auVar158._0_4_ +
                     (float)local_970._0_4_ * auVar166._0_4_ +
                     (float)local_960._0_4_ * auVar49._0_4_ +
                     (float)local_980._0_4_ * auVar163._0_4_;
                auVar169._4_4_ =
                     (float)local_950._4_4_ * auVar158._4_4_ +
                     (float)local_970._4_4_ * auVar166._4_4_ +
                     (float)local_960._4_4_ * auVar49._4_4_ +
                     (float)local_980._4_4_ * auVar163._4_4_;
                auVar169._8_4_ =
                     fStack_948 * auVar158._8_4_ +
                     fStack_968 * auVar166._8_4_ +
                     fStack_958 * auVar49._8_4_ + fStack_978 * auVar163._8_4_;
                auVar169._12_4_ =
                     fStack_944 * auVar158._12_4_ +
                     fStack_964 * auVar166._12_4_ +
                     fStack_954 * auVar49._12_4_ + fStack_974 * auVar163._12_4_;
                auVar166 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar158 = vrsqrtss_avx(auVar166,auVar166);
                fVar193 = auVar158._0_4_;
                fVar237 = auVar134._0_4_;
                auVar158 = vdpps_avx(auVar429,auVar169,0x7f);
                auVar163 = vshufps_avx(auVar134,auVar134,0);
                auVar170._0_4_ = auVar169._0_4_ * auVar163._0_4_;
                auVar170._4_4_ = auVar169._4_4_ * auVar163._4_4_;
                auVar170._8_4_ = auVar169._8_4_ * auVar163._8_4_;
                auVar170._12_4_ = auVar169._12_4_ * auVar163._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar266._0_4_ = auVar429._0_4_ * auVar158._0_4_;
                auVar266._4_4_ = auVar429._4_4_ * auVar158._4_4_;
                auVar266._8_4_ = auVar429._8_4_ * auVar158._8_4_;
                auVar266._12_4_ = auVar429._12_4_ * auVar158._12_4_;
                auVar49 = vsubps_avx(auVar170,auVar266);
                auVar158 = vrcpss_avx(auVar166,auVar166);
                auVar166 = vmaxss_avx(ZEXT416((uint)local_900._0_4_),
                                      ZEXT416((uint)(auVar406._0_4_ * (float)local_820._0_4_)));
                auVar392 = ZEXT1664(auVar166);
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar237 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar128 = CONCAT44(auVar429._4_4_,auVar429._0_4_);
                auVar283._0_8_ = uVar128 ^ 0x8000000080000000;
                auVar283._8_4_ = -auVar429._8_4_;
                auVar283._12_4_ = -auVar429._12_4_;
                auVar163 = ZEXT416((uint)(fVar193 * 1.5 +
                                         fVar237 * -0.5 * fVar193 * fVar193 * fVar193));
                auVar163 = vshufps_avx(auVar163,auVar163,0);
                auVar243._0_4_ = auVar163._0_4_ * auVar49._0_4_ * auVar158._0_4_;
                auVar243._4_4_ = auVar163._4_4_ * auVar49._4_4_ * auVar158._4_4_;
                auVar243._8_4_ = auVar163._8_4_ * auVar49._8_4_ * auVar158._8_4_;
                auVar243._12_4_ = auVar163._12_4_ * auVar49._12_4_ * auVar158._12_4_;
                auVar307._0_4_ = auVar429._0_4_ * auVar163._0_4_;
                auVar307._4_4_ = auVar429._4_4_ * auVar163._4_4_;
                auVar307._8_4_ = auVar429._8_4_ * auVar163._8_4_;
                auVar307._12_4_ = auVar429._12_4_ * auVar163._12_4_;
                local_920._0_16_ = auVar429;
                local_9a0._0_4_ = auVar166._0_4_;
                if (fVar237 < 0.0) {
                  local_9c0._0_4_ = fVar199;
                  local_9e0._0_16_ = auVar283;
                  local_840._0_16_ = auVar307;
                  local_940._0_16_ = auVar243;
                  fVar237 = sqrtf(fVar237);
                  auVar392 = ZEXT464((uint)local_9a0._0_4_);
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar243 = local_940._0_16_;
                  auVar283 = local_9e0._0_16_;
                  auVar307 = local_840._0_16_;
                  fVar199 = (float)local_9c0._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar134,auVar134);
                  fVar237 = auVar166._0_4_;
                }
                auVar341._4_4_ = fStack_a7c;
                auVar341._0_4_ = local_a80;
                auVar341._8_4_ = fStack_a78;
                auVar341._12_4_ = fStack_a74;
                auVar166 = vdpps_avx(_local_8e0,auVar307,0x7f);
                fVar237 = ((float)local_900._0_4_ / fVar237) * (fVar199 + 1.0) +
                          auVar392._0_4_ + fVar199 * (float)local_900._0_4_;
                auVar134 = vdpps_avx(auVar283,auVar307,0x7f);
                auVar158 = vdpps_avx(_local_8e0,auVar243,0x7f);
                auVar163 = vdpps_avx(_local_a00,auVar307,0x7f);
                auVar49 = vdpps_avx(_local_8e0,auVar283,0x7f);
                fVar193 = auVar134._0_4_ + auVar158._0_4_;
                fVar254 = auVar166._0_4_;
                auVar139._0_4_ = fVar254 * fVar254;
                auVar139._4_4_ = auVar166._4_4_ * auVar166._4_4_;
                auVar139._8_4_ = auVar166._8_4_ * auVar166._8_4_;
                auVar139._12_4_ = auVar166._12_4_ * auVar166._12_4_;
                auVar158 = vsubps_avx(auVar341,auVar139);
                auVar134 = vdpps_avx(_local_8e0,_local_a00,0x7f);
                fVar199 = auVar49._0_4_ - fVar254 * fVar193;
                fVar236 = auVar134._0_4_ - fVar254 * auVar163._0_4_;
                auVar134 = vrsqrtss_avx(auVar158,auVar158);
                fVar202 = auVar158._0_4_;
                fVar254 = auVar134._0_4_;
                fVar254 = fVar254 * 1.5 + fVar202 * -0.5 * fVar254 * fVar254 * fVar254;
                if (fVar202 < 0.0) {
                  local_9c0._0_16_ = auVar166;
                  local_9e0._0_4_ = fVar237;
                  local_840._0_16_ = ZEXT416((uint)fVar193);
                  local_940._0_16_ = auVar163;
                  local_a20._0_4_ = fVar199;
                  local_860._0_4_ = fVar236;
                  local_8c0._0_4_ = fVar254;
                  fVar202 = sqrtf(fVar202);
                  auVar392 = ZEXT464((uint)local_9a0._0_4_);
                  auVar341._4_4_ = fStack_a7c;
                  auVar341._0_4_ = local_a80;
                  auVar341._8_4_ = fStack_a78;
                  auVar341._12_4_ = fStack_a74;
                  auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar254 = (float)local_8c0._0_4_;
                  fVar199 = (float)local_a20._0_4_;
                  fVar236 = (float)local_860._0_4_;
                  auVar163 = local_940._0_16_;
                  auVar166 = local_9c0._0_16_;
                  fVar237 = (float)local_9e0._0_4_;
                  auVar134 = local_840._0_16_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar158,auVar158);
                  fVar202 = auVar134._0_4_;
                  auVar134 = ZEXT416((uint)fVar193);
                }
                auVar432 = ZEXT1664(auVar166);
                auVar351 = ZEXT1664(auVar341);
                auVar171 = vpermilps_avx(local_7a0._0_16_,0xff);
                auVar13 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
                fVar193 = fVar199 * fVar254 - auVar13._0_4_;
                auVar267._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
                auVar267._8_4_ = auVar163._8_4_ ^ 0x80000000;
                auVar267._12_4_ = auVar163._12_4_ ^ 0x80000000;
                auVar284._0_4_ = -fVar193;
                auVar284._4_4_ = 0x80000000;
                auVar284._8_4_ = 0x80000000;
                auVar284._12_4_ = 0x80000000;
                auVar158 = vinsertps_avx(ZEXT416((uint)(fVar236 * fVar254)),auVar267,0x10);
                auVar49 = vmovsldup_avx(ZEXT416((uint)(auVar134._0_4_ * fVar236 * fVar254 -
                                                      auVar163._0_4_ * fVar193)));
                auVar158 = vdivps_avx(auVar158,auVar49);
                auVar171 = ZEXT416((uint)(fVar202 - auVar171._0_4_));
                auVar163 = vinsertps_avx(auVar166,auVar171,0x10);
                auVar244._0_4_ = auVar163._0_4_ * auVar158._0_4_;
                auVar244._4_4_ = auVar163._4_4_ * auVar158._4_4_;
                auVar244._8_4_ = auVar163._8_4_ * auVar158._8_4_;
                auVar244._12_4_ = auVar163._12_4_ * auVar158._12_4_;
                auVar134 = vinsertps_avx(auVar284,auVar134,0x1c);
                auVar134 = vdivps_avx(auVar134,auVar49);
                auVar213._0_4_ = auVar163._0_4_ * auVar134._0_4_;
                auVar213._4_4_ = auVar163._4_4_ * auVar134._4_4_;
                auVar213._8_4_ = auVar163._8_4_ * auVar134._8_4_;
                auVar213._12_4_ = auVar163._12_4_ * auVar134._12_4_;
                auVar134 = vhaddps_avx(auVar244,auVar244);
                auVar158 = vhaddps_avx(auVar213,auVar213);
                local_ac0 = local_ac0 - auVar134._0_4_;
                auVar401 = ZEXT464((uint)local_ac0);
                local_ae0 = local_ae0 - auVar158._0_4_;
                auVar413 = ZEXT464((uint)local_ae0);
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar273 = ZEXT1664(auVar268);
                auVar134 = vandps_avx(auVar166,auVar268);
                if (fVar237 <= auVar134._0_4_) {
LAB_01279363:
                  bVar104 = false;
                }
                else {
                  auVar134 = vandps_avx(auVar171,auVar268);
                  if ((float)local_7c0._0_4_ * 1.9073486e-06 + auVar392._0_4_ + fVar237 <=
                      auVar134._0_4_) goto LAB_01279363;
                  local_ae0 = local_ae0 + (float)local_760._0_4_;
                  auVar413 = ZEXT464((uint)local_ae0);
                  bVar104 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                       (fVar237 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar237)) &&
                      (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                    auVar134 = vrsqrtss_avx(auVar341,auVar341);
                    fVar193 = auVar134._0_4_;
                    pGVar32 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar32->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar134 = ZEXT416((uint)(fVar193 * 1.5 +
                                               auVar341._0_4_ * -0.5 * fVar193 * fVar193 * fVar193))
                      ;
                      auVar134 = vshufps_avx(auVar134,auVar134,0);
                      auVar172._0_4_ = auVar134._0_4_ * (float)local_8e0._0_4_;
                      auVar172._4_4_ = auVar134._4_4_ * (float)local_8e0._4_4_;
                      auVar172._8_4_ = auVar134._8_4_ * fStack_8d8;
                      auVar172._12_4_ = auVar134._12_4_ * fStack_8d4;
                      auVar140._0_4_ = local_920._0_4_ + auVar13._0_4_ * auVar172._0_4_;
                      auVar140._4_4_ = local_920._4_4_ + auVar13._4_4_ * auVar172._4_4_;
                      auVar140._8_4_ = local_920._8_4_ + auVar13._8_4_ * auVar172._8_4_;
                      auVar140._12_4_ = local_920._12_4_ + auVar13._12_4_ * auVar172._12_4_;
                      auVar134 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar158 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                      auVar173._0_4_ = auVar158._0_4_ * auVar172._0_4_;
                      auVar173._4_4_ = auVar158._4_4_ * auVar172._4_4_;
                      auVar173._8_4_ = auVar158._8_4_ * auVar172._8_4_;
                      auVar173._12_4_ = auVar158._12_4_ * auVar172._12_4_;
                      auVar214._0_4_ = local_920._0_4_ * auVar134._0_4_;
                      auVar214._4_4_ = local_920._4_4_ * auVar134._4_4_;
                      auVar214._8_4_ = local_920._8_4_ * auVar134._8_4_;
                      auVar214._12_4_ = local_920._12_4_ * auVar134._12_4_;
                      auVar163 = vsubps_avx(auVar214,auVar173);
                      auVar134 = vshufps_avx(auVar163,auVar163,0xc9);
                      auVar158 = vshufps_avx(auVar140,auVar140,0xc9);
                      auVar215._0_4_ = auVar158._0_4_ * auVar134._0_4_;
                      auVar215._4_4_ = auVar158._4_4_ * auVar134._4_4_;
                      auVar215._8_4_ = auVar158._8_4_ * auVar134._8_4_;
                      auVar215._12_4_ = auVar158._12_4_ * auVar134._12_4_;
                      auVar134 = vshufps_avx(auVar163,auVar163,0xd2);
                      auVar141._0_4_ = auVar140._0_4_ * auVar134._0_4_;
                      auVar141._4_4_ = auVar140._4_4_ * auVar134._4_4_;
                      auVar141._8_4_ = auVar140._8_4_ * auVar134._8_4_;
                      auVar141._12_4_ = auVar140._12_4_ * auVar134._12_4_;
                      auVar134 = vsubps_avx(auVar215,auVar141);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ae0;
                        auVar166 = vshufps_avx(auVar134,auVar134,0xe9);
                        uVar9 = vmovlps_avx(auVar166);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar134._0_4_;
                        ray->u = local_ac0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a88;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar158 = vshufps_avx(auVar134,auVar134,0xe9);
                        local_890 = vmovlps_avx(auVar158);
                        local_888 = auVar134._0_4_;
                        local_884 = local_ac0;
                        local_880 = 0;
                        local_87c = (uint)local_a88;
                        local_878 = (uint)local_ae8;
                        local_874 = context->user->instID[0];
                        local_870 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ae0;
                        local_aec = -1;
                        local_a50.valid = &local_aec;
                        local_a50.geometryUserPtr = pGVar32->userPtr;
                        local_a50.context = context->user;
                        local_a50.ray = (RTCRayN *)ray;
                        local_a50.hit = (RTCHitN *)&local_890;
                        local_a50.N = 1;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        fStack_adc = 0.0;
                        fStack_ad8 = 0.0;
                        fStack_ad4 = 0.0;
                        local_a80 = fVar237;
                        if (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0127949b:
                          p_Var35 = context->args->filter;
                          if (p_Var35 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar32->field_8).field_0x2 & 0x40) != 0)) {
                              auVar351 = ZEXT1664(auVar351._0_16_);
                              auVar392 = ZEXT1664(auVar392._0_16_);
                              auVar432 = ZEXT1664(auVar432._0_16_);
                              (*p_Var35)(&local_a50);
                              auVar413 = ZEXT1664(CONCAT412(fStack_ad4,
                                                            CONCAT48(fStack_ad8,
                                                                     CONCAT44(fStack_adc,local_ae0))
                                                           ));
                              auVar401 = ZEXT1664(CONCAT412(fStack_ab4,
                                                            CONCAT48(fStack_ab8,
                                                                     CONCAT44(fStack_abc,local_ac0))
                                                           ));
                              auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            if (*local_a50.valid == 0) goto LAB_01279550;
                          }
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a50.hit;
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a50.hit + 4);
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a50.hit + 8);
                          *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                          *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                          *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                          *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                          *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                          *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                        }
                        else {
                          auVar351 = ZEXT1664(auVar341);
                          auVar392 = ZEXT1664(auVar392._0_16_);
                          auVar432 = ZEXT1664(auVar166);
                          (*pGVar32->intersectionFilterN)(&local_a50);
                          auVar413 = ZEXT1664(CONCAT412(fStack_ad4,
                                                        CONCAT48(fStack_ad8,
                                                                 CONCAT44(fStack_adc,local_ae0))));
                          auVar401 = ZEXT1664(CONCAT412(fStack_ab4,
                                                        CONCAT48(fStack_ab8,
                                                                 CONCAT44(fStack_abc,local_ac0))));
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar328 = ZEXT1664(ZEXT816(0) << 0x40);
                          if (*local_a50.valid != 0) goto LAB_0127949b;
LAB_01279550:
                          (ray->super_RayK<1>).tfar = local_a80;
                        }
                      }
                    }
                  }
                }
                auVar150 = local_600;
                bVar129 = lVar125 != 0;
                lVar125 = lVar125 + -1;
              } while ((!bVar104) && (bVar129));
              fVar237 = (ray->super_RayK<1>).tfar;
              auVar153._4_4_ = fVar237;
              auVar153._0_4_ = fVar237;
              auVar153._8_4_ = fVar237;
              auVar153._12_4_ = fVar237;
              auVar153._16_4_ = fVar237;
              auVar153._20_4_ = fVar237;
              auVar153._24_4_ = fVar237;
              auVar153._28_4_ = fVar237;
              auVar178 = vcmpps_avx(_local_800,auVar153,2);
              local_600 = vandps_avx(auVar178,local_600);
              auVar150 = auVar150 & auVar178;
              uVar128 = local_620._0_8_;
              fVar405 = (float)local_740._0_4_;
              fVar416 = (float)local_740._4_4_;
              fVar205 = fStack_738;
              fVar230 = fStack_734;
              fVar231 = fStack_730;
              fVar232 = fStack_72c;
              fVar233 = fStack_728;
              fVar234 = fStack_724;
            } while ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar150 >> 0x7f,0) != '\0') ||
                       (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar150 >> 0xbf,0) != '\0') ||
                     (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar150[0x1f] < '\0');
          }
          auVar150 = vandps_avx(local_560,local_540);
          auVar178 = vandps_avx(_local_720,local_700);
          auVar228._0_4_ = fVar405 + local_440._0_4_;
          auVar228._4_4_ = fVar416 + local_440._4_4_;
          auVar228._8_4_ = fVar205 + local_440._8_4_;
          auVar228._12_4_ = fVar230 + local_440._12_4_;
          auVar228._16_4_ = fVar231 + local_440._16_4_;
          auVar228._20_4_ = fVar232 + local_440._20_4_;
          auVar228._24_4_ = fVar233 + local_440._24_4_;
          auVar228._28_4_ = fVar234 + local_440._28_4_;
          fVar237 = (ray->super_RayK<1>).tfar;
          auVar272._4_4_ = fVar237;
          auVar272._0_4_ = fVar237;
          auVar272._8_4_ = fVar237;
          auVar272._12_4_ = fVar237;
          auVar272._16_4_ = fVar237;
          auVar272._20_4_ = fVar237;
          auVar272._24_4_ = fVar237;
          auVar272._28_4_ = fVar237;
          auVar36 = vcmpps_avx(auVar228,auVar272,2);
          auVar150 = vandps_avx(auVar36,auVar150);
          auVar295._0_4_ = fVar405 + local_480._0_4_;
          auVar295._4_4_ = fVar416 + local_480._4_4_;
          auVar295._8_4_ = fVar205 + local_480._8_4_;
          auVar295._12_4_ = fVar230 + local_480._12_4_;
          auVar295._16_4_ = fVar231 + local_480._16_4_;
          auVar295._20_4_ = fVar232 + local_480._20_4_;
          auVar295._24_4_ = fVar233 + local_480._24_4_;
          auVar295._28_4_ = fVar234 + local_480._28_4_;
          auVar36 = vcmpps_avx(auVar295,auVar272,2);
          auVar178 = vandps_avx(auVar36,auVar178);
          auVar178 = vorps_avx(auVar150,auVar178);
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar123 * 0x60) = auVar178;
            auVar150 = vblendvps_avx(_local_480,local_440,auVar150);
            *(undefined1 (*) [32])(auStack_160 + uVar123 * 0x60) = auVar150;
            auVar119._8_8_ = uStack_768;
            auVar119._0_8_ = local_770;
            uVar9 = vmovlps_avx(auVar119);
            *(undefined8 *)(afStack_140 + uVar123 * 0x18) = uVar9;
            auStack_138[uVar123 * 0x18] = (int)uVar128 + 1;
            uVar123 = (ulong)((int)uVar123 + 1);
          }
          auVar297 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_01277c54;
        }
        auVar294._8_4_ = 0x3f800000;
        auVar294._0_8_ = &DAT_3f8000003f800000;
        auVar294._12_4_ = 0x3f800000;
        auVar294._16_4_ = 0x3f800000;
        auVar294._20_4_ = 0x3f800000;
        auVar294._24_4_ = 0x3f800000;
        auVar294._28_4_ = 0x3f800000;
      }
      auVar413 = ZEXT3264(_local_480);
      auVar297 = ZEXT3264(auVar294);
    }
LAB_01277c54:
    fVar237 = (ray->super_RayK<1>).tfar;
    auVar148._4_4_ = fVar237;
    auVar148._0_4_ = fVar237;
    auVar148._8_4_ = fVar237;
    auVar148._12_4_ = fVar237;
    auVar148._16_4_ = fVar237;
    auVar148._20_4_ = fVar237;
    auVar148._24_4_ = fVar237;
    auVar148._28_4_ = fVar237;
    do {
      if ((int)uVar123 == 0) {
        fVar237 = (ray->super_RayK<1>).tfar;
        auVar154._4_4_ = fVar237;
        auVar154._0_4_ = fVar237;
        auVar154._8_4_ = fVar237;
        auVar154._12_4_ = fVar237;
        auVar154._16_4_ = fVar237;
        auVar154._20_4_ = fVar237;
        auVar154._24_4_ = fVar237;
        auVar154._28_4_ = fVar237;
        auVar150 = vcmpps_avx(local_280,auVar154,2);
        uVar122 = vmovmskps_avx(auVar150);
        uVar122 = (uint)local_748 - 1 & (uint)local_748 & uVar122;
        if (uVar122 == 0) {
          return;
        }
        goto LAB_01276aa7;
      }
      uVar124 = (ulong)((int)uVar123 - 1);
      lVar125 = uVar124 * 0x60;
      auVar150 = *(undefined1 (*) [32])(auStack_160 + lVar125);
      auVar177._0_4_ = fVar405 + auVar150._0_4_;
      auVar177._4_4_ = fVar416 + auVar150._4_4_;
      auVar177._8_4_ = fVar205 + auVar150._8_4_;
      auVar177._12_4_ = fVar230 + auVar150._12_4_;
      auVar177._16_4_ = fVar231 + auVar150._16_4_;
      auVar177._20_4_ = fVar232 + auVar150._20_4_;
      auVar177._24_4_ = fVar233 + auVar150._24_4_;
      auVar177._28_4_ = fVar234 + auVar150._28_4_;
      auVar36 = vcmpps_avx(auVar177,auVar148,2);
      auVar178 = vandps_avx(auVar36,*(undefined1 (*) [32])(auStack_180 + lVar125));
      local_440 = auVar178;
      auVar36 = *(undefined1 (*) [32])(auStack_180 + lVar125) & auVar36;
      bVar110 = (auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar111 = (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar109 = (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar108 = SUB321(auVar36 >> 0x7f,0) == '\0';
      bVar107 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar106 = SUB321(auVar36 >> 0xbf,0) == '\0';
      bVar129 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar104 = -1 < auVar36[0x1f];
      if (((((((!bVar110 || !bVar111) || !bVar109) || !bVar108) || !bVar107) || !bVar106) ||
          !bVar129) || !bVar104) {
        auVar252._8_4_ = 0x7f800000;
        auVar252._0_8_ = 0x7f8000007f800000;
        auVar252._12_4_ = 0x7f800000;
        auVar252._16_4_ = 0x7f800000;
        auVar252._20_4_ = 0x7f800000;
        auVar252._24_4_ = 0x7f800000;
        auVar252._28_4_ = 0x7f800000;
        auVar150 = vblendvps_avx(auVar252,auVar150,auVar178);
        auVar36 = vshufps_avx(auVar150,auVar150,0xb1);
        auVar36 = vminps_avx(auVar150,auVar36);
        auVar37 = vshufpd_avx(auVar36,auVar36,5);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar37 = vperm2f128_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar150 = vcmpps_avx(auVar150,auVar36,0);
        auVar36 = auVar178 & auVar150;
        if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0x7f,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0xbf,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar36[0x1f] < '\0') {
          auVar178 = vandps_avx(auVar150,auVar178);
        }
        fVar237 = afStack_140[uVar124 * 0x18 + 1];
        uVar128 = (ulong)auStack_138[uVar124 * 0x18];
        uVar127 = vmovmskps_avx(auVar178);
        uVar122 = 0;
        if (uVar127 != 0) {
          for (; (uVar127 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
          }
        }
        fVar193 = afStack_140[uVar124 * 0x18];
        *(undefined4 *)(local_440 + (ulong)uVar122 * 4) = 0;
        if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_440 >> 0x7f,0) != '\0') ||
              (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_440 >> 0xbf,0) != '\0') ||
            (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_440[0x1f] < '\0') {
          uVar124 = uVar123;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar125) = local_440;
        auVar166 = vshufps_avx(ZEXT416((uint)(fVar237 - fVar193)),ZEXT416((uint)(fVar237 - fVar193))
                               ,0);
        local_480._4_4_ = fVar193 + auVar166._4_4_ * 0.14285715;
        local_480._0_4_ = fVar193 + auVar166._0_4_ * 0.0;
        fStack_478 = fVar193 + auVar166._8_4_ * 0.2857143;
        fStack_474 = fVar193 + auVar166._12_4_ * 0.42857146;
        fStack_470 = fVar193 + auVar166._0_4_ * 0.5714286;
        fStack_46c = fVar193 + auVar166._4_4_ * 0.71428573;
        fStack_468 = fVar193 + auVar166._8_4_ * 0.8571429;
        fStack_464 = fVar193 + auVar166._12_4_;
        local_770 = *(undefined8 *)(local_480 + (ulong)uVar122 * 4);
        uStack_768 = 0;
      }
      uVar123 = uVar124;
    } while (((((((bVar110 && bVar111) && bVar109) && bVar108) && bVar107) && bVar106) && bVar129)
             && bVar104);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }